

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx::CurveNvIntersector1<4>::
     intersect_t<embree::avx::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  Primitive *pPVar2;
  undefined1 (*pauVar3) [28];
  float *pfVar4;
  float *pfVar5;
  undefined1 (*pauVar6) [28];
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  Primitive PVar12;
  uint uVar13;
  uint uVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  long lVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [28];
  undefined1 auVar109 [28];
  undefined1 auVar110 [28];
  undefined1 auVar111 [28];
  undefined1 auVar112 [28];
  undefined1 auVar113 [24];
  uint uVar114;
  uint uVar115;
  long lVar116;
  uint uVar117;
  ulong uVar118;
  Geometry *pGVar119;
  Primitive *pPVar120;
  ulong uVar121;
  long lVar122;
  float fVar123;
  float fVar140;
  float fVar141;
  vint4 bi_2;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar146;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  float fVar147;
  float fVar148;
  float fVar157;
  float fVar159;
  vint4 bi_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar166;
  undefined1 auVar152 [32];
  float fVar158;
  float fVar160;
  float fVar162;
  float fVar165;
  float fVar167;
  undefined1 auVar153 [32];
  float fVar168;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar169;
  float fVar181;
  float fVar182;
  vint4 ai;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar183;
  float fVar184;
  undefined1 auVar180 [32];
  float fVar185;
  float fVar195;
  float fVar196;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar198;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar200;
  float fVar201;
  undefined1 auVar190 [32];
  float fVar197;
  float fVar199;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar202;
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  float fVar203;
  float fVar213;
  float fVar215;
  vint4 bi;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar204;
  undefined1 auVar208 [16];
  undefined1 auVar207 [16];
  float fVar214;
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar219;
  float fVar225;
  float fVar226;
  vint4 ai_2;
  undefined1 auVar220 [16];
  float fVar227;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  float fVar228;
  float fVar233;
  float fVar234;
  undefined1 auVar229 [16];
  float fVar235;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  float fVar236;
  undefined1 auVar232 [32];
  float fVar237;
  float fVar246;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar252;
  vint4 ai_1;
  undefined1 auVar247 [16];
  float fVar256;
  float fVar258;
  float fVar260;
  undefined1 auVar248 [32];
  float fVar253;
  float fVar254;
  float fVar257;
  float fVar261;
  undefined1 auVar249 [32];
  float fVar255;
  float fVar259;
  undefined1 auVar250 [32];
  float fVar262;
  float fVar269;
  float fVar270;
  undefined1 auVar263 [16];
  float fVar271;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float fVar272;
  float fVar276;
  float fVar278;
  float fVar280;
  float fVar281;
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  float fVar277;
  float fVar279;
  undefined1 auVar275 [32];
  float fVar282;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar283 [32];
  undefined1 auVar288 [16];
  float fVar294;
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar295;
  float fVar299;
  float fVar300;
  undefined1 auVar296 [16];
  float fVar301;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  float fVar302;
  undefined1 auVar303 [32];
  float fVar305;
  float fVar306;
  float fVar307;
  undefined1 auVar304 [64];
  float fVar308;
  float fVar312;
  float fVar313;
  undefined1 auVar309 [16];
  float fVar314;
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_7bc;
  ulong local_7b8;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_770 [8];
  undefined8 uStack_768;
  Precalculations *local_760;
  Primitive *local_758;
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [16];
  undefined1 auStack_710 [16];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 local_6b0 [8];
  undefined8 uStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined8 local_620;
  undefined4 local_618;
  float local_614;
  undefined4 local_610;
  uint local_60c;
  undefined4 local_608;
  uint local_604;
  uint local_600;
  RayQueryContext *local_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [2] [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  uint local_200;
  uint local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar251 [64];
  undefined1 auVar268 [64];
  
  PVar12 = prim[1];
  uVar118 = (ulong)(byte)PVar12;
  lVar101 = uVar118 * 0x19;
  fVar219 = *(float *)(prim + lVar101 + 0x12);
  auVar223 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar101 + 6));
  auVar238._0_4_ = fVar219 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar238._4_4_ = fVar219 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar238._8_4_ = fVar219 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar238._12_4_ = fVar219 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar170._0_4_ = fVar219 * auVar223._0_4_;
  auVar170._4_4_ = fVar219 * auVar223._4_4_;
  auVar170._8_4_ = fVar219 * auVar223._8_4_;
  auVar170._12_4_ = fVar219 * auVar223._12_4_;
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 4 + 6)));
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar176 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 5 + 6)));
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 6 + 6)));
  auVar208 = vcvtdq2ps_avx(auVar208);
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0xb + 6)));
  auVar189 = vcvtdq2ps_avx(auVar189);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar12 * 0xc) + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar12 * 0xc + uVar118 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  uVar121 = (ulong)(uint)((int)(uVar118 * 9) * 2);
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 + 6)));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 + uVar118 + 6)));
  auVar126 = vcvtdq2ps_avx(auVar126);
  uVar121 = (ulong)(uint)((int)(uVar118 * 5) << 2);
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 + 6)));
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar124 = vshufps_avx(auVar238,auVar238,0);
  auVar149 = vshufps_avx(auVar238,auVar238,0x55);
  auVar171 = vshufps_avx(auVar238,auVar238,0xaa);
  fVar219 = auVar171._0_4_;
  fVar185 = auVar171._4_4_;
  fVar225 = auVar171._8_4_;
  fVar195 = auVar171._12_4_;
  fVar228 = auVar149._0_4_;
  fVar233 = auVar149._4_4_;
  fVar234 = auVar149._8_4_;
  fVar235 = auVar149._12_4_;
  fVar226 = auVar124._0_4_;
  fVar196 = auVar124._4_4_;
  fVar227 = auVar124._8_4_;
  fVar198 = auVar124._12_4_;
  auVar288._0_4_ = fVar226 * auVar223._0_4_ + fVar228 * auVar176._0_4_ + fVar219 * auVar208._0_4_;
  auVar288._4_4_ = fVar196 * auVar223._4_4_ + fVar233 * auVar176._4_4_ + fVar185 * auVar208._4_4_;
  auVar288._8_4_ = fVar227 * auVar223._8_4_ + fVar234 * auVar176._8_4_ + fVar225 * auVar208._8_4_;
  auVar288._12_4_ =
       fVar198 * auVar223._12_4_ + fVar235 * auVar176._12_4_ + fVar195 * auVar208._12_4_;
  auVar296._0_4_ = fVar226 * auVar189._0_4_ + fVar228 * auVar18._0_4_ + auVar19._0_4_ * fVar219;
  auVar296._4_4_ = fVar196 * auVar189._4_4_ + fVar233 * auVar18._4_4_ + auVar19._4_4_ * fVar185;
  auVar296._8_4_ = fVar227 * auVar189._8_4_ + fVar234 * auVar18._8_4_ + auVar19._8_4_ * fVar225;
  auVar296._12_4_ = fVar198 * auVar189._12_4_ + fVar235 * auVar18._12_4_ + auVar19._12_4_ * fVar195;
  auVar239._0_4_ = fVar226 * auVar125._0_4_ + fVar228 * auVar126._0_4_ + auVar150._0_4_ * fVar219;
  auVar239._4_4_ = fVar196 * auVar125._4_4_ + fVar233 * auVar126._4_4_ + auVar150._4_4_ * fVar185;
  auVar239._8_4_ = fVar227 * auVar125._8_4_ + fVar234 * auVar126._8_4_ + auVar150._8_4_ * fVar225;
  auVar239._12_4_ =
       fVar198 * auVar125._12_4_ + fVar235 * auVar126._12_4_ + auVar150._12_4_ * fVar195;
  auVar124 = vshufps_avx(auVar170,auVar170,0);
  auVar149 = vshufps_avx(auVar170,auVar170,0x55);
  auVar171 = vshufps_avx(auVar170,auVar170,0xaa);
  fVar219 = auVar171._0_4_;
  fVar185 = auVar171._4_4_;
  fVar225 = auVar171._8_4_;
  fVar195 = auVar171._12_4_;
  fVar228 = auVar149._0_4_;
  fVar233 = auVar149._4_4_;
  fVar234 = auVar149._8_4_;
  fVar235 = auVar149._12_4_;
  fVar226 = auVar124._0_4_;
  fVar196 = auVar124._4_4_;
  fVar227 = auVar124._8_4_;
  fVar198 = auVar124._12_4_;
  auVar205._0_4_ = fVar226 * auVar223._0_4_ + fVar228 * auVar176._0_4_ + fVar219 * auVar208._0_4_;
  auVar205._4_4_ = fVar196 * auVar223._4_4_ + fVar233 * auVar176._4_4_ + fVar185 * auVar208._4_4_;
  auVar205._8_4_ = fVar227 * auVar223._8_4_ + fVar234 * auVar176._8_4_ + fVar225 * auVar208._8_4_;
  auVar205._12_4_ =
       fVar198 * auVar223._12_4_ + fVar235 * auVar176._12_4_ + fVar195 * auVar208._12_4_;
  auVar149._0_4_ = fVar226 * auVar189._0_4_ + auVar19._0_4_ * fVar219 + fVar228 * auVar18._0_4_;
  auVar149._4_4_ = fVar196 * auVar189._4_4_ + auVar19._4_4_ * fVar185 + fVar233 * auVar18._4_4_;
  auVar149._8_4_ = fVar227 * auVar189._8_4_ + auVar19._8_4_ * fVar225 + fVar234 * auVar18._8_4_;
  auVar149._12_4_ = fVar198 * auVar189._12_4_ + auVar19._12_4_ * fVar195 + fVar235 * auVar18._12_4_;
  auVar124._0_4_ = fVar226 * auVar125._0_4_ + fVar228 * auVar126._0_4_ + auVar150._0_4_ * fVar219;
  auVar124._4_4_ = fVar196 * auVar125._4_4_ + fVar233 * auVar126._4_4_ + auVar150._4_4_ * fVar185;
  auVar124._8_4_ = fVar227 * auVar125._8_4_ + fVar234 * auVar126._8_4_ + auVar150._8_4_ * fVar225;
  auVar124._12_4_ =
       fVar198 * auVar125._12_4_ + fVar235 * auVar126._12_4_ + auVar150._12_4_ * fVar195;
  auVar229._8_4_ = 0x7fffffff;
  auVar229._0_8_ = 0x7fffffff7fffffff;
  auVar229._12_4_ = 0x7fffffff;
  auVar223 = vandps_avx(auVar288,auVar229);
  auVar186._8_4_ = 0x219392ef;
  auVar186._0_8_ = 0x219392ef219392ef;
  auVar186._12_4_ = 0x219392ef;
  auVar223 = vcmpps_avx(auVar223,auVar186,1);
  auVar176 = vblendvps_avx(auVar288,auVar186,auVar223);
  auVar223 = vandps_avx(auVar296,auVar229);
  auVar223 = vcmpps_avx(auVar223,auVar186,1);
  auVar208 = vblendvps_avx(auVar296,auVar186,auVar223);
  auVar223 = vandps_avx(auVar239,auVar229);
  auVar223 = vcmpps_avx(auVar223,auVar186,1);
  auVar223 = vblendvps_avx(auVar239,auVar186,auVar223);
  auVar189 = vrcpps_avx(auVar176);
  fVar228 = auVar189._0_4_;
  auVar171._0_4_ = fVar228 * auVar176._0_4_;
  fVar233 = auVar189._4_4_;
  auVar171._4_4_ = fVar233 * auVar176._4_4_;
  fVar234 = auVar189._8_4_;
  auVar171._8_4_ = fVar234 * auVar176._8_4_;
  fVar235 = auVar189._12_4_;
  auVar171._12_4_ = fVar235 * auVar176._12_4_;
  auVar240._8_4_ = 0x3f800000;
  auVar240._0_8_ = 0x3f8000003f800000;
  auVar240._12_4_ = 0x3f800000;
  auVar176 = vsubps_avx(auVar240,auVar171);
  fVar228 = fVar228 + fVar228 * auVar176._0_4_;
  fVar233 = fVar233 + fVar233 * auVar176._4_4_;
  fVar234 = fVar234 + fVar234 * auVar176._8_4_;
  fVar235 = fVar235 + fVar235 * auVar176._12_4_;
  auVar176 = vrcpps_avx(auVar208);
  fVar219 = auVar176._0_4_;
  auVar220._0_4_ = fVar219 * auVar208._0_4_;
  fVar225 = auVar176._4_4_;
  auVar220._4_4_ = fVar225 * auVar208._4_4_;
  fVar226 = auVar176._8_4_;
  auVar220._8_4_ = fVar226 * auVar208._8_4_;
  fVar227 = auVar176._12_4_;
  auVar220._12_4_ = fVar227 * auVar208._12_4_;
  auVar176 = vsubps_avx(auVar240,auVar220);
  fVar219 = fVar219 + fVar219 * auVar176._0_4_;
  fVar225 = fVar225 + fVar225 * auVar176._4_4_;
  fVar226 = fVar226 + fVar226 * auVar176._8_4_;
  fVar227 = fVar227 + fVar227 * auVar176._12_4_;
  auVar176 = vrcpps_avx(auVar223);
  fVar185 = auVar176._0_4_;
  auVar187._0_4_ = fVar185 * auVar223._0_4_;
  fVar195 = auVar176._4_4_;
  auVar187._4_4_ = fVar195 * auVar223._4_4_;
  fVar196 = auVar176._8_4_;
  auVar187._8_4_ = fVar196 * auVar223._8_4_;
  fVar198 = auVar176._12_4_;
  auVar187._12_4_ = fVar198 * auVar223._12_4_;
  auVar223 = vsubps_avx(auVar240,auVar187);
  fVar185 = fVar185 + fVar185 * auVar223._0_4_;
  fVar195 = fVar195 + fVar195 * auVar223._4_4_;
  fVar196 = fVar196 + fVar196 * auVar223._8_4_;
  fVar198 = fVar198 + fVar198 * auVar223._12_4_;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar118 * 7 + 6);
  auVar223 = vpmovsxwd_avx(auVar223);
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar223 = vsubps_avx(auVar223,auVar205);
  auVar172._0_4_ = fVar228 * auVar223._0_4_;
  auVar172._4_4_ = fVar233 * auVar223._4_4_;
  auVar172._8_4_ = fVar234 * auVar223._8_4_;
  auVar172._12_4_ = fVar235 * auVar223._12_4_;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *(ulong *)(prim + uVar118 * 9 + 6);
  auVar223 = vpmovsxwd_avx(auVar176);
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar223 = vsubps_avx(auVar223,auVar205);
  auVar206._0_4_ = fVar228 * auVar223._0_4_;
  auVar206._4_4_ = fVar233 * auVar223._4_4_;
  auVar206._8_4_ = fVar234 * auVar223._8_4_;
  auVar206._12_4_ = fVar235 * auVar223._12_4_;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  auVar176 = vpmovsxwd_avx(auVar208);
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar118 * -2 + 6);
  auVar223 = vpmovsxwd_avx(auVar189);
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar223 = vsubps_avx(auVar223,auVar149);
  auVar247._0_4_ = auVar223._0_4_ * fVar219;
  auVar247._4_4_ = auVar223._4_4_ * fVar225;
  auVar247._8_4_ = auVar223._8_4_ * fVar226;
  auVar247._12_4_ = auVar223._12_4_ * fVar227;
  auVar251 = ZEXT1664(auVar247);
  auVar223 = vcvtdq2ps_avx(auVar176);
  auVar223 = vsubps_avx(auVar223,auVar149);
  auVar150._0_4_ = fVar219 * auVar223._0_4_;
  auVar150._4_4_ = fVar225 * auVar223._4_4_;
  auVar150._8_4_ = fVar226 * auVar223._8_4_;
  auVar150._12_4_ = fVar227 * auVar223._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar121 + uVar118 + 6);
  auVar223 = vpmovsxwd_avx(auVar18);
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar223 = vsubps_avx(auVar223,auVar124);
  auVar221._0_4_ = auVar223._0_4_ * fVar185;
  auVar221._4_4_ = auVar223._4_4_ * fVar195;
  auVar221._8_4_ = auVar223._8_4_ * fVar196;
  auVar221._12_4_ = auVar223._12_4_ * fVar198;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar118 * 0x17 + 6);
  auVar223 = vpmovsxwd_avx(auVar19);
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar223 = vsubps_avx(auVar223,auVar124);
  auVar125._0_4_ = auVar223._0_4_ * fVar185;
  auVar125._4_4_ = auVar223._4_4_ * fVar195;
  auVar125._8_4_ = auVar223._8_4_ * fVar196;
  auVar125._12_4_ = auVar223._12_4_ * fVar198;
  auVar223 = vpminsd_avx(auVar172,auVar206);
  auVar176 = vpminsd_avx(auVar247,auVar150);
  auVar223 = vmaxps_avx(auVar223,auVar176);
  auVar176 = vpminsd_avx(auVar221,auVar125);
  uVar9 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar263._4_4_ = uVar9;
  auVar263._0_4_ = uVar9;
  auVar263._8_4_ = uVar9;
  auVar263._12_4_ = uVar9;
  auVar268 = ZEXT1664(auVar263);
  auVar176 = vmaxps_avx(auVar176,auVar263);
  auVar223 = vmaxps_avx(auVar223,auVar176);
  local_270._0_4_ = auVar223._0_4_ * 0.99999964;
  local_270._4_4_ = auVar223._4_4_ * 0.99999964;
  local_270._8_4_ = auVar223._8_4_ * 0.99999964;
  local_270._12_4_ = auVar223._12_4_ * 0.99999964;
  auVar223 = vpmaxsd_avx(auVar172,auVar206);
  auVar176 = vpmaxsd_avx(auVar247,auVar150);
  auVar223 = vminps_avx(auVar223,auVar176);
  auVar176 = vpmaxsd_avx(auVar221,auVar125);
  fVar219 = (ray->super_RayK<1>).tfar;
  auVar173._4_4_ = fVar219;
  auVar173._0_4_ = fVar219;
  auVar173._8_4_ = fVar219;
  auVar173._12_4_ = fVar219;
  auVar176 = vminps_avx(auVar176,auVar173);
  auVar223 = vminps_avx(auVar223,auVar176);
  auVar126._0_4_ = auVar223._0_4_ * 1.0000004;
  auVar126._4_4_ = auVar223._4_4_ * 1.0000004;
  auVar126._8_4_ = auVar223._8_4_ * 1.0000004;
  auVar126._12_4_ = auVar223._12_4_ * 1.0000004;
  auVar223 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar176 = vpcmpgtd_avx(auVar223,_DAT_01f7fcf0);
  auVar223 = vcmpps_avx(local_270,auVar126,2);
  auVar223 = vandps_avx(auVar223,auVar176);
  uVar117 = vmovmskps_avx(auVar223);
  if (uVar117 != 0) {
    uVar117 = uVar117 & 0xff;
    local_4e0[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_4e0[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_4e0[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_4e0[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_758 = prim;
    local_760 = pre;
    pPVar120 = prim;
    do {
      uVar121 = (ulong)uVar117;
      local_680 = auVar268._0_32_;
      local_6e0 = auVar251._0_32_;
      lVar116 = 0;
      if (uVar121 != 0) {
        for (; (uVar117 >> lVar116 & 1) == 0; lVar116 = lVar116 + 1) {
        }
      }
      uVar121 = uVar121 - 1 & uVar121;
      uVar117 = *(uint *)(pPVar120 + lVar116 * 4 + 6);
      lVar116 = lVar116 * 0x40;
      lVar122 = 0;
      if (uVar121 != 0) {
        for (; (uVar121 >> lVar122 & 1) == 0; lVar122 = lVar122 + 1) {
        }
      }
      uVar13 = *(uint *)(pPVar120 + 2);
      local_7b8 = (ulong)uVar13;
      pGVar119 = (context->scene->geometries).items[uVar13].ptr;
      pPVar2 = prim + lVar116 + lVar101 + 0x16;
      local_1f0 = *(undefined8 *)pPVar2;
      uStack_1e8 = *(undefined8 *)(pPVar2 + 8);
      local_7b0 = (float)local_1f0;
      fStack_7ac = (float)((ulong)local_1f0 >> 0x20);
      fStack_7a8 = (float)uStack_1e8;
      fStack_7a4 = (float)((ulong)uStack_1e8 >> 0x20);
      if (((uVar121 != 0) && (uVar118 = uVar121 - 1 & uVar121, uVar118 != 0)) &&
         (lVar122 = 0, uVar118 != 0)) {
        for (; (uVar118 >> lVar122 & 1) == 0; lVar122 = lVar122 + 1) {
        }
      }
      _local_770 = *(undefined1 (*) [16])(prim + lVar116 + lVar101 + 0x26);
      _local_6b0 = *(undefined1 (*) [16])(prim + lVar116 + lVar101 + 0x36);
      _local_6c0 = *(undefined1 (*) [16])(prim + lVar116 + lVar101 + 0x46);
      uVar14 = (uint)pGVar119[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar11 = (ray->super_RayK<1>).org.field_0;
      auVar102._12_4_ = fStack_7a4;
      auVar102._0_12_ = *(undefined1 (*) [12])pPVar2;
      auVar208 = vsubps_avx(auVar102,(undefined1  [16])aVar11);
      auVar223 = vshufps_avx(auVar208,auVar208,0);
      auVar176 = vshufps_avx(auVar208,auVar208,0x55);
      auVar208 = vshufps_avx(auVar208,auVar208,0xaa);
      fVar219 = (pre->ray_space).vx.field_0.m128[0];
      fVar185 = (pre->ray_space).vx.field_0.m128[1];
      fVar225 = (pre->ray_space).vx.field_0.m128[2];
      fVar195 = (pre->ray_space).vx.field_0.m128[3];
      fVar226 = (pre->ray_space).vy.field_0.m128[0];
      fVar196 = (pre->ray_space).vy.field_0.m128[1];
      fVar227 = (pre->ray_space).vy.field_0.m128[2];
      fVar198 = (pre->ray_space).vy.field_0.m128[3];
      fVar228 = (pre->ray_space).vz.field_0.m128[0];
      fVar233 = (pre->ray_space).vz.field_0.m128[1];
      fVar234 = (pre->ray_space).vz.field_0.m128[2];
      fVar235 = (pre->ray_space).vz.field_0.m128[3];
      auVar188._0_4_ =
           auVar223._0_4_ * fVar219 + auVar208._0_4_ * fVar228 + auVar176._0_4_ * fVar226;
      auVar188._4_4_ =
           auVar223._4_4_ * fVar185 + auVar208._4_4_ * fVar233 + auVar176._4_4_ * fVar196;
      auVar188._8_4_ =
           auVar223._8_4_ * fVar225 + auVar208._8_4_ * fVar234 + auVar176._8_4_ * fVar227;
      auVar188._12_4_ =
           auVar223._12_4_ * fVar195 + auVar208._12_4_ * fVar235 + auVar176._12_4_ * fVar198;
      auVar223 = vblendps_avx(auVar188,auVar102,8);
      auVar125 = _local_770;
      auVar189 = vsubps_avx(_local_770,(undefined1  [16])aVar11);
      auVar176 = vshufps_avx(auVar189,auVar189,0);
      auVar208 = vshufps_avx(auVar189,auVar189,0x55);
      auVar189 = vshufps_avx(auVar189,auVar189,0xaa);
      auVar309._0_4_ =
           auVar176._0_4_ * fVar219 + auVar189._0_4_ * fVar228 + auVar208._0_4_ * fVar226;
      auVar309._4_4_ =
           auVar176._4_4_ * fVar185 + auVar189._4_4_ * fVar233 + auVar208._4_4_ * fVar196;
      auVar309._8_4_ =
           auVar176._8_4_ * fVar225 + auVar189._8_4_ * fVar234 + auVar208._8_4_ * fVar227;
      auVar309._12_4_ =
           auVar176._12_4_ * fVar195 + auVar189._12_4_ * fVar235 + auVar208._12_4_ * fVar198;
      auVar176 = vblendps_avx(auVar309,_local_770,8);
      auVar18 = vsubps_avx(_local_6b0,(undefined1  [16])aVar11);
      auVar208 = vshufps_avx(auVar18,auVar18,0);
      auVar189 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      auVar222._0_4_ = auVar208._0_4_ * fVar219 + auVar189._0_4_ * fVar226 + auVar18._0_4_ * fVar228
      ;
      auVar222._4_4_ = auVar208._4_4_ * fVar185 + auVar189._4_4_ * fVar196 + auVar18._4_4_ * fVar233
      ;
      auVar222._8_4_ = auVar208._8_4_ * fVar225 + auVar189._8_4_ * fVar227 + auVar18._8_4_ * fVar234
      ;
      auVar222._12_4_ =
           auVar208._12_4_ * fVar195 + auVar189._12_4_ * fVar198 + auVar18._12_4_ * fVar235;
      auVar208 = vblendps_avx(auVar222,_local_6b0,8);
      local_380._0_16_ = (undefined1  [16])aVar11;
      auVar19 = vsubps_avx(_local_6c0,(undefined1  [16])aVar11);
      auVar189 = vshufps_avx(auVar19,auVar19,0);
      auVar18 = vshufps_avx(auVar19,auVar19,0x55);
      auVar19 = vshufps_avx(auVar19,auVar19,0xaa);
      auVar151._0_4_ = auVar189._0_4_ * fVar219 + auVar19._0_4_ * fVar228 + auVar18._0_4_ * fVar226;
      auVar151._4_4_ = auVar189._4_4_ * fVar185 + auVar19._4_4_ * fVar233 + auVar18._4_4_ * fVar196;
      auVar151._8_4_ = auVar189._8_4_ * fVar225 + auVar19._8_4_ * fVar234 + auVar18._8_4_ * fVar227;
      auVar151._12_4_ =
           auVar189._12_4_ * fVar195 + auVar19._12_4_ * fVar235 + auVar18._12_4_ * fVar198;
      auVar189 = vblendps_avx(auVar151,_local_6c0,8);
      auVar207._8_4_ = 0x7fffffff;
      auVar207._0_8_ = 0x7fffffff7fffffff;
      auVar207._12_4_ = 0x7fffffff;
      auVar223 = vandps_avx(auVar223,auVar207);
      auVar176 = vandps_avx(auVar176,auVar207);
      auVar18 = vmaxps_avx(auVar223,auVar176);
      auVar223 = vandps_avx(auVar208,auVar207);
      auVar176 = vandps_avx(auVar189,auVar207);
      auVar223 = vmaxps_avx(auVar223,auVar176);
      auVar223 = vmaxps_avx(auVar18,auVar223);
      auVar176 = vmovshdup_avx(auVar223);
      auVar176 = vmaxss_avx(auVar176,auVar223);
      auVar223 = vshufpd_avx(auVar223,auVar223,1);
      auVar223 = vmaxss_avx(auVar223,auVar176);
      lVar116 = (long)(int)uVar14 * 0x44;
      fVar199 = *(float *)(bspline_basis0 + lVar116 + 0x908);
      fVar256 = *(float *)(bspline_basis0 + lVar116 + 0x90c);
      fVar255 = *(float *)(bspline_basis0 + lVar116 + 0x910);
      fVar257 = *(float *)(bspline_basis0 + lVar116 + 0x914);
      fVar200 = *(float *)(bspline_basis0 + lVar116 + 0x918);
      fVar258 = *(float *)(bspline_basis0 + lVar116 + 0x91c);
      fVar259 = *(float *)(bspline_basis0 + lVar116 + 0x920);
      local_700._0_16_ = auVar222;
      auVar176 = vshufps_avx(auVar222,auVar222,0);
      register0x00001250 = auVar176;
      _local_5a0 = auVar176;
      auVar208 = vshufps_avx(auVar222,auVar222,0x55);
      register0x00001290 = auVar208;
      _local_660 = auVar208;
      fVar225 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar116 + 0xd8c);
      fVar195 = *(float *)(bspline_basis0 + lVar116 + 0xd90);
      fVar227 = *(float *)(bspline_basis0 + lVar116 + 0xd94);
      fVar198 = *(float *)(bspline_basis0 + lVar116 + 0xd98);
      fVar234 = *(float *)(bspline_basis0 + lVar116 + 0xd9c);
      fVar235 = *(float *)(bspline_basis0 + lVar116 + 0xda0);
      fVar168 = *(float *)(bspline_basis0 + lVar116 + 0xda4);
      auVar108 = *(undefined1 (*) [28])(bspline_basis0 + lVar116 + 0xd8c);
      auVar189 = vshufps_avx(auVar151,auVar151,0);
      register0x00001350 = auVar189;
      _local_360 = auVar189;
      fVar219 = auVar189._0_4_;
      fVar226 = auVar189._4_4_;
      fVar228 = auVar189._8_4_;
      fVar145 = auVar189._12_4_;
      fVar147 = auVar176._0_4_;
      fVar157 = auVar176._4_4_;
      fVar159 = auVar176._8_4_;
      fVar161 = auVar176._12_4_;
      auVar176 = vshufps_avx(auVar151,auVar151,0x55);
      register0x00001250 = auVar176;
      _local_580 = auVar176;
      fVar185 = auVar176._0_4_;
      fVar196 = auVar176._4_4_;
      fVar233 = auVar176._8_4_;
      fVar287 = auVar176._12_4_;
      fVar169 = auVar208._0_4_;
      fVar181 = auVar208._4_4_;
      fVar182 = auVar208._8_4_;
      fVar183 = auVar208._12_4_;
      auVar126 = _local_6b0;
      auVar176 = vshufps_avx(_local_6b0,_local_6b0,0xff);
      register0x00001550 = auVar176;
      _local_c0 = auVar176;
      auVar19 = _local_6c0;
      auVar208 = vshufps_avx(_local_6c0,_local_6c0,0xff);
      register0x00001410 = auVar208;
      _local_e0 = auVar208;
      fVar204 = auVar208._0_4_;
      fVar214 = auVar208._4_4_;
      fVar216 = auVar208._8_4_;
      fVar218 = auVar208._12_4_;
      fVar271 = auVar176._0_4_;
      fVar295 = auVar176._4_4_;
      fVar299 = auVar176._8_4_;
      fVar300 = auVar176._12_4_;
      auVar176 = vshufps_avx(auVar309,auVar309,0);
      register0x000014d0 = auVar176;
      _local_640 = auVar176;
      fVar261 = *(float *)(bspline_basis0 + lVar116 + 0x484);
      fVar201 = *(float *)(bspline_basis0 + lVar116 + 0x488);
      fVar260 = *(float *)(bspline_basis0 + lVar116 + 0x48c);
      fVar277 = *(float *)(bspline_basis0 + lVar116 + 0x490);
      fStack_3f0 = *(float *)(bspline_basis0 + lVar116 + 0x494);
      fStack_3ec = *(float *)(bspline_basis0 + lVar116 + 0x498);
      fStack_3e8 = *(float *)(bspline_basis0 + lVar116 + 0x49c);
      fStack_3e4 = *(float *)(bspline_basis0 + lVar116 + 0x4a0);
      fVar282 = auVar176._0_4_;
      fVar284 = auVar176._4_4_;
      fVar285 = auVar176._8_4_;
      fVar286 = auVar176._12_4_;
      auVar176 = vshufps_avx(auVar309,auVar309,0x55);
      register0x000015d0 = auVar176;
      _local_5e0 = auVar176;
      fVar308 = auVar176._0_4_;
      fVar312 = auVar176._4_4_;
      fVar313 = auVar176._8_4_;
      fVar314 = auVar176._12_4_;
      auVar176 = vpermilps_avx(_local_770,0xff);
      register0x00001590 = auVar176;
      _local_100 = auVar176;
      fVar301 = auVar176._0_4_;
      fVar302 = auVar176._4_4_;
      fVar305 = auVar176._8_4_;
      fVar306 = auVar176._12_4_;
      auVar176 = vshufps_avx(auVar188,auVar188,0);
      local_340._16_16_ = auVar176;
      local_340._0_16_ = auVar176;
      fVar184 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar116);
      fVar294 = *(float *)(bspline_basis0 + lVar116 + 4);
      fVar164 = *(float *)(bspline_basis0 + lVar116 + 8);
      fVar197 = *(float *)(bspline_basis0 + lVar116 + 0xc);
      fVar254 = *(float *)(bspline_basis0 + lVar116 + 0x10);
      fVar166 = *(float *)(bspline_basis0 + lVar116 + 0x14);
      fVar253 = *(float *)(bspline_basis0 + lVar116 + 0x18);
      auVar109 = *(undefined1 (*) [28])(bspline_basis0 + lVar116);
      fVar203 = auVar176._0_4_;
      fVar213 = auVar176._4_4_;
      fVar215 = auVar176._8_4_;
      fVar217 = auVar176._12_4_;
      auVar230._0_4_ = fVar203 * fVar184 + fVar282 * fVar261 + fVar147 * fVar199 + fVar225 * fVar219
      ;
      auVar230._4_4_ = fVar213 * fVar294 + fVar284 * fVar201 + fVar157 * fVar256 + fVar195 * fVar226
      ;
      auVar230._8_4_ = fVar215 * fVar164 + fVar285 * fVar260 + fVar159 * fVar255 + fVar227 * fVar228
      ;
      auVar230._12_4_ =
           fVar217 * fVar197 + fVar286 * fVar277 + fVar161 * fVar257 + fVar198 * fVar145;
      auVar230._16_4_ =
           fVar203 * fVar254 + fVar282 * fStack_3f0 + fVar147 * fVar200 + fVar234 * fVar219;
      auVar230._20_4_ =
           fVar213 * fVar166 + fVar284 * fStack_3ec + fVar157 * fVar258 + fVar235 * fVar226;
      auVar230._24_4_ =
           fVar215 * fVar253 + fVar285 * fStack_3e8 + fVar159 * fVar259 + fVar168 * fVar228;
      auVar230._28_4_ = fStack_3e4 + fVar161 + 0.0 + 0.0;
      auVar176 = vshufps_avx(auVar188,auVar188,0x55);
      register0x00001490 = auVar176;
      _local_2c0 = auVar176;
      fVar272 = auVar176._0_4_;
      fVar276 = auVar176._4_4_;
      fVar278 = auVar176._8_4_;
      fVar280 = auVar176._12_4_;
      auVar289._0_4_ = fVar272 * fVar184 + fVar308 * fVar261 + fVar169 * fVar199 + fVar225 * fVar185
      ;
      auVar289._4_4_ = fVar276 * fVar294 + fVar312 * fVar201 + fVar181 * fVar256 + fVar195 * fVar196
      ;
      auVar289._8_4_ = fVar278 * fVar164 + fVar313 * fVar260 + fVar182 * fVar255 + fVar227 * fVar233
      ;
      auVar289._12_4_ =
           fVar280 * fVar197 + fVar314 * fVar277 + fVar183 * fVar257 + fVar198 * fVar287;
      auVar289._16_4_ =
           fVar272 * fVar254 + fVar308 * fStack_3f0 + fVar169 * fVar200 + fVar234 * fVar185;
      auVar289._20_4_ =
           fVar276 * fVar166 + fVar312 * fStack_3ec + fVar181 * fVar258 + fVar235 * fVar196;
      auVar289._24_4_ =
           fVar278 * fVar253 + fVar313 * fStack_3e8 + fVar182 * fVar259 + fVar168 * fVar233;
      auVar289._28_4_ = fVar183 + fVar287 + 0.0 + 0.0;
      auVar103._12_4_ = fStack_7a4;
      auVar103._0_12_ = *(undefined1 (*) [12])pPVar2;
      auVar176 = vpermilps_avx(auVar103,0xff);
      register0x00001450 = auVar176;
      _local_120 = auVar176;
      fVar262 = auVar176._0_4_;
      fVar269 = auVar176._4_4_;
      fVar270 = auVar176._8_4_;
      local_7a0._0_4_ =
           fVar262 * fVar184 + fVar301 * fVar261 + fVar271 * fVar199 + fVar204 * fVar225;
      local_7a0._4_4_ =
           fVar269 * fVar294 + fVar302 * fVar201 + fVar295 * fVar256 + fVar214 * fVar195;
      fStack_798 = fVar270 * fVar164 + fVar305 * fVar260 + fVar299 * fVar255 + fVar216 * fVar227;
      fStack_794 = auVar176._12_4_ * fVar197 +
                   fVar306 * fVar277 + fVar300 * fVar257 + fVar218 * fVar198;
      fStack_790 = fVar262 * fVar254 + fVar301 * fStack_3f0 + fVar271 * fVar200 + fVar204 * fVar234;
      fStack_78c = fVar269 * fVar166 + fVar302 * fStack_3ec + fVar295 * fVar258 + fVar214 * fVar235;
      fStack_788 = fVar270 * fVar253 + fVar305 * fStack_3e8 + fVar299 * fVar259 + fVar216 * fVar168;
      fStack_784 = 0.0;
      fVar279 = *(float *)(bspline_basis1 + lVar116 + 0x908);
      fVar146 = *(float *)(bspline_basis1 + lVar116 + 0x90c);
      fVar281 = *(float *)(bspline_basis1 + lVar116 + 0x910);
      fVar123 = *(float *)(bspline_basis1 + lVar116 + 0x914);
      fVar140 = *(float *)(bspline_basis1 + lVar116 + 0x918);
      fVar141 = *(float *)(bspline_basis1 + lVar116 + 0x91c);
      fVar142 = *(float *)(bspline_basis1 + lVar116 + 0x920);
      fVar225 = *(float *)*(undefined1 (*) [28])(bspline_basis1 + lVar116 + 0xd8c);
      fVar195 = *(float *)(bspline_basis1 + lVar116 + 0xd90);
      fVar227 = *(float *)(bspline_basis1 + lVar116 + 0xd94);
      fVar198 = *(float *)(bspline_basis1 + lVar116 + 0xd98);
      fVar234 = *(float *)(bspline_basis1 + lVar116 + 0xd9c);
      fVar235 = *(float *)(bspline_basis1 + lVar116 + 0xda0);
      fVar168 = *(float *)(bspline_basis1 + lVar116 + 0xda4);
      auVar110 = *(undefined1 (*) [28])(bspline_basis1 + lVar116 + 0xd8c);
      fVar143 = *(float *)(bspline_basis1 + lVar116 + 0x484);
      fVar144 = *(float *)(bspline_basis1 + lVar116 + 0x488);
      fVar148 = *(float *)(bspline_basis1 + lVar116 + 0x48c);
      fVar158 = *(float *)(bspline_basis1 + lVar116 + 0x490);
      fVar160 = *(float *)(bspline_basis1 + lVar116 + 0x494);
      fVar162 = *(float *)(bspline_basis1 + lVar116 + 0x498);
      fVar163 = *(float *)(bspline_basis1 + lVar116 + 0x49c);
      fVar184 = fVar300 + fStack_3e4 + 0.0;
      fVar165 = *(float *)(bspline_basis1 + lVar116);
      fVar167 = *(float *)(bspline_basis1 + lVar116 + 4);
      fVar236 = *(float *)(bspline_basis1 + lVar116 + 8);
      fVar202 = *(float *)(bspline_basis1 + lVar116 + 0xc);
      fVar252 = *(float *)(bspline_basis1 + lVar116 + 0x10);
      fVar237 = *(float *)(bspline_basis1 + lVar116 + 0x14);
      fVar246 = *(float *)(bspline_basis1 + lVar116 + 0x18);
      local_3e0._0_4_ =
           fVar165 * fVar203 + fVar282 * fVar143 + fVar279 * fVar147 + fVar219 * fVar225;
      local_3e0._4_4_ =
           fVar167 * fVar213 + fVar284 * fVar144 + fVar146 * fVar157 + fVar226 * fVar195;
      fStack_3d8 = fVar236 * fVar215 + fVar285 * fVar148 + fVar281 * fVar159 + fVar228 * fVar227;
      fStack_3d4 = fVar202 * fVar217 + fVar286 * fVar158 + fVar123 * fVar161 + fVar145 * fVar198;
      fStack_3d0 = fVar252 * fVar203 + fVar282 * fVar160 + fVar140 * fVar147 + fVar219 * fVar234;
      fStack_3cc = fVar237 * fVar213 + fVar284 * fVar162 + fVar141 * fVar157 + fVar226 * fVar235;
      fStack_3c8 = fVar246 * fVar215 + fVar285 * fVar163 + fVar142 * fVar159 + fVar228 * fVar168;
      fStack_3c4 = fVar306 + fVar184;
      local_520._0_4_ =
           fVar272 * fVar165 + fVar308 * fVar143 + fVar279 * fVar169 + fVar225 * fVar185;
      local_520._4_4_ =
           fVar276 * fVar167 + fVar312 * fVar144 + fVar146 * fVar181 + fVar195 * fVar196;
      fStack_518 = fVar278 * fVar236 + fVar313 * fVar148 + fVar281 * fVar182 + fVar227 * fVar233;
      fStack_514 = fVar280 * fVar202 + fVar314 * fVar158 + fVar123 * fVar183 + fVar198 * fVar287;
      fStack_510 = fVar272 * fVar252 + fVar308 * fVar160 + fVar140 * fVar169 + fVar234 * fVar185;
      fStack_50c = fVar276 * fVar237 + fVar312 * fVar162 + fVar141 * fVar181 + fVar235 * fVar196;
      fStack_508 = fVar278 * fVar246 + fVar313 * fVar163 + fVar142 * fVar182 + fVar168 * fVar233;
      fStack_504 = fVar184 + fVar300 + fStack_3e4 + 0.0;
      local_4a0._0_4_ =
           fVar301 * fVar143 + fVar271 * fVar279 + fVar204 * fVar225 + fVar262 * fVar165;
      local_4a0._4_4_ =
           fVar302 * fVar144 + fVar295 * fVar146 + fVar214 * fVar195 + fVar269 * fVar167;
      local_4a0._8_4_ =
           fVar305 * fVar148 + fVar299 * fVar281 + fVar216 * fVar227 + fVar270 * fVar236;
      local_4a0._12_4_ =
           fVar306 * fVar158 + fVar300 * fVar123 + fVar218 * fVar198 + auVar176._12_4_ * fVar202;
      local_4a0._16_4_ =
           fVar301 * fVar160 + fVar271 * fVar140 + fVar204 * fVar234 + fVar262 * fVar252;
      local_4a0._20_4_ =
           fVar302 * fVar162 + fVar295 * fVar141 + fVar214 * fVar235 + fVar269 * fVar237;
      local_4a0._24_4_ =
           fVar305 * fVar163 + fVar299 * fVar142 + fVar216 * fVar168 + fVar270 * fVar246;
      local_4a0._28_4_ = fVar300 + fVar218 + fStack_3e4 + fVar184;
      auVar20 = vsubps_avx(_local_3e0,auVar230);
      auVar21 = vsubps_avx(_local_520,auVar289);
      fVar225 = auVar20._0_4_;
      fVar227 = auVar20._4_4_;
      auVar133._4_4_ = auVar289._4_4_ * fVar227;
      auVar133._0_4_ = auVar289._0_4_ * fVar225;
      fVar234 = auVar20._8_4_;
      auVar133._8_4_ = auVar289._8_4_ * fVar234;
      fVar168 = auVar20._12_4_;
      auVar133._12_4_ = auVar289._12_4_ * fVar168;
      fVar294 = auVar20._16_4_;
      auVar133._16_4_ = auVar289._16_4_ * fVar294;
      fVar197 = auVar20._20_4_;
      auVar133._20_4_ = auVar289._20_4_ * fVar197;
      fVar166 = auVar20._24_4_;
      auVar133._24_4_ = auVar289._24_4_ * fVar166;
      auVar133._28_4_ = fVar184;
      fVar195 = auVar21._0_4_;
      fVar198 = auVar21._4_4_;
      auVar22._4_4_ = auVar230._4_4_ * fVar198;
      auVar22._0_4_ = auVar230._0_4_ * fVar195;
      fVar235 = auVar21._8_4_;
      auVar22._8_4_ = auVar230._8_4_ * fVar235;
      fVar184 = auVar21._12_4_;
      auVar22._12_4_ = auVar230._12_4_ * fVar184;
      fVar164 = auVar21._16_4_;
      auVar22._16_4_ = auVar230._16_4_ * fVar164;
      fVar254 = auVar21._20_4_;
      auVar22._20_4_ = auVar230._20_4_ * fVar254;
      fVar253 = auVar21._24_4_;
      auVar22._24_4_ = auVar230._24_4_ * fVar253;
      auVar22._28_4_ = fStack_504;
      auVar22 = vsubps_avx(auVar133,auVar22);
      auVar133 = vmaxps_avx(_local_7a0,local_4a0);
      auVar27._4_4_ = auVar133._4_4_ * auVar133._4_4_ * (fVar227 * fVar227 + fVar198 * fVar198);
      auVar27._0_4_ = auVar133._0_4_ * auVar133._0_4_ * (fVar225 * fVar225 + fVar195 * fVar195);
      auVar27._8_4_ = auVar133._8_4_ * auVar133._8_4_ * (fVar234 * fVar234 + fVar235 * fVar235);
      auVar27._12_4_ = auVar133._12_4_ * auVar133._12_4_ * (fVar168 * fVar168 + fVar184 * fVar184);
      auVar27._16_4_ = auVar133._16_4_ * auVar133._16_4_ * (fVar294 * fVar294 + fVar164 * fVar164);
      auVar27._20_4_ = auVar133._20_4_ * auVar133._20_4_ * (fVar197 * fVar197 + fVar254 * fVar254);
      auVar27._24_4_ = auVar133._24_4_ * auVar133._24_4_ * (fVar166 * fVar166 + fVar253 * fVar253);
      auVar27._28_4_ = auVar21._28_4_ + fStack_504;
      auVar16._4_4_ = auVar22._4_4_ * auVar22._4_4_;
      auVar16._0_4_ = auVar22._0_4_ * auVar22._0_4_;
      auVar16._8_4_ = auVar22._8_4_ * auVar22._8_4_;
      auVar16._12_4_ = auVar22._12_4_ * auVar22._12_4_;
      auVar16._16_4_ = auVar22._16_4_ * auVar22._16_4_;
      auVar16._20_4_ = auVar22._20_4_ * auVar22._20_4_;
      auVar16._24_4_ = auVar22._24_4_ * auVar22._24_4_;
      auVar16._28_4_ = auVar22._28_4_;
      auVar133 = vcmpps_avx(auVar16,auVar27,2);
      auVar176 = ZEXT416((uint)(float)(int)uVar14);
      _local_3a0 = auVar176;
      auVar176 = vshufps_avx(auVar176,auVar176,0);
      auVar190._16_16_ = auVar176;
      auVar190._0_16_ = auVar176;
      auVar22 = vcmpps_avx(_DAT_01faff40,auVar190,1);
      auVar194 = ZEXT3264(auVar22);
      auVar176 = vpermilps_avx(auVar188,0xaa);
      register0x00001450 = auVar176;
      _local_480 = auVar176;
      auVar208 = vpermilps_avx(auVar309,0xaa);
      register0x00001550 = auVar208;
      _local_2a0 = auVar208;
      auVar189 = vpermilps_avx(auVar222,0xaa);
      register0x00001590 = auVar189;
      _local_80 = auVar189;
      auVar18 = vpermilps_avx(auVar151,0xaa);
      register0x00001310 = auVar18;
      _local_5c0 = auVar18;
      auVar27 = auVar22 & auVar133;
      auVar223 = ZEXT416((uint)(auVar223._0_4_ * 4.7683716e-07));
      fVar225 = fVar282;
      fVar195 = fVar284;
      fVar227 = fVar285;
      fVar198 = fVar169;
      fVar234 = fVar181;
      fVar235 = fVar182;
      fVar168 = fVar183;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar27 >> 0x7f,0) == '\0') &&
            (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar27 >> 0xbf,0) == '\0') &&
          (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar27[0x1f])
      {
        auVar251 = ZEXT3264(local_6e0);
        auVar268 = ZEXT3264(local_680);
        auVar304 = ZEXT3264(_local_5e0);
      }
      else {
        auVar133 = vandps_avx(auVar133,auVar22);
        fVar262 = auVar176._0_4_;
        fVar269 = auVar176._4_4_;
        fVar270 = auVar176._8_4_;
        fVar271 = auVar176._12_4_;
        fVar295 = auVar208._0_4_;
        fVar299 = auVar208._4_4_;
        fVar300 = auVar208._8_4_;
        fVar301 = auVar208._12_4_;
        fVar302 = auVar189._0_4_;
        fVar305 = auVar189._4_4_;
        fVar306 = auVar189._8_4_;
        fVar307 = auVar189._12_4_;
        local_700._0_16_ = auVar223;
        local_440._0_4_ = auVar110._0_4_;
        local_440._4_4_ = auVar110._4_4_;
        fStack_438 = auVar110._8_4_;
        fStack_434 = auVar110._12_4_;
        fStack_430 = auVar110._16_4_;
        fStack_42c = auVar110._20_4_;
        fStack_428 = auVar110._24_4_;
        fVar204 = auVar18._0_4_;
        fVar214 = auVar18._4_4_;
        fVar216 = auVar18._8_4_;
        fVar218 = auVar18._12_4_;
        local_440._0_4_ =
             fVar262 * fVar165 +
             fVar295 * fVar143 + fVar302 * fVar279 + fVar204 * (float)local_440._0_4_;
        local_440._4_4_ =
             fVar269 * fVar167 +
             fVar299 * fVar144 + fVar305 * fVar146 + fVar214 * (float)local_440._4_4_;
        fStack_438 = fVar270 * fVar236 +
                     fVar300 * fVar148 + fVar306 * fVar281 + fVar216 * fStack_438;
        fStack_434 = fVar271 * fVar202 +
                     fVar301 * fVar158 + fVar307 * fVar123 + fVar218 * fStack_434;
        fStack_430 = fVar262 * fVar252 +
                     fVar295 * fVar160 + fVar302 * fVar140 + fVar204 * fStack_430;
        fStack_42c = fVar269 * fVar237 +
                     fVar299 * fVar162 + fVar305 * fVar141 + fVar214 * fStack_42c;
        fStack_428 = fVar270 * fVar246 +
                     fVar300 * fVar163 + fVar306 * fVar142 + fVar216 * fStack_428;
        fStack_424 = auVar133._28_4_ +
                     auVar22._28_4_ +
                     *(float *)(bspline_basis1 + lVar116 + 0x924) + fStack_3e4 + 0.0;
        local_420._0_4_ = auVar109._0_4_;
        local_420._4_4_ = auVar109._4_4_;
        fStack_418 = auVar109._8_4_;
        fStack_414 = auVar109._12_4_;
        fStack_410 = auVar109._16_4_;
        fStack_40c = auVar109._20_4_;
        fStack_408 = auVar109._24_4_;
        local_6a0._0_4_ = auVar108._0_4_;
        local_6a0._4_4_ = auVar108._4_4_;
        fStack_698 = auVar108._8_4_;
        fStack_694 = auVar108._12_4_;
        fStack_690 = auVar108._16_4_;
        fStack_68c = auVar108._20_4_;
        fStack_688 = auVar108._24_4_;
        local_540 = fVar262 * (float)local_420._0_4_ +
                    fVar295 * fVar261 + fVar302 * fVar199 + fVar204 * (float)local_6a0._0_4_;
        fStack_53c = fVar269 * (float)local_420._4_4_ +
                     fVar299 * fVar201 + fVar305 * fVar256 + fVar214 * (float)local_6a0._4_4_;
        fStack_538 = fVar270 * fStack_418 +
                     fVar300 * fVar260 + fVar306 * fVar255 + fVar216 * fStack_698;
        fStack_534 = fVar271 * fStack_414 +
                     fVar301 * fVar277 + fVar307 * fVar257 + fVar218 * fStack_694;
        fStack_530 = fVar262 * fStack_410 +
                     fVar295 * fStack_3f0 + fVar302 * fVar200 + fVar204 * fStack_690;
        fStack_52c = fVar269 * fStack_40c +
                     fVar299 * fStack_3ec + fVar305 * fVar258 + fVar214 * fStack_68c;
        fStack_528 = fVar270 * fStack_408 +
                     fVar300 * fStack_3e8 + fVar306 * fVar259 + fVar216 * fStack_688;
        fStack_524 = fVar280 + fStack_424 + auVar133._28_4_ + auVar22._28_4_;
        fVar184 = *(float *)(bspline_basis0 + lVar116 + 0x1210);
        fVar294 = *(float *)(bspline_basis0 + lVar116 + 0x1214);
        fVar164 = *(float *)(bspline_basis0 + lVar116 + 0x1218);
        fVar197 = *(float *)(bspline_basis0 + lVar116 + 0x121c);
        fVar254 = *(float *)(bspline_basis0 + lVar116 + 0x1220);
        fVar166 = *(float *)(bspline_basis0 + lVar116 + 0x1224);
        fVar253 = *(float *)(bspline_basis0 + lVar116 + 0x1228);
        fVar199 = *(float *)(bspline_basis0 + lVar116 + 0x1694);
        fVar256 = *(float *)(bspline_basis0 + lVar116 + 0x1698);
        fVar255 = *(float *)(bspline_basis0 + lVar116 + 0x169c);
        fVar257 = *(float *)(bspline_basis0 + lVar116 + 0x16a0);
        fVar200 = *(float *)(bspline_basis0 + lVar116 + 0x16a4);
        fVar258 = *(float *)(bspline_basis0 + lVar116 + 0x16a8);
        fVar259 = *(float *)(bspline_basis0 + lVar116 + 0x16ac);
        fVar261 = *(float *)(bspline_basis0 + lVar116 + 0x1b18);
        fVar201 = *(float *)(bspline_basis0 + lVar116 + 0x1b1c);
        fVar260 = *(float *)(bspline_basis0 + lVar116 + 0x1b20);
        fVar277 = *(float *)(bspline_basis0 + lVar116 + 0x1b24);
        fVar279 = *(float *)(bspline_basis0 + lVar116 + 0x1b28);
        fVar146 = *(float *)(bspline_basis0 + lVar116 + 0x1b2c);
        fVar281 = *(float *)(bspline_basis0 + lVar116 + 0x1b30);
        fVar123 = *(float *)(bspline_basis0 + lVar116 + 0x1f9c);
        fVar140 = *(float *)(bspline_basis0 + lVar116 + 0x1fa0);
        fVar141 = *(float *)(bspline_basis0 + lVar116 + 0x1fa4);
        fVar142 = *(float *)(bspline_basis0 + lVar116 + 0x1fa8);
        fVar143 = *(float *)(bspline_basis0 + lVar116 + 0x1fac);
        fVar144 = *(float *)(bspline_basis0 + lVar116 + 0x1fb0);
        fVar148 = *(float *)(bspline_basis0 + lVar116 + 0x1fb4);
        fVar158 = *(float *)(bspline_basis0 + lVar116 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar116 + 0x1fb8);
        fVar160 = *(float *)(bspline_basis0 + lVar116 + 0x16b0) + fVar158;
        local_400 = fVar203 * fVar184 + fVar282 * fVar199 + fVar147 * fVar261 + fVar219 * fVar123;
        fStack_3fc = fVar213 * fVar294 + fVar284 * fVar256 + fVar157 * fVar201 + fVar226 * fVar140;
        fStack_3f8 = fVar215 * fVar164 + fVar285 * fVar255 + fVar159 * fVar260 + fVar228 * fVar141;
        fStack_3f4 = fVar217 * fVar197 + fVar286 * fVar257 + fVar161 * fVar277 + fVar145 * fVar142;
        fStack_3f0 = fVar203 * fVar254 + fVar282 * fVar200 + fVar147 * fVar279 + fVar219 * fVar143;
        fStack_3ec = fVar213 * fVar166 + fVar284 * fVar258 + fVar157 * fVar146 + fVar226 * fVar144;
        fStack_3e8 = fVar215 * fVar253 + fVar285 * fVar259 + fVar159 * fVar281 + fVar228 * fVar148;
        fStack_3e4 = *(float *)(bspline_basis0 + lVar116 + 0x16b0) +
                     *(float *)(bspline_basis0 + lVar116 + 0x1fb8) +
                     fVar271 + *(float *)(bspline_basis1 + lVar116 + 0x4a0);
        auVar241._0_4_ =
             fVar272 * fVar184 + fVar169 * fVar261 + fVar185 * fVar123 + fVar308 * fVar199;
        auVar241._4_4_ =
             fVar276 * fVar294 + fVar181 * fVar201 + fVar196 * fVar140 + fVar312 * fVar256;
        auVar241._8_4_ =
             fVar278 * fVar164 + fVar182 * fVar260 + fVar233 * fVar141 + fVar313 * fVar255;
        auVar241._12_4_ =
             fVar280 * fVar197 + fVar183 * fVar277 + fVar287 * fVar142 + fVar314 * fVar257;
        auVar241._16_4_ =
             fVar272 * fVar254 + fVar169 * fVar279 + fVar185 * fVar143 + fVar308 * fVar200;
        auVar241._20_4_ =
             fVar276 * fVar166 + fVar181 * fVar146 + fVar196 * fVar144 + fVar312 * fVar258;
        auVar241._24_4_ =
             fVar278 * fVar253 + fVar182 * fVar281 + fVar233 * fVar148 + fVar313 * fVar259;
        auVar241._28_4_ =
             fVar158 + fVar271 + *(float *)(bspline_basis1 + lVar116 + 0x1c) +
                       fVar271 + *(float *)(bspline_basis1 + lVar116 + 0x4a0);
        local_420._4_4_ =
             fVar299 * fVar256 + fVar305 * fVar201 + fVar214 * fVar140 + fVar269 * fVar294;
        local_420._0_4_ =
             fVar295 * fVar199 + fVar302 * fVar261 + fVar204 * fVar123 + fVar262 * fVar184;
        fStack_418 = fVar300 * fVar255 + fVar306 * fVar260 + fVar216 * fVar141 + fVar270 * fVar164;
        fStack_414 = fVar301 * fVar257 + fVar307 * fVar277 + fVar218 * fVar142 + fVar271 * fVar197;
        fStack_410 = fVar295 * fVar200 + fVar302 * fVar279 + fVar204 * fVar143 + fVar262 * fVar254;
        fStack_40c = fVar299 * fVar258 + fVar305 * fVar146 + fVar214 * fVar144 + fVar269 * fVar166;
        fStack_408 = fVar300 * fVar259 + fVar306 * fVar281 + fVar216 * fVar148 + fVar270 * fVar253;
        fStack_404 = fVar160 + *(float *)(bspline_basis0 + lVar116 + 0x122c);
        fVar184 = *(float *)(bspline_basis1 + lVar116 + 0x1b18);
        fVar294 = *(float *)(bspline_basis1 + lVar116 + 0x1b1c);
        fVar164 = *(float *)(bspline_basis1 + lVar116 + 0x1b20);
        fVar197 = *(float *)(bspline_basis1 + lVar116 + 0x1b24);
        fVar254 = *(float *)(bspline_basis1 + lVar116 + 0x1b28);
        fVar166 = *(float *)(bspline_basis1 + lVar116 + 0x1b2c);
        fVar253 = *(float *)(bspline_basis1 + lVar116 + 0x1b30);
        fVar199 = *(float *)(bspline_basis1 + lVar116 + 0x1f9c);
        fVar256 = *(float *)(bspline_basis1 + lVar116 + 0x1fa0);
        fVar255 = *(float *)(bspline_basis1 + lVar116 + 0x1fa4);
        fVar257 = *(float *)(bspline_basis1 + lVar116 + 0x1fa8);
        fVar200 = *(float *)(bspline_basis1 + lVar116 + 0x1fac);
        fVar258 = *(float *)(bspline_basis1 + lVar116 + 0x1fb0);
        fVar259 = *(float *)(bspline_basis1 + lVar116 + 0x1fb4);
        fVar261 = *(float *)(bspline_basis1 + lVar116 + 0x1694);
        fVar201 = *(float *)(bspline_basis1 + lVar116 + 0x1698);
        fVar260 = *(float *)(bspline_basis1 + lVar116 + 0x169c);
        fVar277 = *(float *)(bspline_basis1 + lVar116 + 0x16a0);
        fVar279 = *(float *)(bspline_basis1 + lVar116 + 0x16a4);
        fVar146 = *(float *)(bspline_basis1 + lVar116 + 0x16a8);
        fVar281 = *(float *)(bspline_basis1 + lVar116 + 0x16ac);
        fVar123 = *(float *)(bspline_basis1 + lVar116 + 0x1210);
        fVar140 = *(float *)(bspline_basis1 + lVar116 + 0x1214);
        fVar141 = *(float *)(bspline_basis1 + lVar116 + 0x1218);
        fVar142 = *(float *)(bspline_basis1 + lVar116 + 0x121c);
        fVar143 = *(float *)(bspline_basis1 + lVar116 + 0x1220);
        fVar144 = *(float *)(bspline_basis1 + lVar116 + 0x1224);
        fVar148 = *(float *)(bspline_basis1 + lVar116 + 0x1228);
        auVar248._0_4_ =
             fVar203 * fVar123 + fVar282 * fVar261 + fVar147 * fVar184 + fVar219 * fVar199;
        auVar248._4_4_ =
             fVar213 * fVar140 + fVar284 * fVar201 + fVar157 * fVar294 + fVar226 * fVar256;
        auVar248._8_4_ =
             fVar215 * fVar141 + fVar285 * fVar260 + fVar159 * fVar164 + fVar228 * fVar255;
        auVar248._12_4_ =
             fVar217 * fVar142 + fVar286 * fVar277 + fVar161 * fVar197 + fVar145 * fVar257;
        auVar248._16_4_ =
             fVar203 * fVar143 + fVar282 * fVar279 + fVar147 * fVar254 + fVar219 * fVar200;
        auVar248._20_4_ =
             fVar213 * fVar144 + fVar284 * fVar146 + fVar157 * fVar166 + fVar226 * fVar258;
        auVar248._24_4_ =
             fVar215 * fVar148 + fVar285 * fVar281 + fVar159 * fVar253 + fVar228 * fVar259;
        auVar248._28_4_ = fVar183 + fVar183 + fVar271 + fVar160;
        auVar264._0_4_ =
             fVar272 * fVar123 + fVar308 * fVar261 + fVar169 * fVar184 + fVar185 * fVar199;
        auVar264._4_4_ =
             fVar276 * fVar140 + fVar312 * fVar201 + fVar181 * fVar294 + fVar196 * fVar256;
        auVar264._8_4_ =
             fVar278 * fVar141 + fVar313 * fVar260 + fVar182 * fVar164 + fVar233 * fVar255;
        auVar264._12_4_ =
             fVar280 * fVar142 + fVar314 * fVar277 + fVar183 * fVar197 + fVar287 * fVar257;
        auVar264._16_4_ =
             fVar272 * fVar143 + fVar308 * fVar279 + fVar169 * fVar254 + fVar185 * fVar200;
        auVar264._20_4_ =
             fVar276 * fVar144 + fVar312 * fVar146 + fVar181 * fVar166 + fVar196 * fVar258;
        auVar264._24_4_ =
             fVar278 * fVar148 + fVar313 * fVar281 + fVar182 * fVar253 + fVar233 * fVar259;
        auVar264._28_4_ = fVar183 + fVar183 + fVar183 + fVar271;
        auVar180._0_4_ =
             fVar262 * fVar123 + fVar295 * fVar261 + fVar302 * fVar184 + fVar199 * fVar204;
        auVar180._4_4_ =
             fVar269 * fVar140 + fVar299 * fVar201 + fVar305 * fVar294 + fVar256 * fVar214;
        auVar180._8_4_ =
             fVar270 * fVar141 + fVar300 * fVar260 + fVar306 * fVar164 + fVar255 * fVar216;
        auVar180._12_4_ =
             fVar271 * fVar142 + fVar301 * fVar277 + fVar307 * fVar197 + fVar257 * fVar218;
        auVar180._16_4_ =
             fVar262 * fVar143 + fVar295 * fVar279 + fVar302 * fVar254 + fVar200 * fVar204;
        auVar180._20_4_ =
             fVar269 * fVar144 + fVar299 * fVar146 + fVar305 * fVar166 + fVar258 * fVar214;
        auVar180._24_4_ =
             fVar270 * fVar148 + fVar300 * fVar281 + fVar306 * fVar253 + fVar259 * fVar216;
        auVar180._28_4_ =
             *(float *)(bspline_basis1 + lVar116 + 0x122c) +
             *(float *)(bspline_basis1 + lVar116 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar116 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar116 + 0x1fb8);
        auVar209._8_4_ = 0x7fffffff;
        auVar209._0_8_ = 0x7fffffff7fffffff;
        auVar209._12_4_ = 0x7fffffff;
        auVar209._16_4_ = 0x7fffffff;
        auVar209._20_4_ = 0x7fffffff;
        auVar209._24_4_ = 0x7fffffff;
        auVar209._28_4_ = 0x7fffffff;
        auVar107._4_4_ = fStack_3fc;
        auVar107._0_4_ = local_400;
        auVar107._8_4_ = fStack_3f8;
        auVar107._12_4_ = fStack_3f4;
        auVar107._16_4_ = fStack_3f0;
        auVar107._20_4_ = fStack_3ec;
        auVar107._24_4_ = fStack_3e8;
        auVar107._28_4_ = fStack_3e4;
        auVar22 = vandps_avx(auVar107,auVar209);
        auVar27 = vandps_avx(auVar241,auVar209);
        auVar27 = vmaxps_avx(auVar22,auVar27);
        auVar22 = vandps_avx(auVar209,_local_420);
        auVar22 = vmaxps_avx(auVar27,auVar22);
        auVar223 = vpermilps_avx(auVar223,0);
        auVar242._16_16_ = auVar223;
        auVar242._0_16_ = auVar223;
        auVar22 = vcmpps_avx(auVar22,auVar242,1);
        auVar16 = vblendvps_avx(auVar107,auVar20,auVar22);
        auVar190 = vblendvps_avx(auVar241,auVar21,auVar22);
        auVar22 = vandps_avx(auVar248,auVar209);
        auVar27 = vandps_avx(auVar264,auVar209);
        auVar17 = vmaxps_avx(auVar22,auVar27);
        auVar22 = vandps_avx(auVar180,auVar209);
        auVar22 = vmaxps_avx(auVar17,auVar22);
        auVar17 = vcmpps_avx(auVar22,auVar242,1);
        auVar22 = vblendvps_avx(auVar248,auVar20,auVar17);
        auVar20 = vblendvps_avx(auVar264,auVar21,auVar17);
        fVar123 = auVar16._0_4_;
        fVar140 = auVar16._4_4_;
        fVar141 = auVar16._8_4_;
        fVar142 = auVar16._12_4_;
        fVar143 = auVar16._16_4_;
        fVar144 = auVar16._20_4_;
        fVar148 = auVar16._24_4_;
        fVar158 = auVar22._0_4_;
        fVar160 = auVar22._4_4_;
        fVar162 = auVar22._8_4_;
        fVar163 = auVar22._12_4_;
        fVar165 = auVar22._16_4_;
        fVar167 = auVar22._20_4_;
        fVar236 = auVar22._24_4_;
        fVar202 = -auVar22._28_4_;
        fVar219 = auVar190._0_4_;
        fVar228 = auVar190._4_4_;
        fVar184 = auVar190._8_4_;
        fVar254 = auVar190._12_4_;
        fVar256 = auVar190._16_4_;
        fVar258 = auVar190._20_4_;
        fVar260 = auVar190._24_4_;
        auVar129._0_4_ = fVar219 * fVar219 + fVar123 * fVar123;
        auVar129._4_4_ = fVar228 * fVar228 + fVar140 * fVar140;
        auVar129._8_4_ = fVar184 * fVar184 + fVar141 * fVar141;
        auVar129._12_4_ = fVar254 * fVar254 + fVar142 * fVar142;
        auVar129._16_4_ = fVar256 * fVar256 + fVar143 * fVar143;
        auVar129._20_4_ = fVar258 * fVar258 + fVar144 * fVar144;
        auVar129._24_4_ = fVar260 * fVar260 + fVar148 * fVar148;
        auVar129._28_4_ = auVar264._28_4_ + auVar16._28_4_;
        auVar21 = vrsqrtps_avx(auVar129);
        fVar185 = auVar21._0_4_;
        fVar226 = auVar21._4_4_;
        auVar17._4_4_ = fVar226 * 1.5;
        auVar17._0_4_ = fVar185 * 1.5;
        fVar196 = auVar21._8_4_;
        auVar17._8_4_ = fVar196 * 1.5;
        fVar233 = auVar21._12_4_;
        auVar17._12_4_ = fVar233 * 1.5;
        fVar145 = auVar21._16_4_;
        auVar17._16_4_ = fVar145 * 1.5;
        fVar287 = auVar21._20_4_;
        auVar17._20_4_ = fVar287 * 1.5;
        fVar294 = auVar21._24_4_;
        fVar281 = auVar27._28_4_;
        auVar17._24_4_ = fVar294 * 1.5;
        auVar17._28_4_ = fVar281;
        auVar21._4_4_ = fVar226 * fVar226 * fVar226 * auVar129._4_4_ * 0.5;
        auVar21._0_4_ = fVar185 * fVar185 * fVar185 * auVar129._0_4_ * 0.5;
        auVar21._8_4_ = fVar196 * fVar196 * fVar196 * auVar129._8_4_ * 0.5;
        auVar21._12_4_ = fVar233 * fVar233 * fVar233 * auVar129._12_4_ * 0.5;
        auVar21._16_4_ = fVar145 * fVar145 * fVar145 * auVar129._16_4_ * 0.5;
        auVar21._20_4_ = fVar287 * fVar287 * fVar287 * auVar129._20_4_ * 0.5;
        auVar21._24_4_ = fVar294 * fVar294 * fVar294 * auVar129._24_4_ * 0.5;
        auVar21._28_4_ = auVar129._28_4_;
        auVar21 = vsubps_avx(auVar17,auVar21);
        fVar185 = auVar21._0_4_;
        fVar233 = auVar21._4_4_;
        fVar294 = auVar21._8_4_;
        fVar166 = auVar21._12_4_;
        fVar255 = auVar21._16_4_;
        fVar259 = auVar21._20_4_;
        fVar277 = auVar21._24_4_;
        fVar226 = auVar20._0_4_;
        fVar145 = auVar20._4_4_;
        fVar164 = auVar20._8_4_;
        fVar253 = auVar20._12_4_;
        fVar257 = auVar20._16_4_;
        fVar261 = auVar20._20_4_;
        fVar279 = auVar20._24_4_;
        auVar130._0_4_ = fVar226 * fVar226 + fVar158 * fVar158;
        auVar130._4_4_ = fVar145 * fVar145 + fVar160 * fVar160;
        auVar130._8_4_ = fVar164 * fVar164 + fVar162 * fVar162;
        auVar130._12_4_ = fVar253 * fVar253 + fVar163 * fVar163;
        auVar130._16_4_ = fVar257 * fVar257 + fVar165 * fVar165;
        auVar130._20_4_ = fVar261 * fVar261 + fVar167 * fVar167;
        auVar130._24_4_ = fVar279 * fVar279 + fVar236 * fVar236;
        auVar130._28_4_ = auVar22._28_4_ + auVar21._28_4_;
        auVar22 = vrsqrtps_avx(auVar130);
        fVar196 = auVar22._0_4_;
        fVar287 = auVar22._4_4_;
        auVar23._4_4_ = fVar287 * 1.5;
        auVar23._0_4_ = fVar196 * 1.5;
        fVar197 = auVar22._8_4_;
        auVar23._8_4_ = fVar197 * 1.5;
        fVar199 = auVar22._12_4_;
        auVar23._12_4_ = fVar199 * 1.5;
        fVar200 = auVar22._16_4_;
        auVar23._16_4_ = fVar200 * 1.5;
        fVar201 = auVar22._20_4_;
        auVar23._20_4_ = fVar201 * 1.5;
        fVar146 = auVar22._24_4_;
        auVar23._24_4_ = fVar146 * 1.5;
        auVar23._28_4_ = fVar281;
        auVar24._4_4_ = fVar287 * fVar287 * fVar287 * auVar130._4_4_ * 0.5;
        auVar24._0_4_ = fVar196 * fVar196 * fVar196 * auVar130._0_4_ * 0.5;
        auVar24._8_4_ = fVar197 * fVar197 * fVar197 * auVar130._8_4_ * 0.5;
        auVar24._12_4_ = fVar199 * fVar199 * fVar199 * auVar130._12_4_ * 0.5;
        auVar24._16_4_ = fVar200 * fVar200 * fVar200 * auVar130._16_4_ * 0.5;
        auVar24._20_4_ = fVar201 * fVar201 * fVar201 * auVar130._20_4_ * 0.5;
        auVar24._24_4_ = fVar146 * fVar146 * fVar146 * auVar130._24_4_ * 0.5;
        auVar24._28_4_ = auVar130._28_4_;
        auVar22 = vsubps_avx(auVar23,auVar24);
        fVar196 = auVar22._0_4_;
        fVar287 = auVar22._4_4_;
        fVar197 = auVar22._8_4_;
        fVar199 = auVar22._12_4_;
        fVar200 = auVar22._16_4_;
        fVar201 = auVar22._20_4_;
        fVar146 = auVar22._24_4_;
        fVar219 = (float)local_7a0._0_4_ * fVar219 * fVar185;
        fVar228 = (float)local_7a0._4_4_ * fVar228 * fVar233;
        auVar25._4_4_ = fVar228;
        auVar25._0_4_ = fVar219;
        fVar184 = fStack_798 * fVar184 * fVar294;
        auVar25._8_4_ = fVar184;
        fVar254 = fStack_794 * fVar254 * fVar166;
        auVar25._12_4_ = fVar254;
        fVar256 = fStack_790 * fVar256 * fVar255;
        auVar25._16_4_ = fVar256;
        fVar258 = fStack_78c * fVar258 * fVar259;
        auVar25._20_4_ = fVar258;
        fVar260 = fStack_788 * fVar260 * fVar277;
        auVar25._24_4_ = fVar260;
        auVar25._28_4_ = fVar202;
        local_6a0._4_4_ = fVar228 + auVar230._4_4_;
        local_6a0._0_4_ = fVar219 + auVar230._0_4_;
        fStack_698 = fVar184 + auVar230._8_4_;
        fStack_694 = fVar254 + auVar230._12_4_;
        fStack_690 = fVar256 + auVar230._16_4_;
        fStack_68c = fVar258 + auVar230._20_4_;
        fStack_688 = fVar260 + auVar230._24_4_;
        fStack_684 = fVar202 + auVar230._28_4_;
        fVar219 = (float)local_7a0._0_4_ * fVar185 * -fVar123;
        fVar228 = (float)local_7a0._4_4_ * fVar233 * -fVar140;
        auVar26._4_4_ = fVar228;
        auVar26._0_4_ = fVar219;
        fVar184 = fStack_798 * fVar294 * -fVar141;
        auVar26._8_4_ = fVar184;
        fVar254 = fStack_794 * fVar166 * -fVar142;
        auVar26._12_4_ = fVar254;
        fVar256 = fStack_790 * fVar255 * -fVar143;
        auVar26._16_4_ = fVar256;
        fVar258 = fStack_78c * fVar259 * -fVar144;
        auVar26._20_4_ = fVar258;
        fVar260 = fStack_788 * fVar277 * -fVar148;
        auVar26._24_4_ = fVar260;
        auVar26._28_4_ = fVar281;
        local_560._4_4_ = fVar228 + auVar289._4_4_;
        local_560._0_4_ = fVar219 + auVar289._0_4_;
        fStack_558 = fVar184 + auVar289._8_4_;
        fStack_554 = fVar254 + auVar289._12_4_;
        fStack_550 = fVar256 + auVar289._16_4_;
        fStack_54c = fVar258 + auVar289._20_4_;
        fStack_548 = fVar260 + auVar289._24_4_;
        fStack_544 = fVar281 + auVar289._28_4_;
        fVar219 = fVar185 * 0.0 * (float)local_7a0._0_4_;
        fVar185 = fVar233 * 0.0 * (float)local_7a0._4_4_;
        auVar28._4_4_ = fVar185;
        auVar28._0_4_ = fVar219;
        fVar228 = fVar294 * 0.0 * fStack_798;
        auVar28._8_4_ = fVar228;
        fVar233 = fVar166 * 0.0 * fStack_794;
        auVar28._12_4_ = fVar233;
        fVar184 = fVar255 * 0.0 * fStack_790;
        auVar28._16_4_ = fVar184;
        fVar294 = fVar259 * 0.0 * fStack_78c;
        auVar28._20_4_ = fVar294;
        fVar254 = fVar277 * 0.0 * fStack_788;
        auVar28._24_4_ = fVar254;
        auVar28._28_4_ = fVar161;
        auVar104._4_4_ = fStack_53c;
        auVar104._0_4_ = local_540;
        auVar104._8_4_ = fStack_538;
        auVar104._12_4_ = fStack_534;
        auVar104._16_4_ = fStack_530;
        auVar104._20_4_ = fStack_52c;
        auVar104._24_4_ = fStack_528;
        auVar104._28_4_ = fStack_524;
        auVar243._0_4_ = local_540 + fVar219;
        auVar243._4_4_ = fStack_53c + fVar185;
        auVar243._8_4_ = fStack_538 + fVar228;
        auVar243._12_4_ = fStack_534 + fVar233;
        auVar243._16_4_ = fStack_530 + fVar184;
        auVar243._20_4_ = fStack_52c + fVar294;
        auVar243._24_4_ = fStack_528 + fVar254;
        auVar243._28_4_ = fStack_524 + fVar161;
        fVar219 = local_4a0._0_4_ * fVar226 * fVar196;
        fVar185 = local_4a0._4_4_ * fVar145 * fVar287;
        auVar29._4_4_ = fVar185;
        auVar29._0_4_ = fVar219;
        fVar226 = local_4a0._8_4_ * fVar164 * fVar197;
        auVar29._8_4_ = fVar226;
        fVar228 = local_4a0._12_4_ * fVar253 * fVar199;
        auVar29._12_4_ = fVar228;
        fVar233 = local_4a0._16_4_ * fVar257 * fVar200;
        auVar29._16_4_ = fVar233;
        fVar145 = local_4a0._20_4_ * fVar261 * fVar201;
        auVar29._20_4_ = fVar145;
        fVar184 = local_4a0._24_4_ * fVar279 * fVar146;
        auVar29._24_4_ = fVar184;
        auVar29._28_4_ = auVar20._28_4_;
        auVar16 = vsubps_avx(auVar230,auVar25);
        auVar265._0_4_ = (float)local_3e0._0_4_ + fVar219;
        auVar265._4_4_ = (float)local_3e0._4_4_ + fVar185;
        auVar265._8_4_ = fStack_3d8 + fVar226;
        auVar265._12_4_ = fStack_3d4 + fVar228;
        auVar265._16_4_ = fStack_3d0 + fVar233;
        auVar265._20_4_ = fStack_3cc + fVar145;
        auVar265._24_4_ = fStack_3c8 + fVar184;
        auVar265._28_4_ = fStack_3c4 + auVar20._28_4_;
        fVar219 = local_4a0._0_4_ * -fVar158 * fVar196;
        fVar185 = local_4a0._4_4_ * -fVar160 * fVar287;
        auVar20._4_4_ = fVar185;
        auVar20._0_4_ = fVar219;
        fVar226 = local_4a0._8_4_ * -fVar162 * fVar197;
        auVar20._8_4_ = fVar226;
        fVar228 = local_4a0._12_4_ * -fVar163 * fVar199;
        auVar20._12_4_ = fVar228;
        fVar233 = local_4a0._16_4_ * -fVar165 * fVar200;
        auVar20._16_4_ = fVar233;
        fVar145 = local_4a0._20_4_ * -fVar167 * fVar201;
        auVar20._20_4_ = fVar145;
        fVar184 = local_4a0._24_4_ * -fVar236 * fVar146;
        auVar20._24_4_ = fVar184;
        auVar20._28_4_ = fVar301;
        auVar190 = vsubps_avx(auVar289,auVar26);
        auVar273._0_4_ = fVar219 + (float)local_520._0_4_;
        auVar273._4_4_ = fVar185 + (float)local_520._4_4_;
        auVar273._8_4_ = fVar226 + fStack_518;
        auVar273._12_4_ = fVar228 + fStack_514;
        auVar273._16_4_ = fVar233 + fStack_510;
        auVar273._20_4_ = fVar145 + fStack_50c;
        auVar273._24_4_ = fVar184 + fStack_508;
        auVar273._28_4_ = fVar301 + fStack_504;
        fVar219 = fVar196 * 0.0 * local_4a0._0_4_;
        fVar185 = fVar287 * 0.0 * local_4a0._4_4_;
        auVar30._4_4_ = fVar185;
        auVar30._0_4_ = fVar219;
        fVar226 = fVar197 * 0.0 * local_4a0._8_4_;
        auVar30._8_4_ = fVar226;
        fVar196 = fVar199 * 0.0 * local_4a0._12_4_;
        auVar30._12_4_ = fVar196;
        fVar228 = fVar200 * 0.0 * local_4a0._16_4_;
        auVar30._16_4_ = fVar228;
        fVar233 = fVar201 * 0.0 * local_4a0._20_4_;
        auVar30._20_4_ = fVar233;
        fVar145 = fVar146 * 0.0 * local_4a0._24_4_;
        auVar30._24_4_ = fVar145;
        auVar30._28_4_ = fVar307;
        auVar289 = vsubps_avx(auVar104,auVar28);
        auVar310._0_4_ = fVar219 + (float)local_440._0_4_;
        auVar310._4_4_ = fVar185 + (float)local_440._4_4_;
        auVar310._8_4_ = fVar226 + fStack_438;
        auVar310._12_4_ = fVar196 + fStack_434;
        auVar310._16_4_ = fVar228 + fStack_430;
        auVar310._20_4_ = fVar233 + fStack_42c;
        auVar310._24_4_ = fVar145 + fStack_428;
        auVar310._28_4_ = fVar307 + fStack_424;
        auVar22 = vsubps_avx(_local_3e0,auVar29);
        auVar20 = vsubps_avx(_local_520,auVar20);
        auVar21 = vsubps_avx(_local_440,auVar30);
        auVar27 = vsubps_avx(auVar273,auVar190);
        auVar230 = vsubps_avx(auVar310,auVar289);
        auVar31._4_4_ = auVar289._4_4_ * auVar27._4_4_;
        auVar31._0_4_ = auVar289._0_4_ * auVar27._0_4_;
        auVar31._8_4_ = auVar289._8_4_ * auVar27._8_4_;
        auVar31._12_4_ = auVar289._12_4_ * auVar27._12_4_;
        auVar31._16_4_ = auVar289._16_4_ * auVar27._16_4_;
        auVar31._20_4_ = auVar289._20_4_ * auVar27._20_4_;
        auVar31._24_4_ = auVar289._24_4_ * auVar27._24_4_;
        auVar31._28_4_ = fVar307;
        auVar32._4_4_ = auVar190._4_4_ * auVar230._4_4_;
        auVar32._0_4_ = auVar190._0_4_ * auVar230._0_4_;
        auVar32._8_4_ = auVar190._8_4_ * auVar230._8_4_;
        auVar32._12_4_ = auVar190._12_4_ * auVar230._12_4_;
        auVar32._16_4_ = auVar190._16_4_ * auVar230._16_4_;
        auVar32._20_4_ = auVar190._20_4_ * auVar230._20_4_;
        auVar32._24_4_ = auVar190._24_4_ * auVar230._24_4_;
        auVar32._28_4_ = fStack_424;
        auVar17 = vsubps_avx(auVar32,auVar31);
        auVar33._4_4_ = auVar16._4_4_ * auVar230._4_4_;
        auVar33._0_4_ = auVar16._0_4_ * auVar230._0_4_;
        auVar33._8_4_ = auVar16._8_4_ * auVar230._8_4_;
        auVar33._12_4_ = auVar16._12_4_ * auVar230._12_4_;
        auVar33._16_4_ = auVar16._16_4_ * auVar230._16_4_;
        auVar33._20_4_ = auVar16._20_4_ * auVar230._20_4_;
        auVar33._24_4_ = auVar16._24_4_ * auVar230._24_4_;
        auVar33._28_4_ = auVar230._28_4_;
        auVar23 = vsubps_avx(auVar265,auVar16);
        auVar34._4_4_ = auVar289._4_4_ * auVar23._4_4_;
        auVar34._0_4_ = auVar289._0_4_ * auVar23._0_4_;
        auVar34._8_4_ = auVar289._8_4_ * auVar23._8_4_;
        auVar34._12_4_ = auVar289._12_4_ * auVar23._12_4_;
        auVar34._16_4_ = auVar289._16_4_ * auVar23._16_4_;
        auVar34._20_4_ = auVar289._20_4_ * auVar23._20_4_;
        auVar34._24_4_ = auVar289._24_4_ * auVar23._24_4_;
        auVar34._28_4_ = fStack_504;
        auVar24 = vsubps_avx(auVar34,auVar33);
        auVar35._4_4_ = auVar23._4_4_ * auVar190._4_4_;
        auVar35._0_4_ = auVar23._0_4_ * auVar190._0_4_;
        auVar35._8_4_ = auVar23._8_4_ * auVar190._8_4_;
        auVar35._12_4_ = auVar23._12_4_ * auVar190._12_4_;
        auVar35._16_4_ = auVar23._16_4_ * auVar190._16_4_;
        auVar35._20_4_ = auVar23._20_4_ * auVar190._20_4_;
        auVar35._24_4_ = auVar23._24_4_ * auVar190._24_4_;
        auVar35._28_4_ = auVar230._28_4_;
        auVar36._4_4_ = auVar16._4_4_ * auVar27._4_4_;
        auVar36._0_4_ = auVar16._0_4_ * auVar27._0_4_;
        auVar36._8_4_ = auVar16._8_4_ * auVar27._8_4_;
        auVar36._12_4_ = auVar16._12_4_ * auVar27._12_4_;
        auVar36._16_4_ = auVar16._16_4_ * auVar27._16_4_;
        auVar36._20_4_ = auVar16._20_4_ * auVar27._20_4_;
        auVar36._24_4_ = auVar16._24_4_ * auVar27._24_4_;
        auVar36._28_4_ = auVar27._28_4_;
        auVar27 = vsubps_avx(auVar36,auVar35);
        auVar131._0_4_ = auVar17._0_4_ * 0.0 + auVar27._0_4_ + auVar24._0_4_ * 0.0;
        auVar131._4_4_ = auVar17._4_4_ * 0.0 + auVar27._4_4_ + auVar24._4_4_ * 0.0;
        auVar131._8_4_ = auVar17._8_4_ * 0.0 + auVar27._8_4_ + auVar24._8_4_ * 0.0;
        auVar131._12_4_ = auVar17._12_4_ * 0.0 + auVar27._12_4_ + auVar24._12_4_ * 0.0;
        auVar131._16_4_ = auVar17._16_4_ * 0.0 + auVar27._16_4_ + auVar24._16_4_ * 0.0;
        auVar131._20_4_ = auVar17._20_4_ * 0.0 + auVar27._20_4_ + auVar24._20_4_ * 0.0;
        auVar131._24_4_ = auVar17._24_4_ * 0.0 + auVar27._24_4_ + auVar24._24_4_ * 0.0;
        auVar131._28_4_ = auVar27._28_4_ + auVar27._28_4_ + auVar24._28_4_;
        auVar230 = vcmpps_avx(auVar131,ZEXT432(0) << 0x20,2);
        _local_500 = vblendvps_avx(auVar22,_local_6a0,auVar230);
        local_3c0 = vblendvps_avx(auVar20,_local_560,auVar230);
        auVar22 = vblendvps_avx(auVar21,auVar243,auVar230);
        auVar20 = vblendvps_avx(auVar16,auVar265,auVar230);
        auVar21 = vblendvps_avx(auVar190,auVar273,auVar230);
        auVar27 = vblendvps_avx(auVar289,auVar310,auVar230);
        auVar16 = vblendvps_avx(auVar265,auVar16,auVar230);
        auVar190 = vblendvps_avx(auVar273,auVar190,auVar230);
        local_720 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
        auStack_710 = auVar133._16_16_;
        auVar133 = vblendvps_avx(auVar310,auVar289,auVar230);
        auVar16 = vsubps_avx(auVar16,_local_500);
        auVar17 = vsubps_avx(auVar190,local_3c0);
        auVar23 = vsubps_avx(auVar133,auVar22);
        auVar133 = vsubps_avx(local_3c0,auVar21);
        fVar219 = auVar17._0_4_;
        fVar148 = auVar22._0_4_;
        fVar233 = auVar17._4_4_;
        fVar158 = auVar22._4_4_;
        auVar37._4_4_ = fVar158 * fVar233;
        auVar37._0_4_ = fVar148 * fVar219;
        fVar164 = auVar17._8_4_;
        fVar160 = auVar22._8_4_;
        auVar37._8_4_ = fVar160 * fVar164;
        fVar199 = auVar17._12_4_;
        fVar162 = auVar22._12_4_;
        auVar37._12_4_ = fVar162 * fVar199;
        fVar258 = auVar17._16_4_;
        fVar163 = auVar22._16_4_;
        auVar37._16_4_ = fVar163 * fVar258;
        fVar277 = auVar17._20_4_;
        fVar165 = auVar22._20_4_;
        auVar37._20_4_ = fVar165 * fVar277;
        fVar140 = auVar17._24_4_;
        fVar167 = auVar22._24_4_;
        auVar37._24_4_ = fVar167 * fVar140;
        auVar37._28_4_ = auVar190._28_4_;
        fVar185 = local_3c0._0_4_;
        fVar159 = auVar23._0_4_;
        fVar145 = local_3c0._4_4_;
        fVar161 = auVar23._4_4_;
        auVar38._4_4_ = fVar161 * fVar145;
        auVar38._0_4_ = fVar159 * fVar185;
        fVar197 = local_3c0._8_4_;
        fVar203 = auVar23._8_4_;
        auVar38._8_4_ = fVar203 * fVar197;
        fVar256 = local_3c0._12_4_;
        fVar213 = auVar23._12_4_;
        auVar38._12_4_ = fVar213 * fVar256;
        fVar259 = local_3c0._16_4_;
        fVar215 = auVar23._16_4_;
        auVar38._16_4_ = fVar215 * fVar259;
        fVar279 = local_3c0._20_4_;
        fVar217 = auVar23._20_4_;
        auVar38._20_4_ = fVar217 * fVar279;
        fVar141 = local_3c0._24_4_;
        fVar204 = auVar23._24_4_;
        uVar9 = auVar289._28_4_;
        auVar38._24_4_ = fVar204 * fVar141;
        auVar38._28_4_ = uVar9;
        auVar190 = vsubps_avx(auVar38,auVar37);
        fVar226 = local_500._0_4_;
        fVar287 = local_500._4_4_;
        auVar39._4_4_ = fVar161 * fVar287;
        auVar39._0_4_ = fVar159 * fVar226;
        fVar254 = local_500._8_4_;
        auVar39._8_4_ = fVar203 * fVar254;
        fVar255 = local_500._12_4_;
        auVar39._12_4_ = fVar213 * fVar255;
        fVar261 = local_500._16_4_;
        auVar39._16_4_ = fVar215 * fVar261;
        fVar146 = local_500._20_4_;
        auVar39._20_4_ = fVar217 * fVar146;
        fVar142 = local_500._24_4_;
        auVar39._24_4_ = fVar204 * fVar142;
        auVar39._28_4_ = uVar9;
        fVar196 = auVar16._0_4_;
        auVar303._0_4_ = fVar148 * fVar196;
        fVar184 = auVar16._4_4_;
        auVar303._4_4_ = fVar158 * fVar184;
        fVar166 = auVar16._8_4_;
        auVar303._8_4_ = fVar160 * fVar166;
        fVar257 = auVar16._12_4_;
        auVar303._12_4_ = fVar162 * fVar257;
        fVar201 = auVar16._16_4_;
        auVar303._16_4_ = fVar163 * fVar201;
        fVar281 = auVar16._20_4_;
        auVar303._20_4_ = fVar165 * fVar281;
        fVar143 = auVar16._24_4_;
        auVar303._24_4_ = fVar167 * fVar143;
        auVar303._28_4_ = 0;
        auVar289 = vsubps_avx(auVar303,auVar39);
        auVar40._4_4_ = fVar145 * fVar184;
        auVar40._0_4_ = fVar185 * fVar196;
        auVar40._8_4_ = fVar197 * fVar166;
        auVar40._12_4_ = fVar256 * fVar257;
        auVar40._16_4_ = fVar259 * fVar201;
        auVar40._20_4_ = fVar279 * fVar281;
        auVar40._24_4_ = fVar141 * fVar143;
        auVar40._28_4_ = uVar9;
        auVar41._4_4_ = fVar287 * fVar233;
        auVar41._0_4_ = fVar226 * fVar219;
        auVar41._8_4_ = fVar254 * fVar164;
        auVar41._12_4_ = fVar255 * fVar199;
        auVar41._16_4_ = fVar261 * fVar258;
        auVar41._20_4_ = fVar146 * fVar277;
        auVar41._24_4_ = fVar142 * fVar140;
        auVar41._28_4_ = auVar310._28_4_;
        auVar24 = vsubps_avx(auVar41,auVar40);
        auVar25 = vsubps_avx(auVar22,auVar27);
        fVar228 = auVar24._28_4_ + auVar289._28_4_;
        auVar244._0_4_ = auVar24._0_4_ + auVar289._0_4_ * 0.0 + auVar190._0_4_ * 0.0;
        auVar244._4_4_ = auVar24._4_4_ + auVar289._4_4_ * 0.0 + auVar190._4_4_ * 0.0;
        auVar244._8_4_ = auVar24._8_4_ + auVar289._8_4_ * 0.0 + auVar190._8_4_ * 0.0;
        auVar244._12_4_ = auVar24._12_4_ + auVar289._12_4_ * 0.0 + auVar190._12_4_ * 0.0;
        auVar244._16_4_ = auVar24._16_4_ + auVar289._16_4_ * 0.0 + auVar190._16_4_ * 0.0;
        auVar244._20_4_ = auVar24._20_4_ + auVar289._20_4_ * 0.0 + auVar190._20_4_ * 0.0;
        auVar244._24_4_ = auVar24._24_4_ + auVar289._24_4_ * 0.0 + auVar190._24_4_ * 0.0;
        auVar244._28_4_ = fVar228 + auVar190._28_4_;
        fVar236 = auVar133._0_4_;
        fVar202 = auVar133._4_4_;
        auVar42._4_4_ = fVar202 * auVar27._4_4_;
        auVar42._0_4_ = fVar236 * auVar27._0_4_;
        fVar252 = auVar133._8_4_;
        auVar42._8_4_ = fVar252 * auVar27._8_4_;
        fVar237 = auVar133._12_4_;
        auVar42._12_4_ = fVar237 * auVar27._12_4_;
        fVar246 = auVar133._16_4_;
        auVar42._16_4_ = fVar246 * auVar27._16_4_;
        fVar147 = auVar133._20_4_;
        auVar42._20_4_ = fVar147 * auVar27._20_4_;
        fVar157 = auVar133._24_4_;
        auVar42._24_4_ = fVar157 * auVar27._24_4_;
        auVar42._28_4_ = fVar228;
        fVar228 = auVar25._0_4_;
        fVar294 = auVar25._4_4_;
        auVar43._4_4_ = auVar21._4_4_ * fVar294;
        auVar43._0_4_ = auVar21._0_4_ * fVar228;
        fVar253 = auVar25._8_4_;
        auVar43._8_4_ = auVar21._8_4_ * fVar253;
        fVar200 = auVar25._12_4_;
        auVar43._12_4_ = auVar21._12_4_ * fVar200;
        fVar260 = auVar25._16_4_;
        auVar43._16_4_ = auVar21._16_4_ * fVar260;
        fVar123 = auVar25._20_4_;
        auVar43._20_4_ = auVar21._20_4_ * fVar123;
        fVar144 = auVar25._24_4_;
        auVar43._24_4_ = auVar21._24_4_ * fVar144;
        auVar43._28_4_ = auVar24._28_4_;
        auVar133 = vsubps_avx(auVar43,auVar42);
        auVar289 = vsubps_avx(_local_500,auVar20);
        fVar214 = auVar289._0_4_;
        fVar216 = auVar289._4_4_;
        auVar44._4_4_ = fVar216 * auVar27._4_4_;
        auVar44._0_4_ = fVar214 * auVar27._0_4_;
        fVar218 = auVar289._8_4_;
        auVar44._8_4_ = fVar218 * auVar27._8_4_;
        fVar262 = auVar289._12_4_;
        auVar44._12_4_ = fVar262 * auVar27._12_4_;
        fVar269 = auVar289._16_4_;
        auVar44._16_4_ = fVar269 * auVar27._16_4_;
        fVar270 = auVar289._20_4_;
        auVar44._20_4_ = fVar270 * auVar27._20_4_;
        fVar272 = auVar289._24_4_;
        auVar44._24_4_ = fVar272 * auVar27._24_4_;
        auVar44._28_4_ = auVar27._28_4_;
        auVar45._4_4_ = auVar20._4_4_ * fVar294;
        auVar45._0_4_ = auVar20._0_4_ * fVar228;
        auVar45._8_4_ = auVar20._8_4_ * fVar253;
        auVar45._12_4_ = auVar20._12_4_ * fVar200;
        auVar45._16_4_ = auVar20._16_4_ * fVar260;
        auVar45._20_4_ = auVar20._20_4_ * fVar123;
        auVar45._24_4_ = auVar20._24_4_ * fVar144;
        auVar45._28_4_ = auVar190._28_4_;
        auVar190 = vsubps_avx(auVar44,auVar45);
        auVar46._4_4_ = auVar21._4_4_ * fVar216;
        auVar46._0_4_ = auVar21._0_4_ * fVar214;
        auVar46._8_4_ = auVar21._8_4_ * fVar218;
        auVar46._12_4_ = auVar21._12_4_ * fVar262;
        auVar46._16_4_ = auVar21._16_4_ * fVar269;
        auVar46._20_4_ = auVar21._20_4_ * fVar270;
        auVar46._24_4_ = auVar21._24_4_ * fVar272;
        auVar46._28_4_ = auVar27._28_4_;
        auVar47._4_4_ = auVar20._4_4_ * fVar202;
        auVar47._0_4_ = auVar20._0_4_ * fVar236;
        auVar47._8_4_ = auVar20._8_4_ * fVar252;
        auVar47._12_4_ = auVar20._12_4_ * fVar237;
        auVar47._16_4_ = auVar20._16_4_ * fVar246;
        auVar47._20_4_ = auVar20._20_4_ * fVar147;
        auVar47._24_4_ = auVar20._24_4_ * fVar157;
        auVar47._28_4_ = auVar20._28_4_;
        auVar20 = vsubps_avx(auVar47,auVar46);
        auVar210._0_4_ = auVar133._0_4_ * 0.0 + auVar20._0_4_ + auVar190._0_4_ * 0.0;
        auVar210._4_4_ = auVar133._4_4_ * 0.0 + auVar20._4_4_ + auVar190._4_4_ * 0.0;
        auVar210._8_4_ = auVar133._8_4_ * 0.0 + auVar20._8_4_ + auVar190._8_4_ * 0.0;
        auVar210._12_4_ = auVar133._12_4_ * 0.0 + auVar20._12_4_ + auVar190._12_4_ * 0.0;
        auVar210._16_4_ = auVar133._16_4_ * 0.0 + auVar20._16_4_ + auVar190._16_4_ * 0.0;
        auVar210._20_4_ = auVar133._20_4_ * 0.0 + auVar20._20_4_ + auVar190._20_4_ * 0.0;
        auVar210._24_4_ = auVar133._24_4_ * 0.0 + auVar20._24_4_ + auVar190._24_4_ * 0.0;
        auVar210._28_4_ = auVar20._28_4_ + auVar20._28_4_ + auVar190._28_4_;
        auVar133 = vmaxps_avx(auVar244,auVar210);
        auVar133 = vcmpps_avx(auVar133,ZEXT832(0) << 0x20,2);
        auVar223 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
        auVar223 = vpand_avx(auVar223,local_720);
        auVar176 = vpmovsxwd_avx(auVar223);
        auVar208 = vpunpckhwd_avx(auVar223,auVar223);
        auVar191._16_16_ = auVar208;
        auVar191._0_16_ = auVar176;
        if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar191 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar191 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar191 >> 0x7f,0) == '\0') &&
              (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar208 >> 0x3f,0) == '\0') &&
            (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar208[0xf]) {
LAB_00e27534:
          auVar194 = ZEXT3264(auVar191);
          auVar139 = ZEXT3264(CONCAT824(local_4e0[1]._24_8_,
                                        CONCAT816(local_4e0[1]._16_8_,
                                                  CONCAT88(local_4e0[1]._8_8_,local_4e0[1]._0_8_))))
          ;
          auVar251 = ZEXT3264(local_6e0);
          auVar268 = ZEXT3264(local_680);
        }
        else {
          auVar48._4_4_ = fVar294 * fVar233;
          auVar48._0_4_ = fVar228 * fVar219;
          auVar48._8_4_ = fVar253 * fVar164;
          auVar48._12_4_ = fVar200 * fVar199;
          auVar48._16_4_ = fVar260 * fVar258;
          auVar48._20_4_ = fVar123 * fVar277;
          auVar48._24_4_ = fVar144 * fVar140;
          auVar48._28_4_ = auVar208._12_4_;
          auVar290._0_4_ = fVar236 * fVar159;
          auVar290._4_4_ = fVar202 * fVar161;
          auVar290._8_4_ = fVar252 * fVar203;
          auVar290._12_4_ = fVar237 * fVar213;
          auVar290._16_4_ = fVar246 * fVar215;
          auVar290._20_4_ = fVar147 * fVar217;
          auVar290._24_4_ = fVar157 * fVar204;
          auVar290._28_4_ = 0;
          auVar133 = vsubps_avx(auVar290,auVar48);
          auVar49._4_4_ = fVar216 * fVar161;
          auVar49._0_4_ = fVar214 * fVar159;
          auVar49._8_4_ = fVar218 * fVar203;
          auVar49._12_4_ = fVar262 * fVar213;
          auVar49._16_4_ = fVar269 * fVar215;
          auVar49._20_4_ = fVar270 * fVar217;
          auVar49._24_4_ = fVar272 * fVar204;
          auVar49._28_4_ = auVar23._28_4_;
          auVar50._4_4_ = fVar294 * fVar184;
          auVar50._0_4_ = fVar228 * fVar196;
          auVar50._8_4_ = fVar253 * fVar166;
          auVar50._12_4_ = fVar200 * fVar257;
          auVar50._16_4_ = fVar260 * fVar201;
          auVar50._20_4_ = fVar123 * fVar281;
          auVar50._24_4_ = fVar144 * fVar143;
          auVar50._28_4_ = auVar25._28_4_;
          auVar21 = vsubps_avx(auVar50,auVar49);
          auVar51._4_4_ = fVar202 * fVar184;
          auVar51._0_4_ = fVar236 * fVar196;
          auVar51._8_4_ = fVar252 * fVar166;
          auVar51._12_4_ = fVar237 * fVar257;
          auVar51._16_4_ = fVar246 * fVar201;
          auVar51._20_4_ = fVar147 * fVar281;
          auVar51._24_4_ = fVar157 * fVar143;
          auVar51._28_4_ = auVar16._28_4_;
          auVar52._4_4_ = fVar216 * fVar233;
          auVar52._0_4_ = fVar214 * fVar219;
          auVar52._8_4_ = fVar218 * fVar164;
          auVar52._12_4_ = fVar262 * fVar199;
          auVar52._16_4_ = fVar269 * fVar258;
          auVar52._20_4_ = fVar270 * fVar277;
          auVar52._24_4_ = fVar272 * fVar140;
          auVar52._28_4_ = auVar244._28_4_;
          auVar27 = vsubps_avx(auVar52,auVar51);
          auVar245._0_4_ = auVar133._0_4_ * 0.0 + auVar27._0_4_ + auVar21._0_4_ * 0.0;
          auVar245._4_4_ = auVar133._4_4_ * 0.0 + auVar27._4_4_ + auVar21._4_4_ * 0.0;
          auVar245._8_4_ = auVar133._8_4_ * 0.0 + auVar27._8_4_ + auVar21._8_4_ * 0.0;
          auVar245._12_4_ = auVar133._12_4_ * 0.0 + auVar27._12_4_ + auVar21._12_4_ * 0.0;
          auVar245._16_4_ = auVar133._16_4_ * 0.0 + auVar27._16_4_ + auVar21._16_4_ * 0.0;
          auVar245._20_4_ = auVar133._20_4_ * 0.0 + auVar27._20_4_ + auVar21._20_4_ * 0.0;
          auVar245._24_4_ = auVar133._24_4_ * 0.0 + auVar27._24_4_ + auVar21._24_4_ * 0.0;
          auVar245._28_4_ = auVar244._28_4_ + auVar27._28_4_ + auVar16._28_4_;
          auVar20 = vrcpps_avx(auVar245);
          fVar196 = auVar20._0_4_;
          fVar228 = auVar20._4_4_;
          auVar53._4_4_ = auVar245._4_4_ * fVar228;
          auVar53._0_4_ = auVar245._0_4_ * fVar196;
          fVar233 = auVar20._8_4_;
          auVar53._8_4_ = auVar245._8_4_ * fVar233;
          fVar184 = auVar20._12_4_;
          auVar53._12_4_ = auVar245._12_4_ * fVar184;
          fVar294 = auVar20._16_4_;
          auVar53._16_4_ = auVar245._16_4_ * fVar294;
          fVar164 = auVar20._20_4_;
          auVar53._20_4_ = auVar245._20_4_ * fVar164;
          fVar166 = auVar20._24_4_;
          auVar53._24_4_ = auVar245._24_4_ * fVar166;
          auVar53._28_4_ = auVar25._28_4_;
          auVar291._8_4_ = 0x3f800000;
          auVar291._0_8_ = 0x3f8000003f800000;
          auVar291._12_4_ = 0x3f800000;
          auVar291._16_4_ = 0x3f800000;
          auVar291._20_4_ = 0x3f800000;
          auVar291._24_4_ = 0x3f800000;
          auVar291._28_4_ = 0x3f800000;
          auVar16 = vsubps_avx(auVar291,auVar53);
          fVar196 = auVar16._0_4_ * fVar196 + fVar196;
          fVar228 = auVar16._4_4_ * fVar228 + fVar228;
          fVar233 = auVar16._8_4_ * fVar233 + fVar233;
          fVar184 = auVar16._12_4_ * fVar184 + fVar184;
          fVar294 = auVar16._16_4_ * fVar294 + fVar294;
          fVar164 = auVar16._20_4_ * fVar164 + fVar164;
          fVar166 = auVar16._24_4_ * fVar166 + fVar166;
          auVar54._4_4_ =
               (auVar133._4_4_ * fVar287 + auVar21._4_4_ * fVar145 + auVar27._4_4_ * fVar158) *
               fVar228;
          auVar54._0_4_ =
               (auVar133._0_4_ * fVar226 + auVar21._0_4_ * fVar185 + auVar27._0_4_ * fVar148) *
               fVar196;
          auVar54._8_4_ =
               (auVar133._8_4_ * fVar254 + auVar21._8_4_ * fVar197 + auVar27._8_4_ * fVar160) *
               fVar233;
          auVar54._12_4_ =
               (auVar133._12_4_ * fVar255 + auVar21._12_4_ * fVar256 + auVar27._12_4_ * fVar162) *
               fVar184;
          auVar54._16_4_ =
               (auVar133._16_4_ * fVar261 + auVar21._16_4_ * fVar259 + auVar27._16_4_ * fVar163) *
               fVar294;
          auVar54._20_4_ =
               (auVar133._20_4_ * fVar146 + auVar21._20_4_ * fVar279 + auVar27._20_4_ * fVar165) *
               fVar164;
          auVar54._24_4_ =
               (auVar133._24_4_ * fVar142 + auVar21._24_4_ * fVar141 + auVar27._24_4_ * fVar167) *
               fVar166;
          auVar54._28_4_ = auVar17._28_4_ + auVar22._28_4_;
          auVar176 = vpermilps_avx((undefined1  [16])aVar11,0xff);
          auVar132._16_16_ = auVar176;
          auVar132._0_16_ = auVar176;
          auVar133 = vcmpps_avx(auVar132,auVar54,2);
          fVar219 = (ray->super_RayK<1>).tfar;
          auVar192._4_4_ = fVar219;
          auVar192._0_4_ = fVar219;
          auVar192._8_4_ = fVar219;
          auVar192._12_4_ = fVar219;
          auVar192._16_4_ = fVar219;
          auVar192._20_4_ = fVar219;
          auVar192._24_4_ = fVar219;
          auVar192._28_4_ = fVar219;
          auVar22 = vcmpps_avx(auVar54,auVar192,2);
          auVar133 = vandps_avx(auVar22,auVar133);
          auVar176 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
          auVar223 = vpand_avx(auVar223,auVar176);
          auVar176 = vpmovsxwd_avx(auVar223);
          auVar208 = vpshufd_avx(auVar223,0xee);
          auVar208 = vpmovsxwd_avx(auVar208);
          auVar191._16_16_ = auVar208;
          auVar191._0_16_ = auVar176;
          if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar191 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar191 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar191 >> 0x7f,0) == '\0') &&
                (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar208 >> 0x3f,0) == '\0') &&
              (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar208[0xf]) goto LAB_00e27534;
          auVar133 = vcmpps_avx(ZEXT832(0) << 0x20,auVar245,4);
          auVar176 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
          auVar223 = vpand_avx(auVar223,auVar176);
          auVar176 = vpmovsxwd_avx(auVar223);
          auVar194 = ZEXT1664(auVar176);
          auVar223 = vpunpckhwd_avx(auVar223,auVar223);
          auVar231._16_16_ = auVar223;
          auVar231._0_16_ = auVar176;
          auVar139 = ZEXT3264(CONCAT824(local_4e0[1]._24_8_,
                                        CONCAT816(local_4e0[1]._16_8_,
                                                  CONCAT88(local_4e0[1]._8_8_,local_4e0[1]._0_8_))))
          ;
          auVar251 = ZEXT3264(local_6e0);
          auVar268 = ZEXT3264(local_680);
          if ((((((((auVar231 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar231 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar231 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar231 >> 0x7f,0) != '\0') ||
                (auVar231 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar223 >> 0x3f,0) != '\0') ||
              (auVar231 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar223[0xf] < '\0') {
            auVar55._4_4_ = auVar244._4_4_ * fVar228;
            auVar55._0_4_ = auVar244._0_4_ * fVar196;
            auVar55._8_4_ = auVar244._8_4_ * fVar233;
            auVar55._12_4_ = auVar244._12_4_ * fVar184;
            auVar55._16_4_ = auVar244._16_4_ * fVar294;
            auVar55._20_4_ = auVar244._20_4_ * fVar164;
            auVar55._24_4_ = auVar244._24_4_ * fVar166;
            auVar55._28_4_ = SUB84(local_4e0[1]._24_8_,4);
            auVar56._4_4_ = auVar210._4_4_ * fVar228;
            auVar56._0_4_ = auVar210._0_4_ * fVar196;
            auVar56._8_4_ = auVar210._8_4_ * fVar233;
            auVar56._12_4_ = auVar210._12_4_ * fVar184;
            auVar56._16_4_ = auVar210._16_4_ * fVar294;
            auVar56._20_4_ = auVar210._20_4_ * fVar164;
            auVar56._24_4_ = auVar210._24_4_ * fVar166;
            auVar56._28_4_ = auVar16._28_4_ + auVar20._28_4_;
            auVar211._8_4_ = 0x3f800000;
            auVar211._0_8_ = 0x3f8000003f800000;
            auVar211._12_4_ = 0x3f800000;
            auVar211._16_4_ = 0x3f800000;
            auVar211._20_4_ = 0x3f800000;
            auVar211._24_4_ = 0x3f800000;
            auVar211._28_4_ = 0x3f800000;
            auVar133 = vsubps_avx(auVar211,auVar55);
            auVar194 = ZEXT3264(auVar133);
            auVar133 = vblendvps_avx(auVar133,auVar55,auVar230);
            auVar251 = ZEXT3264(auVar133);
            auVar133 = vsubps_avx(auVar211,auVar56);
            _local_2e0 = vblendvps_avx(auVar133,auVar56,auVar230);
            auVar139 = ZEXT3264(auVar231);
            auVar268 = ZEXT3264(auVar54);
          }
        }
        auVar304 = ZEXT3264(_local_5e0);
        auVar133 = auVar139._0_32_;
        _local_770 = auVar125;
        _local_6c0 = auVar19;
        _local_6b0 = auVar126;
        if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar133 >> 0x7f,0) != '\0') ||
              (auVar139 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar133 >> 0xbf,0) != '\0') ||
            (auVar139 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar139[0x1f] < '\0') {
          auVar22 = vsubps_avx(local_4a0,_local_7a0);
          fVar185 = (float)local_7a0._0_4_ + auVar251._0_4_ * auVar22._0_4_;
          fVar226 = (float)local_7a0._4_4_ + auVar251._4_4_ * auVar22._4_4_;
          fVar196 = fStack_798 + auVar251._8_4_ * auVar22._8_4_;
          fVar228 = fStack_794 + auVar251._12_4_ * auVar22._12_4_;
          fVar233 = fStack_790 + auVar251._16_4_ * auVar22._16_4_;
          fVar145 = fStack_78c + auVar251._20_4_ * auVar22._20_4_;
          fVar287 = fStack_788 + auVar251._24_4_ * auVar22._24_4_;
          fVar184 = auVar22._28_4_ + 0.0;
          fVar219 = pre->depth_scale;
          auVar57._4_4_ = (fVar226 + fVar226) * fVar219;
          auVar57._0_4_ = (fVar185 + fVar185) * fVar219;
          auVar57._8_4_ = (fVar196 + fVar196) * fVar219;
          auVar57._12_4_ = (fVar228 + fVar228) * fVar219;
          auVar57._16_4_ = (fVar233 + fVar233) * fVar219;
          auVar57._20_4_ = (fVar145 + fVar145) * fVar219;
          auVar57._24_4_ = (fVar287 + fVar287) * fVar219;
          auVar57._28_4_ = fVar184 + fVar184;
          local_220 = auVar268._0_32_;
          auVar22 = vcmpps_avx(local_220,auVar57,6);
          auVar20 = auVar133 & auVar22;
          if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar20 >> 0x7f,0) != '\0') ||
                (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar20 >> 0xbf,0) != '\0') ||
              (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar20[0x1f] < '\0') {
            auVar194 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_2e0._0_4_ = (float)local_2e0._0_4_ + (float)local_2e0._0_4_ + -1.0;
            local_2e0._4_4_ = (float)local_2e0._4_4_ + (float)local_2e0._4_4_ + -1.0;
            uStack_2d8._0_4_ = (float)uStack_2d8 + (float)uStack_2d8 + -1.0;
            uStack_2d8._4_4_ = uStack_2d8._4_4_ + uStack_2d8._4_4_ + -1.0;
            uStack_2d0._0_4_ = (float)uStack_2d0 + (float)uStack_2d0 + -1.0;
            uStack_2d0._4_4_ = uStack_2d0._4_4_ + uStack_2d0._4_4_ + -1.0;
            uStack_2c8._0_4_ = (float)uStack_2c8 + (float)uStack_2c8 + -1.0;
            uStack_2c8._4_4_ = uStack_2c8._4_4_ + uStack_2c8._4_4_ + -1.0;
            local_260 = auVar251._0_32_;
            auVar113 = _local_2e0;
            auVar20 = _local_2e0;
            local_240 = (float)local_2e0._0_4_;
            fStack_23c = (float)local_2e0._4_4_;
            fStack_238 = (float)uStack_2d8;
            fStack_234 = uStack_2d8._4_4_;
            fStack_230 = (float)uStack_2d0;
            fStack_22c = uStack_2d0._4_4_;
            fStack_228 = (float)uStack_2c8;
            fStack_224 = uStack_2c8._4_4_;
            local_200 = 0;
            local_1fc = uVar14;
            local_1e0 = local_770;
            uStack_1d8 = uStack_768;
            local_1d0 = local_6b0;
            uStack_1c8 = uStack_6a8;
            local_1c0 = local_6c0;
            uStack_1b8 = uStack_6b8;
            _local_2e0 = auVar20;
            if ((pGVar119->mask & (ray->super_RayK<1>).mask) != 0) {
              auVar133 = vandps_avx(auVar22,auVar133);
              local_4e0[0] = auVar133;
              auVar174._0_4_ = 1.0 / (float)(int)uVar14;
              auVar174._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar223 = vshufps_avx(auVar174,auVar174,0);
              local_180[0] = auVar223._0_4_ * (auVar251._0_4_ + 0.0);
              local_180[1] = auVar223._4_4_ * (auVar251._4_4_ + 1.0);
              local_180[2] = auVar223._8_4_ * (auVar251._8_4_ + 2.0);
              local_180[3] = auVar223._12_4_ * (auVar251._12_4_ + 3.0);
              fStack_170 = auVar223._0_4_ * (auVar251._16_4_ + 4.0);
              fStack_16c = auVar223._4_4_ * (auVar251._20_4_ + 5.0);
              fStack_168 = auVar223._8_4_ * (auVar251._24_4_ + 6.0);
              fStack_164 = auVar251._28_4_ + 7.0;
              uStack_2d0 = auVar113._16_8_;
              uStack_2c8 = auVar20._24_8_;
              local_160 = local_2e0;
              uStack_158 = uStack_2d8;
              uStack_150 = uStack_2d0;
              uStack_148 = uStack_2c8;
              local_140 = local_220;
              auVar152._8_4_ = 0x7f800000;
              auVar152._0_8_ = 0x7f8000007f800000;
              auVar152._12_4_ = 0x7f800000;
              auVar152._16_4_ = 0x7f800000;
              auVar152._20_4_ = 0x7f800000;
              auVar152._24_4_ = 0x7f800000;
              auVar152._28_4_ = 0x7f800000;
              auVar22 = vblendvps_avx(auVar152,local_220,auVar133);
              auVar20 = vshufps_avx(auVar22,auVar22,0xb1);
              auVar20 = vminps_avx(auVar22,auVar20);
              auVar21 = vshufpd_avx(auVar20,auVar20,5);
              auVar20 = vminps_avx(auVar20,auVar21);
              auVar21 = vperm2f128_avx(auVar20,auVar20,1);
              auVar20 = vminps_avx(auVar20,auVar21);
              auVar22 = vcmpps_avx(auVar22,auVar20,0);
              auVar20 = auVar133 & auVar22;
              if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar20 >> 0x7f,0) != '\0') ||
                    (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0xbf,0) != '\0') ||
                  (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar20[0x1f] < '\0') {
                auVar133 = vandps_avx(auVar22,auVar133);
              }
              uVar114 = vmovmskps_avx(auVar133);
              uVar115 = 0;
              if (uVar114 != 0) {
                for (; (uVar114 >> uVar115 & 1) == 0; uVar115 = uVar115 + 1) {
                }
              }
              uVar118 = (ulong)uVar115;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar119->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                local_680 = local_220;
                _local_720 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                local_6e0 = auVar251._0_32_;
                local_460._0_8_ = pGVar119;
                do {
                  local_614 = local_180[uVar118];
                  local_610 = *(undefined4 *)((long)&local_160 + uVar118 * 4);
                  local_7a0 = (undefined1  [8])uVar118;
                  (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar118 * 4);
                  local_750.context = context->user;
                  fVar185 = 1.0 - local_614;
                  fVar219 = local_614 * fVar185 * 4.0;
                  auVar223 = ZEXT416((uint)(local_614 * local_614 * 0.5));
                  auVar223 = vshufps_avx(auVar223,auVar223,0);
                  auVar176 = ZEXT416((uint)((fVar185 * fVar185 + fVar219) * 0.5));
                  auVar176 = vshufps_avx(auVar176,auVar176,0);
                  auVar208 = ZEXT416((uint)((-local_614 * local_614 - fVar219) * 0.5));
                  auVar208 = vshufps_avx(auVar208,auVar208,0);
                  auVar189 = ZEXT416((uint)(fVar185 * -fVar185 * 0.5));
                  auVar189 = vshufps_avx(auVar189,auVar189,0);
                  auVar179._0_4_ =
                       auVar189._0_4_ * local_7b0 +
                       auVar208._0_4_ * (float)local_770._0_4_ +
                       auVar223._0_4_ * (float)local_6c0._0_4_ +
                       auVar176._0_4_ * (float)local_6b0._0_4_;
                  auVar179._4_4_ =
                       auVar189._4_4_ * fStack_7ac +
                       auVar208._4_4_ * (float)local_770._4_4_ +
                       auVar223._4_4_ * (float)local_6c0._4_4_ +
                       auVar176._4_4_ * (float)local_6b0._4_4_;
                  auVar179._8_4_ =
                       auVar189._8_4_ * fStack_7a8 +
                       auVar208._8_4_ * (float)uStack_768 +
                       auVar223._8_4_ * (float)uStack_6b8 + auVar176._8_4_ * (float)uStack_6a8;
                  auVar179._12_4_ =
                       auVar189._12_4_ * fStack_7a4 +
                       auVar208._12_4_ * uStack_768._4_4_ +
                       auVar223._12_4_ * uStack_6b8._4_4_ + auVar176._12_4_ * uStack_6a8._4_4_;
                  local_620 = vmovlps_avx(auVar179);
                  local_618 = vextractps_avx(auVar179,2);
                  local_60c = uVar117;
                  local_608 = (int)local_7b8;
                  local_604 = (local_750.context)->instID[0];
                  local_600 = (local_750.context)->instPrimID[0];
                  local_7bc = -1;
                  local_750.valid = &local_7bc;
                  local_750.geometryUserPtr = pGVar119->userPtr;
                  local_750.ray = (RTCRayN *)ray;
                  local_750.hit = (RTCHitN *)&local_620;
                  local_750.N = 1;
                  if (pGVar119->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e2779c:
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_460._0_8_ + 0x3e) & 0x40) != 0)))) {
                      (*p_Var15)(&local_750);
                      auVar304 = ZEXT3264(_local_5e0);
                      auVar251 = ZEXT3264(local_6e0);
                      pre = local_760;
                      pPVar120 = local_758;
                      fVar282 = (float)local_640._0_4_;
                      fVar284 = (float)local_640._4_4_;
                      fVar285 = fStack_638;
                      fVar286 = fStack_634;
                      fVar225 = fStack_630;
                      fVar195 = fStack_62c;
                      fVar227 = fStack_628;
                      fVar169 = (float)local_660._0_4_;
                      fVar181 = (float)local_660._4_4_;
                      fVar182 = fStack_658;
                      fVar183 = fStack_654;
                      fVar198 = fStack_650;
                      fVar234 = fStack_64c;
                      fVar235 = fStack_648;
                      fVar168 = fStack_644;
                      if (*local_750.valid == 0) goto LAB_00e27896;
                    }
                    (((Vec3f *)((long)local_750.ray + 0x30))->field_0).components[0] =
                         *(float *)local_750.hit;
                    (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_750.hit + 4);
                    (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_750.hit + 8);
                    *(float *)((long)local_750.ray + 0x3c) = *(float *)(local_750.hit + 0xc);
                    *(float *)((long)local_750.ray + 0x40) = *(float *)(local_750.hit + 0x10);
                    *(float *)((long)local_750.ray + 0x44) = *(float *)(local_750.hit + 0x14);
                    *(float *)((long)local_750.ray + 0x48) = *(float *)(local_750.hit + 0x18);
                    *(float *)((long)local_750.ray + 0x4c) = *(float *)(local_750.hit + 0x1c);
                    *(float *)((long)local_750.ray + 0x50) = *(float *)(local_750.hit + 0x20);
                  }
                  else {
                    (*pGVar119->intersectionFilterN)(&local_750);
                    auVar304 = ZEXT3264(_local_5e0);
                    auVar251 = ZEXT3264(local_6e0);
                    pre = local_760;
                    pPVar120 = local_758;
                    fVar282 = (float)local_640._0_4_;
                    fVar284 = (float)local_640._4_4_;
                    fVar285 = fStack_638;
                    fVar286 = fStack_634;
                    fVar225 = fStack_630;
                    fVar195 = fStack_62c;
                    fVar227 = fStack_628;
                    fVar169 = (float)local_660._0_4_;
                    fVar181 = (float)local_660._4_4_;
                    fVar182 = fStack_658;
                    fVar183 = fStack_654;
                    fVar198 = fStack_650;
                    fVar234 = fStack_64c;
                    fVar235 = fStack_648;
                    fVar168 = fStack_644;
                    if (*local_750.valid != 0) goto LAB_00e2779c;
LAB_00e27896:
                    (ray->super_RayK<1>).tfar = (float)local_720._0_4_;
                    pre = local_760;
                    pPVar120 = local_758;
                  }
                  *(undefined4 *)(local_4e0[0] + (long)local_7a0 * 4) = 0;
                  auVar20 = local_4e0[0];
                  _local_720 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                  auVar194 = ZEXT3264(_local_720);
                  fVar219 = (ray->super_RayK<1>).tfar;
                  auVar138._4_4_ = fVar219;
                  auVar138._0_4_ = fVar219;
                  auVar138._8_4_ = fVar219;
                  auVar138._12_4_ = fVar219;
                  auVar138._16_4_ = fVar219;
                  auVar138._20_4_ = fVar219;
                  auVar138._24_4_ = fVar219;
                  auVar138._28_4_ = fVar219;
                  auVar268 = ZEXT3264(local_680);
                  auVar22 = vcmpps_avx(local_680,auVar138,2);
                  auVar133 = vandps_avx(auVar22,local_4e0[0]);
                  local_4e0[0] = auVar133;
                  auVar20 = auVar20 & auVar22;
                  if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar20 >> 0x7f,0) == '\0') &&
                        (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar20 >> 0xbf,0) == '\0') &&
                      (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar20[0x1f]) goto LAB_00e26546;
                  auVar156._8_4_ = 0x7f800000;
                  auVar156._0_8_ = 0x7f8000007f800000;
                  auVar156._12_4_ = 0x7f800000;
                  auVar156._16_4_ = 0x7f800000;
                  auVar156._20_4_ = 0x7f800000;
                  auVar156._24_4_ = 0x7f800000;
                  auVar156._28_4_ = 0x7f800000;
                  auVar22 = vblendvps_avx(auVar156,local_680,auVar133);
                  auVar20 = vshufps_avx(auVar22,auVar22,0xb1);
                  auVar20 = vminps_avx(auVar22,auVar20);
                  auVar21 = vshufpd_avx(auVar20,auVar20,5);
                  auVar20 = vminps_avx(auVar20,auVar21);
                  auVar21 = vperm2f128_avx(auVar20,auVar20,1);
                  auVar20 = vminps_avx(auVar20,auVar21);
                  auVar22 = vcmpps_avx(auVar22,auVar20,0);
                  auVar20 = auVar133 & auVar22;
                  if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar20 >> 0x7f,0) != '\0') ||
                        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar20 >> 0xbf,0) != '\0') ||
                      (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar20[0x1f] < '\0') {
                    auVar133 = vandps_avx(auVar22,auVar133);
                  }
                  uVar115 = vmovmskps_avx(auVar133);
                  uVar13 = 0;
                  if (uVar115 != 0) {
                    for (; (uVar115 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                    }
                  }
                  uVar118 = (ulong)uVar13;
                  pGVar119 = (Geometry *)local_460._0_8_;
                } while( true );
              }
              fVar219 = local_180[uVar118];
              fVar185 = *(float *)((long)&local_160 + uVar118 * 4);
              fVar196 = 1.0 - fVar219;
              fVar226 = fVar219 * fVar196 * 4.0;
              auVar223 = ZEXT416((uint)(fVar219 * fVar219 * 0.5));
              auVar223 = vshufps_avx(auVar223,auVar223,0);
              auVar176 = ZEXT416((uint)((fVar196 * fVar196 + fVar226) * 0.5));
              auVar176 = vshufps_avx(auVar176,auVar176,0);
              auVar208 = ZEXT416((uint)((-fVar219 * fVar219 - fVar226) * 0.5));
              auVar208 = vshufps_avx(auVar208,auVar208,0);
              auVar189 = ZEXT416((uint)(fVar196 * -fVar196 * 0.5));
              auVar189 = vshufps_avx(auVar189,auVar189,0);
              auVar175._0_4_ =
                   auVar189._0_4_ * local_7b0 +
                   auVar208._0_4_ * (float)local_770._0_4_ +
                   auVar223._0_4_ * (float)local_6c0._0_4_ + auVar176._0_4_ * (float)local_6b0._0_4_
              ;
              auVar175._4_4_ =
                   auVar189._4_4_ * fStack_7ac +
                   auVar208._4_4_ * (float)local_770._4_4_ +
                   auVar223._4_4_ * (float)local_6c0._4_4_ + auVar176._4_4_ * (float)local_6b0._4_4_
              ;
              auVar175._8_4_ =
                   auVar189._8_4_ * fStack_7a8 +
                   auVar208._8_4_ * (float)uStack_768 +
                   auVar223._8_4_ * (float)uStack_6b8 + auVar176._8_4_ * (float)uStack_6a8;
              auVar175._12_4_ =
                   auVar189._12_4_ * fStack_7a4 +
                   auVar208._12_4_ * uStack_768._4_4_ +
                   auVar223._12_4_ * uStack_6b8._4_4_ + auVar176._12_4_ * uStack_6a8._4_4_;
              auVar194 = ZEXT464((uint)*(float *)(local_140 + uVar118 * 4));
              (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar118 * 4);
              uVar10 = vmovlps_avx(auVar175);
              *(undefined8 *)&(ray->Ng).field_0 = uVar10;
              fVar226 = (float)vextractps_avx(auVar175,2);
              (ray->Ng).field_0.field_0.z = fVar226;
              ray->u = fVar219;
              ray->v = fVar185;
              ray->primID = uVar117;
              ray->geomID = uVar13;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
            }
          }
        }
LAB_00e26546:
        auVar223 = local_700._0_16_;
      }
      if (8 < (int)uVar14) {
        auVar176 = vpshufd_avx(ZEXT416(uVar14),0);
        local_400 = auVar176._0_4_;
        fStack_3fc = auVar176._4_4_;
        fStack_3f8 = auVar176._8_4_;
        fStack_3f4 = auVar176._12_4_;
        auVar223 = vshufps_avx(auVar223,auVar223,0);
        register0x00001210 = auVar223;
        _local_440 = auVar223;
        auVar223 = vpermilps_avx(local_380._0_16_,0xff);
        local_460._16_16_ = auVar223;
        local_460._0_16_ = auVar223;
        auVar128._0_4_ = 1.0 / (float)local_3a0._0_4_;
        auVar128._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar223 = vshufps_avx(auVar128,auVar128,0);
        _fStack_390 = auVar223;
        _local_3a0 = auVar223;
        auVar139 = ZEXT3264(_local_3a0);
        lVar122 = 8;
        local_6e0 = auVar251._0_32_;
        local_680 = auVar268._0_32_;
        _local_5e0 = auVar304._0_32_;
        fVar219 = (float)local_580._0_4_;
        fVar185 = (float)local_580._4_4_;
        fVar226 = fStack_578;
        fVar196 = fStack_574;
        fVar228 = fStack_570;
        fVar233 = fStack_56c;
        fVar145 = fStack_568;
LAB_00e26625:
        pauVar1 = (undefined1 (*) [28])(bspline_basis0 + lVar122 * 4 + lVar116);
        fVar287 = *(float *)*pauVar1;
        fVar184 = *(float *)(*pauVar1 + 4);
        fVar294 = *(float *)(*pauVar1 + 8);
        fVar164 = *(float *)(*pauVar1 + 0xc);
        fVar197 = *(float *)(*pauVar1 + 0x10);
        fVar254 = *(float *)(*pauVar1 + 0x14);
        fVar166 = *(float *)(*pauVar1 + 0x18);
        auVar110 = *pauVar1;
        pauVar3 = (undefined1 (*) [28])(lVar116 + 0x21aefac + lVar122 * 4);
        fVar253 = *(float *)*pauVar3;
        fVar199 = *(float *)(*pauVar3 + 4);
        fVar256 = *(float *)(*pauVar3 + 8);
        fVar255 = *(float *)(*pauVar3 + 0xc);
        fVar257 = *(float *)(*pauVar3 + 0x10);
        fVar200 = *(float *)(*pauVar3 + 0x14);
        fVar258 = *(float *)(*pauVar3 + 0x18);
        auVar109 = *pauVar3;
        pauVar3 = (undefined1 (*) [28])(lVar116 + 0x21af430 + lVar122 * 4);
        fVar259 = *(float *)*pauVar3;
        fVar261 = *(float *)(*pauVar3 + 4);
        fVar201 = *(float *)(*pauVar3 + 8);
        fVar260 = *(float *)(*pauVar3 + 0xc);
        fVar277 = *(float *)(*pauVar3 + 0x10);
        fVar279 = *(float *)(*pauVar3 + 0x14);
        fVar146 = *(float *)(*pauVar3 + 0x18);
        auVar108 = *pauVar3;
        pfVar4 = (float *)(lVar116 + 0x21af8b4 + lVar122 * 4);
        fVar281 = *pfVar4;
        fVar123 = pfVar4[1];
        fVar140 = pfVar4[2];
        fVar141 = pfVar4[3];
        fVar142 = pfVar4[4];
        fVar143 = pfVar4[5];
        fVar144 = pfVar4[6];
        fVar148 = auVar194._28_4_;
        fStack_784 = fVar148 + fVar148 + auVar139._28_4_;
        fVar202 = fVar148 + fVar148 + pfVar4[7];
        fVar252 = local_340._0_4_;
        fVar237 = local_340._4_4_;
        fVar246 = local_340._8_4_;
        fVar147 = local_340._12_4_;
        fVar157 = local_340._16_4_;
        fVar159 = local_340._20_4_;
        fVar161 = local_340._24_4_;
        local_720._0_4_ =
             fVar252 * fVar287 +
             fVar253 * fVar282 + fVar259 * (float)local_5a0._0_4_ + (float)local_360._0_4_ * fVar281
        ;
        local_720._4_4_ =
             fVar237 * fVar184 +
             fVar199 * fVar284 + fVar261 * (float)local_5a0._4_4_ + (float)local_360._4_4_ * fVar123
        ;
        local_720._8_4_ =
             fVar246 * fVar294 + fVar256 * fVar285 + fVar201 * fStack_598 + fStack_358 * fVar140;
        local_720._12_4_ =
             fVar147 * fVar164 + fVar255 * fVar286 + fVar260 * fStack_594 + fStack_354 * fVar141;
        register0x00001410 =
             fVar157 * fVar197 + fVar257 * fVar225 + fVar277 * fStack_590 + fStack_350 * fVar142;
        register0x00001414 =
             fVar159 * fVar254 + fVar200 * fVar195 + fVar279 * fStack_58c + fStack_34c * fVar143;
        register0x00001418 =
             fVar161 * fVar166 + fVar258 * fVar227 + fVar146 * fStack_588 + fStack_348 * fVar144;
        register0x0000141c = fVar148 + pfVar4[7] + fStack_784;
        local_700._0_4_ =
             fVar219 * fVar281 + fVar169 * fVar259 + auVar304._0_4_ * fVar253 +
             (float)local_2c0._0_4_ * fVar287;
        local_700._4_4_ =
             fVar185 * fVar123 + fVar181 * fVar261 + auVar304._4_4_ * fVar199 +
             (float)local_2c0._4_4_ * fVar184;
        local_700._8_4_ =
             fVar226 * fVar140 + fVar182 * fVar201 + auVar304._8_4_ * fVar256 + fStack_2b8 * fVar294
        ;
        local_700._12_4_ =
             fVar196 * fVar141 + fVar183 * fVar260 + auVar304._12_4_ * fVar255 +
             fStack_2b4 * fVar164;
        local_700._16_4_ =
             fVar228 * fVar142 + fVar198 * fVar277 + auVar304._16_4_ * fVar257 +
             fStack_2b0 * fVar197;
        local_700._20_4_ =
             fVar233 * fVar143 + fVar234 * fVar279 + auVar304._20_4_ * fVar200 +
             fStack_2ac * fVar254;
        local_700._24_4_ =
             fVar145 * fVar144 + fVar235 * fVar146 + auVar304._24_4_ * fVar258 +
             fStack_2a8 * fVar166;
        local_700._28_4_ = auVar251._28_4_ + fVar148 + fVar148 + fStack_784;
        local_7a0._0_4_ =
             fVar287 * (float)local_120._0_4_ +
             fVar253 * (float)local_100._0_4_ +
             fVar259 * (float)local_c0._0_4_ + fVar281 * (float)local_e0._0_4_;
        local_7a0._4_4_ =
             fVar184 * (float)local_120._4_4_ +
             fVar199 * (float)local_100._4_4_ +
             fVar261 * (float)local_c0._4_4_ + fVar123 * (float)local_e0._4_4_;
        fStack_798 = fVar294 * fStack_118 +
                     fVar256 * fStack_f8 + fVar201 * fStack_b8 + fVar140 * fStack_d8;
        fStack_794 = fVar164 * fStack_114 +
                     fVar255 * fStack_f4 + fVar260 * fStack_b4 + fVar141 * fStack_d4;
        fStack_790 = fVar197 * fStack_110 +
                     fVar257 * fStack_f0 + fVar277 * fStack_b0 + fVar142 * fStack_d0;
        fStack_78c = fVar254 * fStack_10c +
                     fVar200 * fStack_ec + fVar279 * fStack_ac + fVar143 * fStack_cc;
        fStack_788 = fVar166 * fStack_108 +
                     fVar258 * fStack_e8 + fVar146 * fStack_a8 + fVar144 * fStack_c8;
        fStack_784 = fStack_784 + fVar202;
        pfVar4 = (float *)(bspline_basis1 + lVar122 * 4 + lVar116);
        fVar197 = *pfVar4;
        fVar254 = pfVar4[1];
        fVar166 = pfVar4[2];
        fVar253 = pfVar4[3];
        fVar199 = pfVar4[4];
        fVar256 = pfVar4[5];
        fVar255 = pfVar4[6];
        pfVar5 = (float *)(lVar116 + 0x21b13cc + lVar122 * 4);
        fVar257 = *pfVar5;
        fVar200 = pfVar5[1];
        fVar258 = pfVar5[2];
        fVar259 = pfVar5[3];
        fVar261 = pfVar5[4];
        fVar201 = pfVar5[5];
        fVar260 = pfVar5[6];
        pauVar3 = (undefined1 (*) [28])(lVar116 + 0x21b1850 + lVar122 * 4);
        fVar287 = *(float *)*pauVar3;
        fVar184 = *(float *)(*pauVar3 + 4);
        fVar294 = *(float *)(*pauVar3 + 8);
        fVar164 = *(float *)(*pauVar3 + 0xc);
        fVar277 = *(float *)(*pauVar3 + 0x10);
        fVar279 = *(float *)(*pauVar3 + 0x14);
        fVar146 = *(float *)(*pauVar3 + 0x18);
        auVar112 = *pauVar3;
        pauVar6 = (undefined1 (*) [28])(lVar116 + 0x21b1cd4 + lVar122 * 4);
        fVar148 = *(float *)*pauVar6;
        fVar158 = *(float *)(*pauVar6 + 4);
        fVar160 = *(float *)(*pauVar6 + 8);
        fVar162 = *(float *)(*pauVar6 + 0xc);
        fVar163 = *(float *)(*pauVar6 + 0x10);
        fVar165 = *(float *)(*pauVar6 + 0x14);
        fVar167 = *(float *)(*pauVar6 + 0x18);
        auVar111 = *pauVar6;
        fVar236 = *(float *)pauVar6[1];
        fVar202 = fVar236 + fVar236 + fVar202;
        auVar139 = ZEXT3264(local_340);
        local_4a0._0_4_ =
             fVar197 * fVar252 +
             fVar257 * fVar282 + fVar287 * (float)local_5a0._0_4_ + (float)local_360._0_4_ * fVar148
        ;
        local_4a0._4_4_ =
             fVar254 * fVar237 +
             fVar200 * fVar284 + fVar184 * (float)local_5a0._4_4_ + (float)local_360._4_4_ * fVar158
        ;
        local_4a0._8_4_ =
             fVar166 * fVar246 + fVar258 * fVar285 + fVar294 * fStack_598 + fStack_358 * fVar160;
        local_4a0._12_4_ =
             fVar253 * fVar147 + fVar259 * fVar286 + fVar164 * fStack_594 + fStack_354 * fVar162;
        local_4a0._16_4_ =
             fVar199 * fVar157 + fVar261 * fVar225 + fVar277 * fStack_590 + fStack_350 * fVar163;
        local_4a0._20_4_ =
             fVar256 * fVar159 + fVar201 * fVar195 + fVar279 * fStack_58c + fStack_34c * fVar165;
        local_4a0._24_4_ =
             fVar255 * fVar161 + fVar260 * fVar227 + fVar146 * fStack_588 + fStack_348 * fVar167;
        local_4a0._28_4_ = fVar236 + fStack_344 + fVar202;
        local_380._0_4_ =
             (float)local_2c0._0_4_ * fVar197 +
             auVar304._0_4_ * fVar257 + fVar169 * fVar287 + fVar219 * fVar148;
        local_380._4_4_ =
             (float)local_2c0._4_4_ * fVar254 +
             auVar304._4_4_ * fVar200 + fVar181 * fVar184 + fVar185 * fVar158;
        local_380._8_4_ =
             fStack_2b8 * fVar166 + auVar304._8_4_ * fVar258 + fVar182 * fVar294 + fVar226 * fVar160
        ;
        local_380._12_4_ =
             fStack_2b4 * fVar253 +
             auVar304._12_4_ * fVar259 + fVar183 * fVar164 + fVar196 * fVar162;
        local_380._16_4_ =
             fStack_2b0 * fVar199 +
             auVar304._16_4_ * fVar261 + fVar198 * fVar277 + fVar228 * fVar163;
        local_380._20_4_ =
             fStack_2ac * fVar256 +
             auVar304._20_4_ * fVar201 + fVar234 * fVar279 + fVar233 * fVar165;
        local_380._24_4_ =
             fStack_2a8 * fVar255 +
             auVar304._24_4_ * fVar260 + fVar235 * fVar146 + fVar145 * fVar167;
        local_380._28_4_ = fVar202 + fVar236 + fVar236 + *(float *)pauVar1[1];
        auVar283._0_4_ =
             fVar257 * (float)local_100._0_4_ +
             fVar287 * (float)local_c0._0_4_ + fVar148 * (float)local_e0._0_4_ +
             fVar197 * (float)local_120._0_4_;
        auVar283._4_4_ =
             fVar200 * (float)local_100._4_4_ +
             fVar184 * (float)local_c0._4_4_ + fVar158 * (float)local_e0._4_4_ +
             fVar254 * (float)local_120._4_4_;
        auVar283._8_4_ =
             fVar258 * fStack_f8 + fVar294 * fStack_b8 + fVar160 * fStack_d8 + fVar166 * fStack_118;
        auVar283._12_4_ =
             fVar259 * fStack_f4 + fVar164 * fStack_b4 + fVar162 * fStack_d4 + fVar253 * fStack_114;
        auVar283._16_4_ =
             fVar261 * fStack_f0 + fVar277 * fStack_b0 + fVar163 * fStack_d0 + fVar199 * fStack_110;
        auVar283._20_4_ =
             fVar201 * fStack_ec + fVar279 * fStack_ac + fVar165 * fStack_cc + fVar256 * fStack_10c;
        auVar283._24_4_ =
             fVar260 * fStack_e8 + fVar146 * fStack_a8 + fVar167 * fStack_c8 + fVar255 * fStack_108;
        auVar283._28_4_ = fVar236 + fVar236 + fStack_344 + fVar202;
        auVar22 = vsubps_avx(local_4a0,_local_720);
        auVar20 = vsubps_avx(local_380,local_700);
        fVar219 = auVar22._0_4_;
        fVar225 = auVar22._4_4_;
        auVar58._4_4_ = local_700._4_4_ * fVar225;
        auVar58._0_4_ = (float)local_700._0_4_ * fVar219;
        fVar226 = auVar22._8_4_;
        auVar58._8_4_ = local_700._8_4_ * fVar226;
        fVar227 = auVar22._12_4_;
        auVar58._12_4_ = local_700._12_4_ * fVar227;
        fVar233 = auVar22._16_4_;
        auVar58._16_4_ = local_700._16_4_ * fVar233;
        fVar287 = auVar22._20_4_;
        auVar58._20_4_ = local_700._20_4_ * fVar287;
        fVar294 = auVar22._24_4_;
        auVar58._24_4_ = local_700._24_4_ * fVar294;
        auVar58._28_4_ = fVar202;
        fVar185 = auVar20._0_4_;
        fVar195 = auVar20._4_4_;
        auVar59._4_4_ = local_720._4_4_ * fVar195;
        auVar59._0_4_ = (float)local_720._0_4_ * fVar185;
        fVar196 = auVar20._8_4_;
        auVar59._8_4_ = local_720._8_4_ * fVar196;
        fVar228 = auVar20._12_4_;
        auVar59._12_4_ = local_720._12_4_ * fVar228;
        fVar145 = auVar20._16_4_;
        auVar59._16_4_ = register0x00001410 * fVar145;
        fVar184 = auVar20._20_4_;
        auVar59._20_4_ = register0x00001414 * fVar184;
        fVar164 = auVar20._24_4_;
        auVar59._24_4_ = register0x00001418 * fVar164;
        auVar59._28_4_ = local_380._28_4_;
        auVar21 = vsubps_avx(auVar58,auVar59);
        auVar133 = vmaxps_avx(_local_7a0,auVar283);
        auVar60._4_4_ = auVar133._4_4_ * auVar133._4_4_ * (fVar225 * fVar225 + fVar195 * fVar195);
        auVar60._0_4_ = auVar133._0_4_ * auVar133._0_4_ * (fVar219 * fVar219 + fVar185 * fVar185);
        auVar60._8_4_ = auVar133._8_4_ * auVar133._8_4_ * (fVar226 * fVar226 + fVar196 * fVar196);
        auVar60._12_4_ = auVar133._12_4_ * auVar133._12_4_ * (fVar227 * fVar227 + fVar228 * fVar228)
        ;
        auVar60._16_4_ = auVar133._16_4_ * auVar133._16_4_ * (fVar233 * fVar233 + fVar145 * fVar145)
        ;
        auVar60._20_4_ = auVar133._20_4_ * auVar133._20_4_ * (fVar287 * fVar287 + fVar184 * fVar184)
        ;
        auVar60._24_4_ = auVar133._24_4_ * auVar133._24_4_ * (fVar294 * fVar294 + fVar164 * fVar164)
        ;
        auVar60._28_4_ = local_4a0._28_4_ + local_380._28_4_;
        auVar61._4_4_ = auVar21._4_4_ * auVar21._4_4_;
        auVar61._0_4_ = auVar21._0_4_ * auVar21._0_4_;
        auVar61._8_4_ = auVar21._8_4_ * auVar21._8_4_;
        auVar61._12_4_ = auVar21._12_4_ * auVar21._12_4_;
        auVar61._16_4_ = auVar21._16_4_ * auVar21._16_4_;
        auVar61._20_4_ = auVar21._20_4_ * auVar21._20_4_;
        auVar61._24_4_ = auVar21._24_4_ * auVar21._24_4_;
        auVar61._28_4_ = auVar21._28_4_;
        local_3c0 = vcmpps_avx(auVar61,auVar60,2);
        local_200 = (uint)lVar122;
        auVar176 = vpshufd_avx(ZEXT416(local_200),0);
        auVar223 = vpor_avx(auVar176,_DAT_01f7fcf0);
        auVar176 = vpor_avx(auVar176,_DAT_01fafea0);
        auVar106._4_4_ = fStack_3fc;
        auVar106._0_4_ = local_400;
        auVar106._8_4_ = fStack_3f8;
        auVar106._12_4_ = fStack_3f4;
        auVar223 = vpcmpgtd_avx(auVar106,auVar223);
        auVar176 = vpcmpgtd_avx(auVar106,auVar176);
        register0x000012d0 = auVar176;
        _local_420 = auVar223;
        auVar194 = ZEXT3264(_local_420);
        auVar133 = _local_420 & local_3c0;
        fVar282 = (float)local_640._0_4_;
        fVar284 = (float)local_640._4_4_;
        fVar285 = fStack_638;
        fVar286 = fStack_634;
        fVar225 = fStack_630;
        fVar195 = fStack_62c;
        fVar227 = fStack_628;
        if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar133 >> 0x7f,0) != '\0') ||
              (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar133 >> 0xbf,0) != '\0') ||
            (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar133[0x1f] < '\0') {
          local_6a0._0_4_ = auVar112._0_4_;
          local_6a0._4_4_ = auVar112._4_4_;
          fStack_698 = auVar112._8_4_;
          fStack_694 = auVar112._12_4_;
          fStack_690 = auVar112._16_4_;
          fStack_68c = auVar112._20_4_;
          fStack_688 = auVar112._24_4_;
          fVar219 = (float)local_80._0_4_ * (float)local_6a0._0_4_;
          fVar185 = (float)local_80._4_4_ * (float)local_6a0._4_4_;
          fVar226 = fStack_78 * fStack_698;
          fVar196 = fStack_74 * fStack_694;
          fVar228 = fStack_70 * fStack_690;
          fVar233 = fStack_6c * fStack_68c;
          fVar145 = fStack_68 * fStack_688;
          _local_6a0 = auVar283;
          local_560._0_4_ = auVar111._0_4_;
          local_560._4_4_ = auVar111._4_4_;
          fStack_558 = auVar111._8_4_;
          fStack_554 = auVar111._12_4_;
          fStack_550 = auVar111._16_4_;
          fStack_54c = auVar111._20_4_;
          fStack_548 = auVar111._24_4_;
          local_560._0_4_ =
               fVar197 * (float)local_480._0_4_ +
               fVar257 * (float)local_2a0._0_4_ +
               fVar219 + (float)local_5c0._0_4_ * (float)local_560._0_4_;
          local_560._4_4_ =
               fVar254 * (float)local_480._4_4_ +
               fVar200 * (float)local_2a0._4_4_ +
               fVar185 + (float)local_5c0._4_4_ * (float)local_560._4_4_;
          fStack_558 = fVar166 * fStack_478 +
                       fVar258 * fStack_298 + fVar226 + fStack_5b8 * fStack_558;
          fStack_554 = fVar253 * fStack_474 +
                       fVar259 * fStack_294 + fVar196 + fStack_5b4 * fStack_554;
          fStack_550 = fVar199 * fStack_470 +
                       fVar261 * fStack_290 + fVar228 + fStack_5b0 * fStack_550;
          fStack_54c = fVar256 * fStack_46c +
                       fVar201 * fStack_28c + fVar233 + fStack_5ac * fStack_54c;
          fStack_548 = fVar255 * fStack_468 +
                       fVar260 * fStack_288 + fVar145 + fStack_5a8 * fStack_548;
          fStack_544 = pfVar4[7] + local_340._28_4_ + local_3c0._28_4_ + 0.0;
          local_520._0_4_ = auVar109._0_4_;
          local_520._4_4_ = auVar109._4_4_;
          fStack_518 = auVar109._8_4_;
          fStack_514 = auVar109._12_4_;
          fStack_510 = auVar109._16_4_;
          fStack_50c = auVar109._20_4_;
          fStack_508 = auVar109._24_4_;
          local_3e0._0_4_ = auVar108._0_4_;
          local_3e0._4_4_ = auVar108._4_4_;
          fStack_3d8 = auVar108._8_4_;
          fStack_3d4 = auVar108._12_4_;
          fStack_3d0 = auVar108._16_4_;
          fStack_3cc = auVar108._20_4_;
          fStack_3c8 = auVar108._24_4_;
          fVar148 = (float)local_80._0_4_ * (float)local_3e0._0_4_;
          fVar158 = (float)local_80._4_4_ * (float)local_3e0._4_4_;
          fVar160 = fStack_78 * fStack_3d8;
          fVar162 = fStack_74 * fStack_3d4;
          fVar163 = fStack_70 * fStack_3d0;
          fVar165 = fStack_6c * fStack_3cc;
          fVar167 = fStack_68 * fStack_3c8;
          pfVar4 = (float *)(lVar116 + 0x21b0640 + lVar122 * 4);
          fVar219 = *pfVar4;
          fVar185 = pfVar4[1];
          fVar226 = pfVar4[2];
          fVar196 = pfVar4[3];
          fVar228 = pfVar4[4];
          fVar233 = pfVar4[5];
          fVar145 = pfVar4[6];
          pfVar5 = (float *)(lVar116 + 0x21b0ac4 + lVar122 * 4);
          fVar287 = *pfVar5;
          fVar184 = pfVar5[1];
          fVar294 = pfVar5[2];
          fVar164 = pfVar5[3];
          fVar197 = pfVar5[4];
          fVar254 = pfVar5[5];
          fVar166 = pfVar5[6];
          fVar236 = *(float *)pauVar3[1] + 0.0;
          pfVar7 = (float *)(lVar116 + 0x21b01bc + lVar122 * 4);
          fVar253 = *pfVar7;
          fVar199 = pfVar7[1];
          fVar256 = pfVar7[2];
          fVar255 = pfVar7[3];
          fVar257 = pfVar7[4];
          fVar200 = pfVar7[5];
          fVar258 = pfVar7[6];
          fVar146 = pfVar4[7] + pfVar5[7];
          fStack_524 = pfVar5[7] + fVar236;
          fVar236 = *(float *)pauVar3[1] + fVar168 + fVar236;
          pfVar4 = (float *)(lVar116 + 0x21afd38 + lVar122 * 4);
          fVar168 = *pfVar4;
          fVar259 = pfVar4[1];
          fVar261 = pfVar4[2];
          fVar201 = pfVar4[3];
          fVar260 = pfVar4[4];
          fVar277 = pfVar4[5];
          fVar279 = pfVar4[6];
          local_3e0._4_4_ =
               fVar259 * fVar237 +
               fVar199 * (float)local_640._4_4_ +
               (float)local_5a0._4_4_ * fVar185 + (float)local_360._4_4_ * fVar184;
          local_3e0._0_4_ =
               fVar168 * fVar252 +
               fVar253 * (float)local_640._0_4_ +
               (float)local_5a0._0_4_ * fVar219 + (float)local_360._0_4_ * fVar287;
          fStack_3d8 = fVar261 * fVar246 +
                       fVar256 * fStack_638 + fStack_598 * fVar226 + fStack_358 * fVar294;
          fStack_3d4 = fVar201 * fVar147 +
                       fVar255 * fStack_634 + fStack_594 * fVar196 + fStack_354 * fVar164;
          fStack_3d0 = fVar260 * fVar157 +
                       fVar257 * fStack_630 + fStack_590 * fVar228 + fStack_350 * fVar197;
          fStack_3cc = fVar277 * fVar159 +
                       fVar200 * fStack_62c + fStack_58c * fVar233 + fStack_34c * fVar254;
          fStack_3c8 = fVar279 * fVar161 +
                       fVar258 * fStack_628 + fStack_588 * fVar145 + fStack_348 * fVar166;
          fStack_3c4 = fVar146 + fStack_524;
          local_540 = fVar168 * (float)local_2c0._0_4_ +
                      fVar169 * fVar219 + (float)local_580._0_4_ * fVar287 +
                      fVar253 * (float)local_5e0._0_4_;
          fStack_53c = fVar259 * (float)local_2c0._4_4_ +
                       fVar181 * fVar185 + (float)local_580._4_4_ * fVar184 +
                       fVar199 * (float)local_5e0._4_4_;
          fStack_538 = fVar261 * fStack_2b8 +
                       fVar182 * fVar226 + fStack_578 * fVar294 + fVar256 * fStack_5d8;
          fStack_534 = fVar201 * fStack_2b4 +
                       fVar183 * fVar196 + fStack_574 * fVar164 + fVar255 * fStack_5d4;
          fStack_530 = fVar260 * fStack_2b0 +
                       fVar198 * fVar228 + fStack_570 * fVar197 + fVar257 * fStack_5d0;
          fStack_52c = fVar277 * fStack_2ac +
                       fVar234 * fVar233 + fStack_56c * fVar254 + fVar200 * fStack_5cc;
          fStack_528 = fVar279 * fStack_2a8 +
                       fVar235 * fVar145 + fStack_568 * fVar166 + fVar258 * fStack_5c8;
          fStack_524 = fStack_524 + fVar236;
          auVar297._0_4_ =
               fVar253 * (float)local_2a0._0_4_ +
               (float)local_80._0_4_ * fVar219 + (float)local_5c0._0_4_ * fVar287 +
               fVar168 * (float)local_480._0_4_;
          auVar297._4_4_ =
               fVar199 * (float)local_2a0._4_4_ +
               (float)local_80._4_4_ * fVar185 + (float)local_5c0._4_4_ * fVar184 +
               fVar259 * (float)local_480._4_4_;
          auVar297._8_4_ =
               fVar256 * fStack_298 + fStack_78 * fVar226 + fStack_5b8 * fVar294 +
               fVar261 * fStack_478;
          auVar297._12_4_ =
               fVar255 * fStack_294 + fStack_74 * fVar196 + fStack_5b4 * fVar164 +
               fVar201 * fStack_474;
          auVar297._16_4_ =
               fVar257 * fStack_290 + fStack_70 * fVar228 + fStack_5b0 * fVar197 +
               fVar260 * fStack_470;
          auVar297._20_4_ =
               fVar200 * fStack_28c + fStack_6c * fVar233 + fStack_5ac * fVar254 +
               fVar277 * fStack_46c;
          auVar297._24_4_ =
               fVar258 * fStack_288 + fStack_68 * fVar145 + fStack_5a8 * fVar166 +
               fVar279 * fStack_468;
          auVar297._28_4_ = pfVar7[7] + fVar146 + fVar236;
          pfVar4 = (float *)(lVar116 + 0x21b2a60 + lVar122 * 4);
          fVar219 = *pfVar4;
          fVar185 = pfVar4[1];
          fVar226 = pfVar4[2];
          fVar196 = pfVar4[3];
          fVar228 = pfVar4[4];
          fVar233 = pfVar4[5];
          fVar145 = pfVar4[6];
          pfVar5 = (float *)(lVar116 + 0x21b2ee4 + lVar122 * 4);
          fVar287 = *pfVar5;
          fVar168 = pfVar5[1];
          fVar184 = pfVar5[2];
          fVar294 = pfVar5[3];
          fVar164 = pfVar5[4];
          fVar197 = pfVar5[5];
          fVar254 = pfVar5[6];
          pfVar7 = (float *)(lVar116 + 0x21b25dc + lVar122 * 4);
          fVar166 = *pfVar7;
          fVar253 = pfVar7[1];
          fVar199 = pfVar7[2];
          fVar256 = pfVar7[3];
          fVar255 = pfVar7[4];
          fVar257 = pfVar7[5];
          fVar200 = pfVar7[6];
          pfVar8 = (float *)(lVar116 + 0x21b2158 + lVar122 * 4);
          fVar258 = *pfVar8;
          fVar259 = pfVar8[1];
          fVar261 = pfVar8[2];
          fVar201 = pfVar8[3];
          fVar260 = pfVar8[4];
          fVar277 = pfVar8[5];
          fVar279 = pfVar8[6];
          auVar266._0_4_ =
               fVar258 * fVar252 +
               fVar166 * (float)local_640._0_4_ +
               (float)local_5a0._0_4_ * fVar219 + (float)local_360._0_4_ * fVar287;
          auVar266._4_4_ =
               fVar259 * fVar237 +
               fVar253 * (float)local_640._4_4_ +
               (float)local_5a0._4_4_ * fVar185 + (float)local_360._4_4_ * fVar168;
          auVar266._8_4_ =
               fVar261 * fVar246 +
               fVar199 * fStack_638 + fStack_598 * fVar226 + fStack_358 * fVar184;
          auVar266._12_4_ =
               fVar201 * fVar147 +
               fVar256 * fStack_634 + fStack_594 * fVar196 + fStack_354 * fVar294;
          auVar266._16_4_ =
               fVar260 * fVar157 +
               fVar255 * fStack_630 + fStack_590 * fVar228 + fStack_350 * fVar164;
          auVar266._20_4_ =
               fVar277 * fVar159 +
               fVar257 * fStack_62c + fStack_58c * fVar233 + fStack_34c * fVar197;
          auVar266._24_4_ =
               fVar279 * fVar161 +
               fVar200 * fStack_628 + fStack_588 * fVar145 + fStack_348 * fVar254;
          auVar266._28_4_ = fStack_344 + fStack_344 + fStack_584 + fStack_344;
          auVar292._0_4_ =
               fVar258 * (float)local_2c0._0_4_ +
               fVar166 * (float)local_5e0._0_4_ +
               fVar169 * fVar219 + (float)local_580._0_4_ * fVar287;
          auVar292._4_4_ =
               fVar259 * (float)local_2c0._4_4_ +
               fVar253 * (float)local_5e0._4_4_ +
               fVar181 * fVar185 + (float)local_580._4_4_ * fVar168;
          auVar292._8_4_ =
               fVar261 * fStack_2b8 +
               fVar199 * fStack_5d8 + fVar182 * fVar226 + fStack_578 * fVar184;
          auVar292._12_4_ =
               fVar201 * fStack_2b4 +
               fVar256 * fStack_5d4 + fVar183 * fVar196 + fStack_574 * fVar294;
          auVar292._16_4_ =
               fVar260 * fStack_2b0 +
               fVar255 * fStack_5d0 + fVar198 * fVar228 + fStack_570 * fVar164;
          auVar292._20_4_ =
               fVar277 * fStack_2ac +
               fVar257 * fStack_5cc + fVar234 * fVar233 + fStack_56c * fVar197;
          auVar292._24_4_ =
               fVar279 * fStack_2a8 +
               fVar200 * fStack_5c8 + fVar235 * fVar145 + fStack_568 * fVar254;
          auVar292._28_4_ = fStack_344 + fStack_344 + fStack_564 + fStack_344;
          auVar224._8_4_ = 0x7fffffff;
          auVar224._0_8_ = 0x7fffffff7fffffff;
          auVar224._12_4_ = 0x7fffffff;
          auVar224._16_4_ = 0x7fffffff;
          auVar224._20_4_ = 0x7fffffff;
          auVar224._24_4_ = 0x7fffffff;
          auVar224._28_4_ = 0x7fffffff;
          auVar133 = vandps_avx(_local_3e0,auVar224);
          auVar105._4_4_ = fStack_53c;
          auVar105._0_4_ = local_540;
          auVar105._8_4_ = fStack_538;
          auVar105._12_4_ = fStack_534;
          auVar105._16_4_ = fStack_530;
          auVar105._20_4_ = fStack_52c;
          auVar105._24_4_ = fStack_528;
          auVar105._28_4_ = fStack_524;
          auVar21 = vandps_avx(auVar105,auVar224);
          auVar21 = vmaxps_avx(auVar133,auVar21);
          auVar133 = vandps_avx(auVar297,auVar224);
          auVar21 = vmaxps_avx(auVar21,auVar133);
          auVar21 = vcmpps_avx(auVar21,_local_440,1);
          auVar27 = vblendvps_avx(_local_3e0,auVar22,auVar21);
          auVar134._0_4_ =
               fVar258 * (float)local_480._0_4_ +
               fVar166 * (float)local_2a0._0_4_ +
               (float)local_5c0._0_4_ * fVar287 + (float)local_80._0_4_ * fVar219;
          auVar134._4_4_ =
               fVar259 * (float)local_480._4_4_ +
               fVar253 * (float)local_2a0._4_4_ +
               (float)local_5c0._4_4_ * fVar168 + (float)local_80._4_4_ * fVar185;
          auVar134._8_4_ =
               fVar261 * fStack_478 +
               fVar199 * fStack_298 + fStack_5b8 * fVar184 + fStack_78 * fVar226;
          auVar134._12_4_ =
               fVar201 * fStack_474 +
               fVar256 * fStack_294 + fStack_5b4 * fVar294 + fStack_74 * fVar196;
          auVar134._16_4_ =
               fVar260 * fStack_470 +
               fVar255 * fStack_290 + fStack_5b0 * fVar164 + fStack_70 * fVar228;
          auVar134._20_4_ =
               fVar277 * fStack_46c +
               fVar257 * fStack_28c + fStack_5ac * fVar197 + fStack_6c * fVar233;
          auVar134._24_4_ =
               fVar279 * fStack_468 +
               fVar200 * fStack_288 + fStack_5a8 * fVar254 + fStack_68 * fVar145;
          auVar134._28_4_ = auVar133._28_4_ + pfVar7[7] + pfVar5[7] + pfVar4[7];
          auVar16 = vblendvps_avx(auVar105,auVar20,auVar21);
          auVar133 = vandps_avx(auVar266,auVar224);
          auVar21 = vandps_avx(auVar292,auVar224);
          auVar190 = vmaxps_avx(auVar133,auVar21);
          auVar133 = vandps_avx(auVar134,auVar224);
          auVar133 = vmaxps_avx(auVar190,auVar133);
          local_500._0_4_ = auVar110._0_4_;
          local_500._4_4_ = auVar110._4_4_;
          fStack_4f8 = auVar110._8_4_;
          fStack_4f4 = auVar110._12_4_;
          fStack_4f0 = auVar110._16_4_;
          fStack_4ec = auVar110._20_4_;
          fStack_4e8 = auVar110._24_4_;
          auVar21 = vcmpps_avx(auVar133,_local_440,1);
          auVar133 = vblendvps_avx(auVar266,auVar22,auVar21);
          auVar135._0_4_ =
               (float)local_480._0_4_ * (float)local_500._0_4_ +
               (float)local_2a0._0_4_ * (float)local_520._0_4_ +
               fVar148 + (float)local_5c0._0_4_ * fVar281;
          auVar135._4_4_ =
               (float)local_480._4_4_ * (float)local_500._4_4_ +
               (float)local_2a0._4_4_ * (float)local_520._4_4_ +
               fVar158 + (float)local_5c0._4_4_ * fVar123;
          auVar135._8_4_ =
               fStack_478 * fStack_4f8 + fStack_298 * fStack_518 + fVar160 + fStack_5b8 * fVar140;
          auVar135._12_4_ =
               fStack_474 * fStack_4f4 + fStack_294 * fStack_514 + fVar162 + fStack_5b4 * fVar141;
          auVar135._16_4_ =
               fStack_470 * fStack_4f0 + fStack_290 * fStack_510 + fVar163 + fStack_5b0 * fVar142;
          auVar135._20_4_ =
               fStack_46c * fStack_4ec + fStack_28c * fStack_50c + fVar165 + fStack_5ac * fVar143;
          auVar135._24_4_ =
               fStack_468 * fStack_4e8 + fStack_288 * fStack_508 + fVar167 + fStack_5a8 * fVar144;
          auVar135._28_4_ = auVar190._28_4_ + fStack_544 + local_3c0._28_4_ + 0.0;
          auVar22 = vblendvps_avx(auVar292,auVar20,auVar21);
          fVar141 = auVar27._0_4_;
          fVar142 = auVar27._4_4_;
          fVar143 = auVar27._8_4_;
          fVar144 = auVar27._12_4_;
          fVar148 = auVar27._16_4_;
          fVar158 = auVar27._20_4_;
          fVar160 = auVar27._24_4_;
          fVar162 = auVar27._28_4_;
          fVar164 = auVar133._0_4_;
          fVar254 = auVar133._4_4_;
          fVar253 = auVar133._8_4_;
          fVar256 = auVar133._12_4_;
          fVar257 = auVar133._16_4_;
          fVar258 = auVar133._20_4_;
          fVar261 = auVar133._24_4_;
          fVar219 = auVar16._0_4_;
          fVar226 = auVar16._4_4_;
          fVar198 = auVar16._8_4_;
          fVar233 = auVar16._12_4_;
          fVar235 = auVar16._16_4_;
          fVar287 = auVar16._20_4_;
          fVar184 = auVar16._24_4_;
          auVar274._0_4_ = fVar219 * fVar219 + fVar141 * fVar141;
          auVar274._4_4_ = fVar226 * fVar226 + fVar142 * fVar142;
          auVar274._8_4_ = fVar198 * fVar198 + fVar143 * fVar143;
          auVar274._12_4_ = fVar233 * fVar233 + fVar144 * fVar144;
          auVar274._16_4_ = fVar235 * fVar235 + fVar148 * fVar148;
          auVar274._20_4_ = fVar287 * fVar287 + fVar158 * fVar158;
          auVar274._24_4_ = fVar184 * fVar184 + fVar160 * fVar160;
          auVar274._28_4_ = fStack_5a4 + auVar20._28_4_;
          auVar20 = vrsqrtps_avx(auVar274);
          fVar185 = auVar20._0_4_;
          fVar196 = auVar20._4_4_;
          auVar62._4_4_ = fVar196 * 1.5;
          auVar62._0_4_ = fVar185 * 1.5;
          fVar228 = auVar20._8_4_;
          auVar62._8_4_ = fVar228 * 1.5;
          fVar234 = auVar20._12_4_;
          auVar62._12_4_ = fVar234 * 1.5;
          fVar145 = auVar20._16_4_;
          auVar62._16_4_ = fVar145 * 1.5;
          fVar168 = auVar20._20_4_;
          auVar62._20_4_ = fVar168 * 1.5;
          fVar294 = auVar20._24_4_;
          auVar62._24_4_ = fVar294 * 1.5;
          auVar62._28_4_ = auVar292._28_4_;
          auVar63._4_4_ = fVar196 * fVar196 * fVar196 * auVar274._4_4_ * 0.5;
          auVar63._0_4_ = fVar185 * fVar185 * fVar185 * auVar274._0_4_ * 0.5;
          auVar63._8_4_ = fVar228 * fVar228 * fVar228 * auVar274._8_4_ * 0.5;
          auVar63._12_4_ = fVar234 * fVar234 * fVar234 * auVar274._12_4_ * 0.5;
          auVar63._16_4_ = fVar145 * fVar145 * fVar145 * auVar274._16_4_ * 0.5;
          auVar63._20_4_ = fVar168 * fVar168 * fVar168 * auVar274._20_4_ * 0.5;
          auVar63._24_4_ = fVar294 * fVar294 * fVar294 * auVar274._24_4_ * 0.5;
          auVar63._28_4_ = auVar274._28_4_;
          auVar21 = vsubps_avx(auVar62,auVar63);
          fVar260 = auVar21._0_4_;
          fVar277 = auVar21._4_4_;
          fVar279 = auVar21._8_4_;
          fVar146 = auVar21._12_4_;
          fVar281 = auVar21._16_4_;
          fVar123 = auVar21._20_4_;
          fVar140 = auVar21._24_4_;
          fVar185 = auVar22._0_4_;
          fVar196 = auVar22._4_4_;
          fVar228 = auVar22._8_4_;
          fVar234 = auVar22._12_4_;
          fVar145 = auVar22._16_4_;
          fVar168 = auVar22._20_4_;
          fVar294 = auVar22._24_4_;
          auVar249._0_4_ = fVar185 * fVar185 + fVar164 * fVar164;
          auVar249._4_4_ = fVar196 * fVar196 + fVar254 * fVar254;
          auVar249._8_4_ = fVar228 * fVar228 + fVar253 * fVar253;
          auVar249._12_4_ = fVar234 * fVar234 + fVar256 * fVar256;
          auVar249._16_4_ = fVar145 * fVar145 + fVar257 * fVar257;
          auVar249._20_4_ = fVar168 * fVar168 + fVar258 * fVar258;
          auVar249._24_4_ = fVar294 * fVar294 + fVar261 * fVar261;
          auVar249._28_4_ = auVar20._28_4_ + auVar133._28_4_;
          auVar133 = vrsqrtps_avx(auVar249);
          fVar197 = auVar133._0_4_;
          fVar166 = auVar133._4_4_;
          auVar64._4_4_ = fVar166 * 1.5;
          auVar64._0_4_ = fVar197 * 1.5;
          fVar199 = auVar133._8_4_;
          auVar64._8_4_ = fVar199 * 1.5;
          fVar255 = auVar133._12_4_;
          auVar64._12_4_ = fVar255 * 1.5;
          fVar200 = auVar133._16_4_;
          auVar64._16_4_ = fVar200 * 1.5;
          fVar259 = auVar133._20_4_;
          auVar64._20_4_ = fVar259 * 1.5;
          fVar201 = auVar133._24_4_;
          auVar64._24_4_ = fVar201 * 1.5;
          auVar64._28_4_ = auVar292._28_4_;
          auVar65._4_4_ = fVar166 * fVar166 * fVar166 * auVar249._4_4_ * 0.5;
          auVar65._0_4_ = fVar197 * fVar197 * fVar197 * auVar249._0_4_ * 0.5;
          auVar65._8_4_ = fVar199 * fVar199 * fVar199 * auVar249._8_4_ * 0.5;
          auVar65._12_4_ = fVar255 * fVar255 * fVar255 * auVar249._12_4_ * 0.5;
          auVar65._16_4_ = fVar200 * fVar200 * fVar200 * auVar249._16_4_ * 0.5;
          auVar65._20_4_ = fVar259 * fVar259 * fVar259 * auVar249._20_4_ * 0.5;
          auVar65._24_4_ = fVar201 * fVar201 * fVar201 * auVar249._24_4_ * 0.5;
          auVar65._28_4_ = auVar249._28_4_;
          auVar22 = vsubps_avx(auVar64,auVar65);
          fVar197 = auVar22._0_4_;
          fVar166 = auVar22._4_4_;
          fVar199 = auVar22._8_4_;
          fVar255 = auVar22._12_4_;
          fVar200 = auVar22._16_4_;
          fVar259 = auVar22._20_4_;
          fVar201 = auVar22._24_4_;
          fVar219 = (float)local_7a0._0_4_ * fVar260 * fVar219;
          fVar226 = (float)local_7a0._4_4_ * fVar277 * fVar226;
          auVar66._4_4_ = fVar226;
          auVar66._0_4_ = fVar219;
          fVar198 = fStack_798 * fVar279 * fVar198;
          auVar66._8_4_ = fVar198;
          fVar233 = fStack_794 * fVar146 * fVar233;
          auVar66._12_4_ = fVar233;
          fVar235 = fStack_790 * fVar281 * fVar235;
          auVar66._16_4_ = fVar235;
          fVar287 = fStack_78c * fVar123 * fVar287;
          auVar66._20_4_ = fVar287;
          fVar184 = fStack_788 * fVar140 * fVar184;
          auVar66._24_4_ = fVar184;
          auVar66._28_4_ = auVar133._28_4_;
          local_500._4_4_ = fVar226 + local_720._4_4_;
          local_500._0_4_ = fVar219 + (float)local_720._0_4_;
          fStack_4f8 = fVar198 + local_720._8_4_;
          fStack_4f4 = fVar233 + local_720._12_4_;
          fStack_4f0 = fVar235 + register0x00001410;
          fStack_4ec = fVar287 + register0x00001414;
          fStack_4e8 = fVar184 + register0x00001418;
          fStack_4e4 = auVar133._28_4_ + register0x0000141c;
          fVar219 = (float)local_7a0._0_4_ * fVar260 * -fVar141;
          fVar226 = (float)local_7a0._4_4_ * fVar277 * -fVar142;
          auVar67._4_4_ = fVar226;
          auVar67._0_4_ = fVar219;
          fVar198 = fStack_798 * fVar279 * -fVar143;
          auVar67._8_4_ = fVar198;
          fVar233 = fStack_794 * fVar146 * -fVar144;
          auVar67._12_4_ = fVar233;
          fVar235 = fStack_790 * fVar281 * -fVar148;
          auVar67._16_4_ = fVar235;
          fVar287 = fStack_78c * fVar123 * -fVar158;
          auVar67._20_4_ = fVar287;
          fVar184 = fStack_788 * fVar140 * -fVar160;
          auVar67._24_4_ = fVar184;
          auVar67._28_4_ = -fVar162;
          local_520._4_4_ = local_700._4_4_ + fVar226;
          local_520._0_4_ = (float)local_700._0_4_ + fVar219;
          fStack_518 = local_700._8_4_ + fVar198;
          fStack_514 = local_700._12_4_ + fVar233;
          fStack_510 = local_700._16_4_ + fVar235;
          fStack_50c = local_700._20_4_ + fVar287;
          fStack_508 = local_700._24_4_ + fVar184;
          fStack_504 = local_700._28_4_ + -fVar162;
          fVar219 = fVar260 * 0.0 * (float)local_7a0._0_4_;
          fVar226 = fVar277 * 0.0 * (float)local_7a0._4_4_;
          auVar68._4_4_ = fVar226;
          auVar68._0_4_ = fVar219;
          fVar198 = fVar279 * 0.0 * fStack_798;
          auVar68._8_4_ = fVar198;
          fVar233 = fVar146 * 0.0 * fStack_794;
          auVar68._12_4_ = fVar233;
          fVar235 = fVar281 * 0.0 * fStack_790;
          auVar68._16_4_ = fVar235;
          fVar287 = fVar123 * 0.0 * fStack_78c;
          auVar68._20_4_ = fVar287;
          fVar184 = fVar140 * 0.0 * fStack_788;
          auVar68._24_4_ = fVar184;
          auVar68._28_4_ = fVar162;
          auVar190 = vsubps_avx(_local_720,auVar66);
          auVar311._0_4_ = fVar219 + auVar135._0_4_;
          auVar311._4_4_ = fVar226 + auVar135._4_4_;
          auVar311._8_4_ = fVar198 + auVar135._8_4_;
          auVar311._12_4_ = fVar233 + auVar135._12_4_;
          auVar311._16_4_ = fVar235 + auVar135._16_4_;
          auVar311._20_4_ = fVar287 + auVar135._20_4_;
          auVar311._24_4_ = fVar184 + auVar135._24_4_;
          auVar311._28_4_ = fVar162 + auVar135._28_4_;
          fVar219 = auVar283._0_4_ * fVar197 * fVar185;
          fVar185 = auVar283._4_4_ * fVar166 * fVar196;
          auVar69._4_4_ = fVar185;
          auVar69._0_4_ = fVar219;
          fVar226 = auVar283._8_4_ * fVar199 * fVar228;
          auVar69._8_4_ = fVar226;
          fVar196 = auVar283._12_4_ * fVar255 * fVar234;
          auVar69._12_4_ = fVar196;
          fVar198 = auVar283._16_4_ * fVar200 * fVar145;
          auVar69._16_4_ = fVar198;
          fVar228 = auVar283._20_4_ * fVar259 * fVar168;
          auVar69._20_4_ = fVar228;
          fVar233 = auVar283._24_4_ * fVar201 * fVar294;
          auVar69._24_4_ = fVar233;
          auVar69._28_4_ = fStack_784;
          auVar23 = vsubps_avx(local_700,auVar67);
          auVar298._0_4_ = local_4a0._0_4_ + fVar219;
          auVar298._4_4_ = local_4a0._4_4_ + fVar185;
          auVar298._8_4_ = local_4a0._8_4_ + fVar226;
          auVar298._12_4_ = local_4a0._12_4_ + fVar196;
          auVar298._16_4_ = local_4a0._16_4_ + fVar198;
          auVar298._20_4_ = local_4a0._20_4_ + fVar228;
          auVar298._24_4_ = local_4a0._24_4_ + fVar233;
          auVar298._28_4_ = local_4a0._28_4_ + fStack_784;
          fVar219 = fVar197 * -fVar164 * auVar283._0_4_;
          fVar185 = fVar166 * -fVar254 * auVar283._4_4_;
          auVar70._4_4_ = fVar185;
          auVar70._0_4_ = fVar219;
          fVar226 = fVar199 * -fVar253 * auVar283._8_4_;
          auVar70._8_4_ = fVar226;
          fVar196 = fVar255 * -fVar256 * auVar283._12_4_;
          auVar70._12_4_ = fVar196;
          fVar198 = fVar200 * -fVar257 * auVar283._16_4_;
          auVar70._16_4_ = fVar198;
          fVar228 = fVar259 * -fVar258 * auVar283._20_4_;
          auVar70._20_4_ = fVar228;
          fVar233 = fVar201 * -fVar261 * auVar283._24_4_;
          auVar70._24_4_ = fVar233;
          auVar70._28_4_ = register0x0000141c;
          auVar24 = vsubps_avx(auVar135,auVar68);
          auVar212._0_4_ = local_380._0_4_ + fVar219;
          auVar212._4_4_ = local_380._4_4_ + fVar185;
          auVar212._8_4_ = local_380._8_4_ + fVar226;
          auVar212._12_4_ = local_380._12_4_ + fVar196;
          auVar212._16_4_ = local_380._16_4_ + fVar198;
          auVar212._20_4_ = local_380._20_4_ + fVar228;
          auVar212._24_4_ = local_380._24_4_ + fVar233;
          auVar212._28_4_ = local_380._28_4_ + register0x0000141c;
          fVar219 = fVar197 * 0.0 * auVar283._0_4_;
          fVar185 = fVar166 * 0.0 * auVar283._4_4_;
          auVar71._4_4_ = fVar185;
          auVar71._0_4_ = fVar219;
          fVar226 = fVar199 * 0.0 * auVar283._8_4_;
          auVar71._8_4_ = fVar226;
          fVar196 = fVar255 * 0.0 * auVar283._12_4_;
          auVar71._12_4_ = fVar196;
          fVar198 = fVar200 * 0.0 * auVar283._16_4_;
          auVar71._16_4_ = fVar198;
          fVar228 = fVar259 * 0.0 * auVar283._20_4_;
          auVar71._20_4_ = fVar228;
          fVar233 = fVar201 * 0.0 * auVar283._24_4_;
          auVar71._24_4_ = fVar233;
          auVar71._28_4_ = auVar135._28_4_;
          auVar133 = vsubps_avx(local_4a0,auVar69);
          auVar267._0_4_ = (float)local_560._0_4_ + fVar219;
          auVar267._4_4_ = (float)local_560._4_4_ + fVar185;
          auVar267._8_4_ = fStack_558 + fVar226;
          auVar267._12_4_ = fStack_554 + fVar196;
          auVar267._16_4_ = fStack_550 + fVar198;
          auVar267._20_4_ = fStack_54c + fVar228;
          auVar267._24_4_ = fStack_548 + fVar233;
          auVar267._28_4_ = fStack_544 + auVar135._28_4_;
          auVar20 = vsubps_avx(local_380,auVar70);
          auVar21 = vsubps_avx(_local_560,auVar71);
          auVar27 = vsubps_avx(auVar212,auVar23);
          auVar16 = vsubps_avx(auVar267,auVar24);
          auVar72._4_4_ = auVar24._4_4_ * auVar27._4_4_;
          auVar72._0_4_ = auVar24._0_4_ * auVar27._0_4_;
          auVar72._8_4_ = auVar24._8_4_ * auVar27._8_4_;
          auVar72._12_4_ = auVar24._12_4_ * auVar27._12_4_;
          auVar72._16_4_ = auVar24._16_4_ * auVar27._16_4_;
          auVar72._20_4_ = auVar24._20_4_ * auVar27._20_4_;
          auVar72._24_4_ = auVar24._24_4_ * auVar27._24_4_;
          auVar72._28_4_ = auVar292._28_4_;
          auVar73._4_4_ = auVar23._4_4_ * auVar16._4_4_;
          auVar73._0_4_ = auVar23._0_4_ * auVar16._0_4_;
          auVar73._8_4_ = auVar23._8_4_ * auVar16._8_4_;
          auVar73._12_4_ = auVar23._12_4_ * auVar16._12_4_;
          auVar73._16_4_ = auVar23._16_4_ * auVar16._16_4_;
          auVar73._20_4_ = auVar23._20_4_ * auVar16._20_4_;
          auVar73._24_4_ = auVar23._24_4_ * auVar16._24_4_;
          auVar73._28_4_ = fStack_544;
          auVar230 = vsubps_avx(auVar73,auVar72);
          auVar74._4_4_ = auVar190._4_4_ * auVar16._4_4_;
          auVar74._0_4_ = auVar190._0_4_ * auVar16._0_4_;
          auVar74._8_4_ = auVar190._8_4_ * auVar16._8_4_;
          auVar74._12_4_ = auVar190._12_4_ * auVar16._12_4_;
          auVar74._16_4_ = auVar190._16_4_ * auVar16._16_4_;
          auVar74._20_4_ = auVar190._20_4_ * auVar16._20_4_;
          auVar74._24_4_ = auVar190._24_4_ * auVar16._24_4_;
          auVar74._28_4_ = auVar16._28_4_;
          auVar16 = vsubps_avx(auVar298,auVar190);
          auVar75._4_4_ = auVar24._4_4_ * auVar16._4_4_;
          auVar75._0_4_ = auVar24._0_4_ * auVar16._0_4_;
          auVar75._8_4_ = auVar24._8_4_ * auVar16._8_4_;
          auVar75._12_4_ = auVar24._12_4_ * auVar16._12_4_;
          auVar75._16_4_ = auVar24._16_4_ * auVar16._16_4_;
          auVar75._20_4_ = auVar24._20_4_ * auVar16._20_4_;
          auVar75._24_4_ = auVar24._24_4_ * auVar16._24_4_;
          auVar75._28_4_ = auVar22._28_4_;
          auVar289 = vsubps_avx(auVar75,auVar74);
          auVar76._4_4_ = auVar23._4_4_ * auVar16._4_4_;
          auVar76._0_4_ = auVar23._0_4_ * auVar16._0_4_;
          auVar76._8_4_ = auVar23._8_4_ * auVar16._8_4_;
          auVar76._12_4_ = auVar23._12_4_ * auVar16._12_4_;
          auVar76._16_4_ = auVar23._16_4_ * auVar16._16_4_;
          auVar76._20_4_ = auVar23._20_4_ * auVar16._20_4_;
          auVar76._24_4_ = auVar23._24_4_ * auVar16._24_4_;
          auVar76._28_4_ = auVar22._28_4_;
          auVar77._4_4_ = auVar190._4_4_ * auVar27._4_4_;
          auVar77._0_4_ = auVar190._0_4_ * auVar27._0_4_;
          auVar77._8_4_ = auVar190._8_4_ * auVar27._8_4_;
          auVar77._12_4_ = auVar190._12_4_ * auVar27._12_4_;
          auVar77._16_4_ = auVar190._16_4_ * auVar27._16_4_;
          auVar77._20_4_ = auVar190._20_4_ * auVar27._20_4_;
          auVar77._24_4_ = auVar190._24_4_ * auVar27._24_4_;
          auVar77._28_4_ = auVar27._28_4_;
          auVar22 = vsubps_avx(auVar77,auVar76);
          auVar153._0_4_ = auVar230._0_4_ * 0.0 + auVar22._0_4_ + auVar289._0_4_ * 0.0;
          auVar153._4_4_ = auVar230._4_4_ * 0.0 + auVar22._4_4_ + auVar289._4_4_ * 0.0;
          auVar153._8_4_ = auVar230._8_4_ * 0.0 + auVar22._8_4_ + auVar289._8_4_ * 0.0;
          auVar153._12_4_ = auVar230._12_4_ * 0.0 + auVar22._12_4_ + auVar289._12_4_ * 0.0;
          auVar153._16_4_ = auVar230._16_4_ * 0.0 + auVar22._16_4_ + auVar289._16_4_ * 0.0;
          auVar153._20_4_ = auVar230._20_4_ * 0.0 + auVar22._20_4_ + auVar289._20_4_ * 0.0;
          auVar153._24_4_ = auVar230._24_4_ * 0.0 + auVar22._24_4_ + auVar289._24_4_ * 0.0;
          auVar153._28_4_ = auVar230._28_4_ + auVar22._28_4_ + auVar289._28_4_;
          auVar17 = vcmpps_avx(auVar153,ZEXT832(0) << 0x20,2);
          auVar133 = vblendvps_avx(auVar133,_local_500,auVar17);
          auVar22 = vblendvps_avx(auVar20,_local_520,auVar17);
          auVar20 = vblendvps_avx(auVar21,auVar311,auVar17);
          auVar21 = vblendvps_avx(auVar190,auVar298,auVar17);
          auVar27 = vblendvps_avx(auVar23,auVar212,auVar17);
          auVar16 = vblendvps_avx(auVar24,auVar267,auVar17);
          auVar190 = vblendvps_avx(auVar298,auVar190,auVar17);
          auVar230 = vblendvps_avx(auVar212,auVar23,auVar17);
          auVar289 = vblendvps_avx(auVar267,auVar24,auVar17);
          local_700 = vandps_avx(local_3c0,_local_420);
          auVar190 = vsubps_avx(auVar190,auVar133);
          auVar25 = vsubps_avx(auVar230,auVar22);
          auVar289 = vsubps_avx(auVar289,auVar20);
          auVar26 = vsubps_avx(auVar22,auVar27);
          fVar219 = auVar25._0_4_;
          fVar237 = auVar20._0_4_;
          fVar234 = auVar25._4_4_;
          fVar246 = auVar20._4_4_;
          auVar78._4_4_ = fVar246 * fVar234;
          auVar78._0_4_ = fVar237 * fVar219;
          fVar164 = auVar25._8_4_;
          fVar169 = auVar20._8_4_;
          auVar78._8_4_ = fVar169 * fVar164;
          fVar255 = auVar25._12_4_;
          fVar181 = auVar20._12_4_;
          auVar78._12_4_ = fVar181 * fVar255;
          fVar260 = auVar25._16_4_;
          fVar182 = auVar20._16_4_;
          auVar78._16_4_ = fVar182 * fVar260;
          fVar141 = auVar25._20_4_;
          fVar183 = auVar20._20_4_;
          auVar78._20_4_ = fVar183 * fVar141;
          fVar162 = auVar25._24_4_;
          fVar147 = auVar20._24_4_;
          auVar78._24_4_ = fVar147 * fVar162;
          auVar78._28_4_ = auVar230._28_4_;
          fVar185 = auVar22._0_4_;
          fVar157 = auVar289._0_4_;
          fVar235 = auVar22._4_4_;
          fVar159 = auVar289._4_4_;
          auVar79._4_4_ = fVar159 * fVar235;
          auVar79._0_4_ = fVar157 * fVar185;
          fVar197 = auVar22._8_4_;
          fVar161 = auVar289._8_4_;
          auVar79._8_4_ = fVar161 * fVar197;
          fVar257 = auVar22._12_4_;
          fVar203 = auVar289._12_4_;
          auVar79._12_4_ = fVar203 * fVar257;
          fVar277 = auVar22._16_4_;
          fVar213 = auVar289._16_4_;
          auVar79._16_4_ = fVar213 * fVar277;
          fVar142 = auVar22._20_4_;
          fVar215 = auVar289._20_4_;
          auVar79._20_4_ = fVar215 * fVar142;
          fVar163 = auVar22._24_4_;
          fVar217 = auVar289._24_4_;
          uVar9 = auVar23._28_4_;
          auVar79._24_4_ = fVar217 * fVar163;
          auVar79._28_4_ = uVar9;
          auVar230 = vsubps_avx(auVar79,auVar78);
          fVar226 = auVar133._0_4_;
          fVar145 = auVar133._4_4_;
          auVar80._4_4_ = fVar159 * fVar145;
          auVar80._0_4_ = fVar157 * fVar226;
          fVar254 = auVar133._8_4_;
          auVar80._8_4_ = fVar161 * fVar254;
          fVar200 = auVar133._12_4_;
          auVar80._12_4_ = fVar203 * fVar200;
          fVar279 = auVar133._16_4_;
          auVar80._16_4_ = fVar213 * fVar279;
          fVar143 = auVar133._20_4_;
          auVar80._20_4_ = fVar215 * fVar143;
          fVar165 = auVar133._24_4_;
          auVar80._24_4_ = fVar217 * fVar165;
          auVar80._28_4_ = uVar9;
          fVar196 = auVar190._0_4_;
          fVar287 = auVar190._4_4_;
          auVar81._4_4_ = fVar246 * fVar287;
          auVar81._0_4_ = fVar237 * fVar196;
          fVar166 = auVar190._8_4_;
          auVar81._8_4_ = fVar169 * fVar166;
          fVar258 = auVar190._12_4_;
          auVar81._12_4_ = fVar181 * fVar258;
          fVar146 = auVar190._16_4_;
          auVar81._16_4_ = fVar182 * fVar146;
          fVar144 = auVar190._20_4_;
          auVar81._20_4_ = fVar183 * fVar144;
          fVar167 = auVar190._24_4_;
          auVar81._24_4_ = fVar147 * fVar167;
          auVar81._28_4_ = auVar298._28_4_;
          auVar23 = vsubps_avx(auVar81,auVar80);
          auVar82._4_4_ = fVar235 * fVar287;
          auVar82._0_4_ = fVar185 * fVar196;
          auVar82._8_4_ = fVar197 * fVar166;
          auVar82._12_4_ = fVar257 * fVar258;
          auVar82._16_4_ = fVar277 * fVar146;
          auVar82._20_4_ = fVar142 * fVar144;
          auVar82._24_4_ = fVar163 * fVar167;
          auVar82._28_4_ = uVar9;
          auVar83._4_4_ = fVar145 * fVar234;
          auVar83._0_4_ = fVar226 * fVar219;
          auVar83._8_4_ = fVar254 * fVar164;
          auVar83._12_4_ = fVar200 * fVar255;
          auVar83._16_4_ = fVar279 * fVar260;
          auVar83._20_4_ = fVar143 * fVar141;
          auVar83._24_4_ = fVar165 * fVar162;
          auVar83._28_4_ = auVar24._28_4_;
          auVar24 = vsubps_avx(auVar83,auVar82);
          auVar20 = vsubps_avx(auVar20,auVar16);
          fVar228 = auVar24._28_4_ + auVar23._28_4_;
          auVar275._0_4_ = auVar24._0_4_ + auVar23._0_4_ * 0.0 + auVar230._0_4_ * 0.0;
          auVar275._4_4_ = auVar24._4_4_ + auVar23._4_4_ * 0.0 + auVar230._4_4_ * 0.0;
          auVar275._8_4_ = auVar24._8_4_ + auVar23._8_4_ * 0.0 + auVar230._8_4_ * 0.0;
          auVar275._12_4_ = auVar24._12_4_ + auVar23._12_4_ * 0.0 + auVar230._12_4_ * 0.0;
          auVar275._16_4_ = auVar24._16_4_ + auVar23._16_4_ * 0.0 + auVar230._16_4_ * 0.0;
          auVar275._20_4_ = auVar24._20_4_ + auVar23._20_4_ * 0.0 + auVar230._20_4_ * 0.0;
          auVar275._24_4_ = auVar24._24_4_ + auVar23._24_4_ * 0.0 + auVar230._24_4_ * 0.0;
          auVar275._28_4_ = fVar228 + auVar230._28_4_;
          fVar198 = auVar26._0_4_;
          fVar168 = auVar26._4_4_;
          auVar84._4_4_ = auVar16._4_4_ * fVar168;
          auVar84._0_4_ = auVar16._0_4_ * fVar198;
          fVar253 = auVar26._8_4_;
          auVar84._8_4_ = auVar16._8_4_ * fVar253;
          fVar259 = auVar26._12_4_;
          auVar84._12_4_ = auVar16._12_4_ * fVar259;
          fVar281 = auVar26._16_4_;
          auVar84._16_4_ = auVar16._16_4_ * fVar281;
          fVar148 = auVar26._20_4_;
          auVar84._20_4_ = auVar16._20_4_ * fVar148;
          fVar236 = auVar26._24_4_;
          auVar84._24_4_ = auVar16._24_4_ * fVar236;
          auVar84._28_4_ = fVar228;
          fVar228 = auVar20._0_4_;
          fVar184 = auVar20._4_4_;
          auVar85._4_4_ = auVar27._4_4_ * fVar184;
          auVar85._0_4_ = auVar27._0_4_ * fVar228;
          fVar199 = auVar20._8_4_;
          auVar85._8_4_ = auVar27._8_4_ * fVar199;
          fVar261 = auVar20._12_4_;
          auVar85._12_4_ = auVar27._12_4_ * fVar261;
          fVar123 = auVar20._16_4_;
          auVar85._16_4_ = auVar27._16_4_ * fVar123;
          fVar158 = auVar20._20_4_;
          auVar85._20_4_ = auVar27._20_4_ * fVar158;
          fVar202 = auVar20._24_4_;
          auVar85._24_4_ = auVar27._24_4_ * fVar202;
          auVar85._28_4_ = auVar24._28_4_;
          auVar23 = vsubps_avx(auVar85,auVar84);
          auVar133 = vsubps_avx(auVar133,auVar21);
          fVar233 = auVar133._0_4_;
          fVar294 = auVar133._4_4_;
          auVar86._4_4_ = auVar16._4_4_ * fVar294;
          auVar86._0_4_ = auVar16._0_4_ * fVar233;
          fVar256 = auVar133._8_4_;
          auVar86._8_4_ = auVar16._8_4_ * fVar256;
          fVar201 = auVar133._12_4_;
          auVar86._12_4_ = auVar16._12_4_ * fVar201;
          fVar140 = auVar133._16_4_;
          auVar86._16_4_ = auVar16._16_4_ * fVar140;
          fVar160 = auVar133._20_4_;
          auVar86._20_4_ = auVar16._20_4_ * fVar160;
          fVar252 = auVar133._24_4_;
          auVar86._24_4_ = auVar16._24_4_ * fVar252;
          auVar86._28_4_ = auVar16._28_4_;
          auVar87._4_4_ = fVar184 * auVar21._4_4_;
          auVar87._0_4_ = fVar228 * auVar21._0_4_;
          auVar87._8_4_ = fVar199 * auVar21._8_4_;
          auVar87._12_4_ = fVar261 * auVar21._12_4_;
          auVar87._16_4_ = fVar123 * auVar21._16_4_;
          auVar87._20_4_ = fVar158 * auVar21._20_4_;
          auVar87._24_4_ = fVar202 * auVar21._24_4_;
          auVar87._28_4_ = auVar230._28_4_;
          auVar133 = vsubps_avx(auVar86,auVar87);
          auVar88._4_4_ = auVar27._4_4_ * fVar294;
          auVar88._0_4_ = auVar27._0_4_ * fVar233;
          auVar88._8_4_ = auVar27._8_4_ * fVar256;
          auVar88._12_4_ = auVar27._12_4_ * fVar201;
          auVar88._16_4_ = auVar27._16_4_ * fVar140;
          auVar88._20_4_ = auVar27._20_4_ * fVar160;
          auVar88._24_4_ = auVar27._24_4_ * fVar252;
          auVar88._28_4_ = auVar27._28_4_;
          auVar89._4_4_ = fVar168 * auVar21._4_4_;
          auVar89._0_4_ = fVar198 * auVar21._0_4_;
          auVar89._8_4_ = fVar253 * auVar21._8_4_;
          auVar89._12_4_ = fVar259 * auVar21._12_4_;
          auVar89._16_4_ = fVar281 * auVar21._16_4_;
          auVar89._20_4_ = fVar148 * auVar21._20_4_;
          auVar89._24_4_ = fVar236 * auVar21._24_4_;
          auVar89._28_4_ = auVar21._28_4_;
          auVar21 = vsubps_avx(auVar89,auVar88);
          auVar136._0_4_ = auVar23._0_4_ * 0.0 + auVar21._0_4_ + auVar133._0_4_ * 0.0;
          auVar136._4_4_ = auVar23._4_4_ * 0.0 + auVar21._4_4_ + auVar133._4_4_ * 0.0;
          auVar136._8_4_ = auVar23._8_4_ * 0.0 + auVar21._8_4_ + auVar133._8_4_ * 0.0;
          auVar136._12_4_ = auVar23._12_4_ * 0.0 + auVar21._12_4_ + auVar133._12_4_ * 0.0;
          auVar136._16_4_ = auVar23._16_4_ * 0.0 + auVar21._16_4_ + auVar133._16_4_ * 0.0;
          auVar136._20_4_ = auVar23._20_4_ * 0.0 + auVar21._20_4_ + auVar133._20_4_ * 0.0;
          auVar136._24_4_ = auVar23._24_4_ * 0.0 + auVar21._24_4_ + auVar133._24_4_ * 0.0;
          auVar136._28_4_ = auVar133._28_4_ + auVar21._28_4_ + auVar133._28_4_;
          auVar139 = ZEXT3264(auVar136);
          auVar133 = vmaxps_avx(auVar275,auVar136);
          auVar133 = vcmpps_avx(auVar133,ZEXT432(0) << 0x20,2);
          auVar21 = local_700 & auVar133;
          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar21 >> 0x7f,0) == '\0') &&
                (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar21 >> 0xbf,0) == '\0') &&
              (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar21[0x1f]) {
LAB_00e2719e:
            auVar194 = ZEXT3264(CONCAT824(local_4e0[1]._24_8_,
                                          CONCAT816(local_4e0[1]._16_8_,
                                                    CONCAT88(local_4e0[1]._8_8_,local_4e0[1]._0_8_))
                                         ));
          }
          else {
            auVar21 = vandps_avx(auVar133,local_700);
            auVar90._4_4_ = fVar184 * fVar234;
            auVar90._0_4_ = fVar228 * fVar219;
            auVar90._8_4_ = fVar199 * fVar164;
            auVar90._12_4_ = fVar261 * fVar255;
            auVar90._16_4_ = fVar123 * fVar260;
            auVar90._20_4_ = fVar158 * fVar141;
            auVar90._24_4_ = fVar202 * fVar162;
            auVar90._28_4_ = local_700._28_4_;
            auVar91._4_4_ = fVar168 * fVar159;
            auVar91._0_4_ = fVar198 * fVar157;
            auVar91._8_4_ = fVar253 * fVar161;
            auVar91._12_4_ = fVar259 * fVar203;
            auVar91._16_4_ = fVar281 * fVar213;
            auVar91._20_4_ = fVar148 * fVar215;
            auVar91._24_4_ = fVar236 * fVar217;
            auVar91._28_4_ = auVar133._28_4_;
            auVar27 = vsubps_avx(auVar91,auVar90);
            auVar92._4_4_ = fVar294 * fVar159;
            auVar92._0_4_ = fVar233 * fVar157;
            auVar92._8_4_ = fVar256 * fVar161;
            auVar92._12_4_ = fVar201 * fVar203;
            auVar92._16_4_ = fVar140 * fVar213;
            auVar92._20_4_ = fVar160 * fVar215;
            auVar92._24_4_ = fVar252 * fVar217;
            auVar92._28_4_ = auVar289._28_4_;
            auVar93._4_4_ = fVar184 * fVar287;
            auVar93._0_4_ = fVar228 * fVar196;
            auVar93._8_4_ = fVar199 * fVar166;
            auVar93._12_4_ = fVar261 * fVar258;
            auVar93._16_4_ = fVar123 * fVar146;
            auVar93._20_4_ = fVar158 * fVar144;
            auVar93._24_4_ = fVar202 * fVar167;
            auVar93._28_4_ = auVar20._28_4_;
            auVar16 = vsubps_avx(auVar93,auVar92);
            auVar94._4_4_ = fVar168 * fVar287;
            auVar94._0_4_ = fVar198 * fVar196;
            auVar94._8_4_ = fVar253 * fVar166;
            auVar94._12_4_ = fVar259 * fVar258;
            auVar94._16_4_ = fVar281 * fVar146;
            auVar94._20_4_ = fVar148 * fVar144;
            auVar94._24_4_ = fVar236 * fVar167;
            auVar94._28_4_ = auVar190._28_4_;
            auVar95._4_4_ = fVar294 * fVar234;
            auVar95._0_4_ = fVar233 * fVar219;
            auVar95._8_4_ = fVar256 * fVar164;
            auVar95._12_4_ = fVar201 * fVar255;
            auVar95._16_4_ = fVar140 * fVar260;
            auVar95._20_4_ = fVar160 * fVar141;
            auVar95._24_4_ = fVar252 * fVar162;
            auVar95._28_4_ = auVar25._28_4_;
            auVar230 = vsubps_avx(auVar95,auVar94);
            auVar250._0_4_ = auVar27._0_4_ * 0.0 + auVar230._0_4_ + auVar16._0_4_ * 0.0;
            auVar250._4_4_ = auVar27._4_4_ * 0.0 + auVar230._4_4_ + auVar16._4_4_ * 0.0;
            auVar250._8_4_ = auVar27._8_4_ * 0.0 + auVar230._8_4_ + auVar16._8_4_ * 0.0;
            auVar250._12_4_ = auVar27._12_4_ * 0.0 + auVar230._12_4_ + auVar16._12_4_ * 0.0;
            auVar250._16_4_ = auVar27._16_4_ * 0.0 + auVar230._16_4_ + auVar16._16_4_ * 0.0;
            auVar250._20_4_ = auVar27._20_4_ * 0.0 + auVar230._20_4_ + auVar16._20_4_ * 0.0;
            auVar250._24_4_ = auVar27._24_4_ * 0.0 + auVar230._24_4_ + auVar16._24_4_ * 0.0;
            auVar250._28_4_ = auVar26._28_4_ + auVar230._28_4_ + auVar190._28_4_;
            auVar133 = vrcpps_avx(auVar250);
            fVar196 = auVar133._0_4_;
            fVar198 = auVar133._4_4_;
            auVar96._4_4_ = auVar250._4_4_ * fVar198;
            auVar96._0_4_ = auVar250._0_4_ * fVar196;
            fVar228 = auVar133._8_4_;
            auVar96._8_4_ = auVar250._8_4_ * fVar228;
            fVar233 = auVar133._12_4_;
            auVar96._12_4_ = auVar250._12_4_ * fVar233;
            fVar234 = auVar133._16_4_;
            auVar96._16_4_ = auVar250._16_4_ * fVar234;
            fVar287 = auVar133._20_4_;
            auVar96._20_4_ = auVar250._20_4_ * fVar287;
            fVar168 = auVar133._24_4_;
            auVar96._24_4_ = auVar250._24_4_ * fVar168;
            auVar96._28_4_ = auVar20._28_4_;
            auVar293._8_4_ = 0x3f800000;
            auVar293._0_8_ = 0x3f8000003f800000;
            auVar293._12_4_ = 0x3f800000;
            auVar293._16_4_ = 0x3f800000;
            auVar293._20_4_ = 0x3f800000;
            auVar293._24_4_ = 0x3f800000;
            auVar293._28_4_ = 0x3f800000;
            auVar133 = vsubps_avx(auVar293,auVar96);
            fVar196 = auVar133._0_4_ * fVar196 + fVar196;
            fVar198 = auVar133._4_4_ * fVar198 + fVar198;
            fVar228 = auVar133._8_4_ * fVar228 + fVar228;
            fVar233 = auVar133._12_4_ * fVar233 + fVar233;
            fVar234 = auVar133._16_4_ * fVar234 + fVar234;
            fVar287 = auVar133._20_4_ * fVar287 + fVar287;
            fVar168 = auVar133._24_4_ * fVar168 + fVar168;
            auVar97._4_4_ =
                 (fVar145 * auVar27._4_4_ + auVar16._4_4_ * fVar235 + fVar246 * auVar230._4_4_) *
                 fVar198;
            auVar97._0_4_ =
                 (fVar226 * auVar27._0_4_ + auVar16._0_4_ * fVar185 + fVar237 * auVar230._0_4_) *
                 fVar196;
            auVar97._8_4_ =
                 (fVar254 * auVar27._8_4_ + auVar16._8_4_ * fVar197 + fVar169 * auVar230._8_4_) *
                 fVar228;
            auVar97._12_4_ =
                 (fVar200 * auVar27._12_4_ + auVar16._12_4_ * fVar257 + fVar181 * auVar230._12_4_) *
                 fVar233;
            auVar97._16_4_ =
                 (fVar279 * auVar27._16_4_ + auVar16._16_4_ * fVar277 + fVar182 * auVar230._16_4_) *
                 fVar234;
            auVar97._20_4_ =
                 (fVar143 * auVar27._20_4_ + auVar16._20_4_ * fVar142 + fVar183 * auVar230._20_4_) *
                 fVar287;
            auVar97._24_4_ =
                 (fVar165 * auVar27._24_4_ + auVar16._24_4_ * fVar163 + fVar147 * auVar230._24_4_) *
                 fVar168;
            auVar97._28_4_ = auVar22._28_4_ + auVar230._28_4_;
            fVar219 = (ray->super_RayK<1>).tfar;
            auVar193._4_4_ = fVar219;
            auVar193._0_4_ = fVar219;
            auVar193._8_4_ = fVar219;
            auVar193._12_4_ = fVar219;
            auVar193._16_4_ = fVar219;
            auVar193._20_4_ = fVar219;
            auVar193._24_4_ = fVar219;
            auVar193._28_4_ = fVar219;
            auVar22 = vcmpps_avx(local_460,auVar97,2);
            auVar133 = vcmpps_avx(auVar97,auVar193,2);
            auVar133 = vandps_avx(auVar22,auVar133);
            auVar20 = auVar21 & auVar133;
            if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar20 >> 0x7f,0) == '\0') &&
                  (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar20 >> 0xbf,0) == '\0') &&
                (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar20[0x1f]) goto LAB_00e2719e;
            auVar133 = vandps_avx(auVar21,auVar133);
            auVar20 = vcmpps_avx(auVar250,ZEXT432(0) << 0x20,4);
            auVar21 = auVar133 & auVar20;
            auVar194 = ZEXT3264(CONCAT824(local_4e0[1]._24_8_,
                                          CONCAT816(local_4e0[1]._16_8_,
                                                    CONCAT88(local_4e0[1]._8_8_,local_4e0[1]._0_8_))
                                         ));
            if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0x7f,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar21 >> 0xbf,0) != '\0') ||
                (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar21[0x1f] < '\0') {
              auVar133 = vandps_avx(auVar20,auVar133);
              auVar194 = ZEXT3264(auVar133);
              auVar98._4_4_ = auVar275._4_4_ * fVar198;
              auVar98._0_4_ = auVar275._0_4_ * fVar196;
              auVar98._8_4_ = auVar275._8_4_ * fVar228;
              auVar98._12_4_ = auVar275._12_4_ * fVar233;
              auVar98._16_4_ = auVar275._16_4_ * fVar234;
              auVar98._20_4_ = auVar275._20_4_ * fVar287;
              auVar98._24_4_ = auVar275._24_4_ * fVar168;
              auVar98._28_4_ = auVar22._28_4_;
              auVar99._4_4_ = auVar136._4_4_ * fVar198;
              auVar99._0_4_ = auVar136._0_4_ * fVar196;
              auVar99._8_4_ = auVar136._8_4_ * fVar228;
              auVar99._12_4_ = auVar136._12_4_ * fVar233;
              auVar99._16_4_ = auVar136._16_4_ * fVar234;
              auVar99._20_4_ = auVar136._20_4_ * fVar287;
              auVar99._24_4_ = auVar136._24_4_ * fVar168;
              auVar99._28_4_ = auVar136._28_4_;
              auVar232._8_4_ = 0x3f800000;
              auVar232._0_8_ = 0x3f8000003f800000;
              auVar232._12_4_ = 0x3f800000;
              auVar232._16_4_ = 0x3f800000;
              auVar232._20_4_ = 0x3f800000;
              auVar232._24_4_ = 0x3f800000;
              auVar232._28_4_ = 0x3f800000;
              auVar133 = vsubps_avx(auVar232,auVar98);
              _local_a0 = vblendvps_avx(auVar133,auVar98,auVar17);
              auVar133 = vsubps_avx(auVar232,auVar99);
              _local_320 = vblendvps_avx(auVar133,auVar99,auVar17);
              auVar139 = ZEXT3264(_local_320);
              local_300 = auVar97;
            }
          }
          auVar268 = ZEXT3264(local_680);
          auVar251 = ZEXT3264(local_6e0);
          auVar133 = auVar194._0_32_;
          auVar304 = ZEXT3264(_local_5e0);
          fVar169 = (float)local_660._0_4_;
          fVar181 = (float)local_660._4_4_;
          fVar182 = fStack_658;
          fVar183 = fStack_654;
          fVar198 = fStack_650;
          fVar234 = fStack_64c;
          fVar235 = fStack_648;
          fVar168 = fStack_644;
          if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar133 >> 0x7f,0) != '\0') ||
                (auVar194 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
               SUB321(auVar133 >> 0xbf,0) != '\0') ||
              (auVar194 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
              auVar194[0x1f] < '\0') {
            auVar22 = vsubps_avx(auVar283,_local_7a0);
            fVar185 = (float)local_7a0._0_4_ + auVar22._0_4_ * (float)local_a0._0_4_;
            fVar226 = (float)local_7a0._4_4_ + auVar22._4_4_ * (float)local_a0._4_4_;
            fVar196 = fStack_798 + auVar22._8_4_ * fStack_98;
            fVar228 = fStack_794 + auVar22._12_4_ * fStack_94;
            fVar233 = fStack_790 + auVar22._16_4_ * fStack_90;
            fVar145 = fStack_78c + auVar22._20_4_ * fStack_8c;
            fVar287 = fStack_788 + auVar22._24_4_ * fStack_88;
            fVar184 = fStack_784 + auVar22._28_4_;
            fVar219 = pre->depth_scale;
            auVar100._4_4_ = (fVar226 + fVar226) * fVar219;
            auVar100._0_4_ = (fVar185 + fVar185) * fVar219;
            auVar100._8_4_ = (fVar196 + fVar196) * fVar219;
            auVar100._12_4_ = (fVar228 + fVar228) * fVar219;
            auVar100._16_4_ = (fVar233 + fVar233) * fVar219;
            auVar100._20_4_ = (fVar145 + fVar145) * fVar219;
            auVar100._24_4_ = (fVar287 + fVar287) * fVar219;
            auVar100._28_4_ = fVar184 + fVar184;
            auVar22 = vcmpps_avx(local_300,auVar100,6);
            auVar139 = ZEXT3264(auVar22);
            auVar20 = auVar133 & auVar22;
            if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0x7f,0) != '\0') ||
                  (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar20 >> 0xbf,0) != '\0') ||
                (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar20[0x1f] < '\0') {
              local_320._0_4_ = (float)local_320._0_4_ + (float)local_320._0_4_ + -1.0;
              local_320._4_4_ = (float)local_320._4_4_ + (float)local_320._4_4_ + -1.0;
              uStack_318._0_4_ = (float)uStack_318 + (float)uStack_318 + -1.0;
              uStack_318._4_4_ = uStack_318._4_4_ + uStack_318._4_4_ + -1.0;
              uStack_310._0_4_ = (float)uStack_310 + (float)uStack_310 + -1.0;
              uStack_310._4_4_ = uStack_310._4_4_ + uStack_310._4_4_ + -1.0;
              uStack_308._0_4_ = (float)uStack_308 + (float)uStack_308 + -1.0;
              uStack_308._4_4_ = uStack_308._4_4_ + uStack_308._4_4_ + -1.0;
              local_260 = _local_a0;
              auVar113 = _local_320;
              auVar20 = _local_320;
              local_240 = (float)local_320._0_4_;
              fStack_23c = (float)local_320._4_4_;
              fStack_238 = (float)uStack_318;
              fStack_234 = uStack_318._4_4_;
              fStack_230 = (float)uStack_310;
              fStack_22c = uStack_310._4_4_;
              fStack_228 = (float)uStack_308;
              fStack_224 = uStack_308._4_4_;
              local_220 = local_300;
              local_1fc = uVar14;
              local_1f0 = CONCAT44(fStack_7ac,local_7b0);
              uStack_1e8 = CONCAT44(fStack_7a4,fStack_7a8);
              local_1e0 = local_770;
              uStack_1d8 = uStack_768;
              local_1d0 = local_6b0;
              uStack_1c8 = uStack_6a8;
              local_1c0 = local_6c0;
              uStack_1b8 = uStack_6b8;
              pGVar119 = (context->scene->geometries).items[local_7b8].ptr;
              _local_320 = auVar20;
              if ((pGVar119->mask & (ray->super_RayK<1>).mask) != 0) {
                auVar133 = vandps_avx(auVar22,auVar133);
                local_4e0[0] = auVar133;
                auVar223 = vshufps_avx(ZEXT416((uint)(float)(int)local_200),
                                       ZEXT416((uint)(float)(int)local_200),0);
                local_180[0] = (auVar223._0_4_ + (float)local_a0._0_4_ + 0.0) *
                               (float)local_3a0._0_4_;
                local_180[1] = (auVar223._4_4_ + (float)local_a0._4_4_ + 1.0) *
                               (float)local_3a0._4_4_;
                local_180[2] = (auVar223._8_4_ + fStack_98 + 2.0) * fStack_398;
                local_180[3] = (auVar223._12_4_ + fStack_94 + 3.0) * fStack_394;
                fStack_170 = (auVar223._0_4_ + fStack_90 + 4.0) * fStack_390;
                fStack_16c = (auVar223._4_4_ + fStack_8c + 5.0) * fStack_38c;
                fStack_168 = (auVar223._8_4_ + fStack_88 + 6.0) * fStack_388;
                fStack_164 = auVar223._12_4_ + fStack_84 + 7.0;
                uStack_310 = auVar113._16_8_;
                uStack_308 = auVar20._24_8_;
                local_160 = local_320;
                uStack_158 = uStack_318;
                uStack_150 = uStack_310;
                uStack_148 = uStack_308;
                local_140 = local_300;
                auVar154._8_4_ = 0x7f800000;
                auVar154._0_8_ = 0x7f8000007f800000;
                auVar154._12_4_ = 0x7f800000;
                auVar154._16_4_ = 0x7f800000;
                auVar154._20_4_ = 0x7f800000;
                auVar154._24_4_ = 0x7f800000;
                auVar154._28_4_ = 0x7f800000;
                auVar22 = vblendvps_avx(auVar154,local_300,auVar133);
                auVar20 = vshufps_avx(auVar22,auVar22,0xb1);
                auVar20 = vminps_avx(auVar22,auVar20);
                auVar21 = vshufpd_avx(auVar20,auVar20,5);
                auVar20 = vminps_avx(auVar20,auVar21);
                auVar21 = vperm2f128_avx(auVar20,auVar20,1);
                auVar20 = vminps_avx(auVar20,auVar21);
                auVar22 = vcmpps_avx(auVar22,auVar20,0);
                auVar20 = auVar133 & auVar22;
                if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar20 >> 0x7f,0) != '\0') ||
                      (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar20 >> 0xbf,0) != '\0') ||
                    (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar20[0x1f] < '\0') {
                  auVar133 = vandps_avx(auVar22,auVar133);
                }
                uVar115 = vmovmskps_avx(auVar133);
                uVar13 = 0;
                if (uVar115 != 0) {
                  for (; (uVar115 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                  }
                }
                uVar118 = (ulong)uVar13;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar119->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_700 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  local_5e8 = context;
                  local_720._0_8_ = pGVar119;
                  do {
                    local_614 = local_180[uVar118];
                    local_610 = *(undefined4 *)((long)&local_160 + uVar118 * 4);
                    local_7a0 = (undefined1  [8])uVar118;
                    (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar118 * 4);
                    local_750.context = context->user;
                    fVar185 = 1.0 - local_614;
                    fVar219 = local_614 * fVar185 * 4.0;
                    auVar223 = ZEXT416((uint)(local_614 * local_614 * 0.5));
                    auVar223 = vshufps_avx(auVar223,auVar223,0);
                    auVar176 = ZEXT416((uint)((fVar185 * fVar185 + fVar219) * 0.5));
                    auVar176 = vshufps_avx(auVar176,auVar176,0);
                    auVar208 = ZEXT416((uint)((-local_614 * local_614 - fVar219) * 0.5));
                    auVar208 = vshufps_avx(auVar208,auVar208,0);
                    auVar189 = ZEXT416((uint)(fVar185 * -fVar185 * 0.5));
                    auVar189 = vshufps_avx(auVar189,auVar189,0);
                    auVar178._0_4_ =
                         auVar189._0_4_ * local_7b0 +
                         auVar208._0_4_ * (float)local_770._0_4_ +
                         auVar223._0_4_ * (float)local_6c0._0_4_ +
                         auVar176._0_4_ * (float)local_6b0._0_4_;
                    auVar178._4_4_ =
                         auVar189._4_4_ * fStack_7ac +
                         auVar208._4_4_ * (float)local_770._4_4_ +
                         auVar223._4_4_ * (float)local_6c0._4_4_ +
                         auVar176._4_4_ * (float)local_6b0._4_4_;
                    auVar178._8_4_ =
                         auVar189._8_4_ * fStack_7a8 +
                         auVar208._8_4_ * (float)uStack_768 +
                         auVar223._8_4_ * (float)uStack_6b8 + auVar176._8_4_ * (float)uStack_6a8;
                    auVar178._12_4_ =
                         auVar189._12_4_ * fStack_7a4 +
                         auVar208._12_4_ * uStack_768._4_4_ +
                         auVar223._12_4_ * uStack_6b8._4_4_ + auVar176._12_4_ * uStack_6a8._4_4_;
                    local_620 = vmovlps_avx(auVar178);
                    local_618 = vextractps_avx(auVar178,2);
                    local_60c = uVar117;
                    local_608 = (int)local_7b8;
                    local_604 = (local_750.context)->instID[0];
                    local_600 = (local_750.context)->instPrimID[0];
                    local_7bc = -1;
                    local_750.valid = &local_7bc;
                    local_750.geometryUserPtr = pGVar119->userPtr;
                    local_750.ray = (RTCRayN *)ray;
                    local_750.hit = (RTCHitN *)&local_620;
                    local_750.N = 1;
                    if ((pGVar119->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar119->intersectionFilterN)(&local_750), context = local_5e8,
                       *local_750.valid != 0)) {
                      p_Var15 = context->args->filter;
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                            RTC_RAY_QUERY_FLAG_INCOHERENT ||
                           ((*(byte *)(local_720._0_8_ + 0x3e) & 0x40) != 0)) &&
                          ((*p_Var15)(&local_750), context = local_5e8, *local_750.valid == 0))))
                      goto LAB_00e2742f;
                      (((Vec3f *)((long)local_750.ray + 0x30))->field_0).components[0] =
                           *(float *)local_750.hit;
                      (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_750.hit + 4);
                      (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_750.hit + 8);
                      *(float *)((long)local_750.ray + 0x3c) = *(float *)(local_750.hit + 0xc);
                      *(float *)((long)local_750.ray + 0x40) = *(float *)(local_750.hit + 0x10);
                      *(float *)((long)local_750.ray + 0x44) = *(float *)(local_750.hit + 0x14);
                      *(float *)((long)local_750.ray + 0x48) = *(float *)(local_750.hit + 0x18);
                      *(float *)((long)local_750.ray + 0x4c) = *(float *)(local_750.hit + 0x1c);
                      *(float *)((long)local_750.ray + 0x50) = *(float *)(local_750.hit + 0x20);
                    }
                    else {
LAB_00e2742f:
                      (ray->super_RayK<1>).tfar = (float)local_700._0_4_;
                      context = local_5e8;
                    }
                    *(undefined4 *)(local_4e0[0] + (long)local_7a0 * 4) = 0;
                    auVar20 = local_4e0[0];
                    fVar219 = (ray->super_RayK<1>).tfar;
                    auVar137._4_4_ = fVar219;
                    auVar137._0_4_ = fVar219;
                    auVar137._8_4_ = fVar219;
                    auVar137._12_4_ = fVar219;
                    auVar137._16_4_ = fVar219;
                    auVar137._20_4_ = fVar219;
                    auVar137._24_4_ = fVar219;
                    auVar137._28_4_ = fVar219;
                    auVar194 = ZEXT3264(local_300);
                    auVar22 = vcmpps_avx(local_300,auVar137,2);
                    auVar133 = vandps_avx(auVar22,local_4e0[0]);
                    auVar139 = ZEXT3264(auVar133);
                    local_4e0[0] = auVar133;
                    auVar20 = auVar20 & auVar22;
                    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar20 >> 0x7f,0) == '\0') &&
                          (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar20 >> 0xbf,0) == '\0') &&
                        (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar20[0x1f]) goto LAB_00e274df;
                    auVar155._8_4_ = 0x7f800000;
                    auVar155._0_8_ = 0x7f8000007f800000;
                    auVar155._12_4_ = 0x7f800000;
                    auVar155._16_4_ = 0x7f800000;
                    auVar155._20_4_ = 0x7f800000;
                    auVar155._24_4_ = 0x7f800000;
                    auVar155._28_4_ = 0x7f800000;
                    auVar22 = vblendvps_avx(auVar155,local_300,auVar133);
                    auVar20 = vshufps_avx(auVar22,auVar22,0xb1);
                    auVar20 = vminps_avx(auVar22,auVar20);
                    auVar21 = vshufpd_avx(auVar20,auVar20,5);
                    auVar20 = vminps_avx(auVar20,auVar21);
                    auVar21 = vperm2f128_avx(auVar20,auVar20,1);
                    auVar20 = vminps_avx(auVar20,auVar21);
                    auVar22 = vcmpps_avx(auVar22,auVar20,0);
                    auVar20 = auVar133 & auVar22;
                    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar20 >> 0x7f,0) != '\0') ||
                          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar20 >> 0xbf,0) != '\0') ||
                        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar20[0x1f] < '\0') {
                      auVar133 = vandps_avx(auVar22,auVar133);
                    }
                    local_700 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                    uVar115 = vmovmskps_avx(auVar133);
                    uVar13 = 0;
                    if (uVar115 != 0) {
                      for (; (uVar115 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                      }
                    }
                    uVar118 = (ulong)uVar13;
                    pGVar119 = (Geometry *)local_720._0_8_;
                  } while( true );
                }
                fVar219 = local_180[uVar118];
                auVar139 = ZEXT464((uint)fVar219);
                fVar185 = *(float *)((long)&local_160 + uVar118 * 4);
                fVar196 = 1.0 - fVar219;
                fVar226 = fVar219 * fVar196 * 4.0;
                auVar223 = ZEXT416((uint)(fVar219 * fVar219 * 0.5));
                auVar223 = vshufps_avx(auVar223,auVar223,0);
                auVar176 = ZEXT416((uint)((fVar196 * fVar196 + fVar226) * 0.5));
                auVar176 = vshufps_avx(auVar176,auVar176,0);
                auVar208 = ZEXT416((uint)((-fVar219 * fVar219 - fVar226) * 0.5));
                auVar208 = vshufps_avx(auVar208,auVar208,0);
                auVar189 = ZEXT416((uint)(fVar196 * -fVar196 * 0.5));
                auVar189 = vshufps_avx(auVar189,auVar189,0);
                auVar177._0_4_ =
                     auVar189._0_4_ * local_7b0 +
                     auVar208._0_4_ * (float)local_770._0_4_ +
                     auVar223._0_4_ * (float)local_6c0._0_4_ +
                     auVar176._0_4_ * (float)local_6b0._0_4_;
                auVar177._4_4_ =
                     auVar189._4_4_ * fStack_7ac +
                     auVar208._4_4_ * (float)local_770._4_4_ +
                     auVar223._4_4_ * (float)local_6c0._4_4_ +
                     auVar176._4_4_ * (float)local_6b0._4_4_;
                auVar177._8_4_ =
                     auVar189._8_4_ * fStack_7a8 +
                     auVar208._8_4_ * (float)uStack_768 +
                     auVar223._8_4_ * (float)uStack_6b8 + auVar176._8_4_ * (float)uStack_6a8;
                auVar177._12_4_ =
                     auVar189._12_4_ * fStack_7a4 +
                     auVar208._12_4_ * uStack_768._4_4_ +
                     auVar223._12_4_ * uStack_6b8._4_4_ + auVar176._12_4_ * uStack_6a8._4_4_;
                auVar194 = ZEXT464((uint)*(float *)(local_140 + uVar118 * 4));
                (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar118 * 4);
                uVar10 = vmovlps_avx(auVar177);
                *(undefined8 *)&(ray->Ng).field_0 = uVar10;
                fVar226 = (float)vextractps_avx(auVar177,2);
                (ray->Ng).field_0.field_0.z = fVar226;
                ray->u = fVar219;
                ray->v = fVar185;
                ray->primID = uVar117;
                ray->geomID = (uint)local_7b8;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
            }
          }
          goto LAB_00e2717a;
        }
        auVar251 = ZEXT3264(local_6e0);
        auVar268 = ZEXT3264(local_680);
        auVar304 = ZEXT3264(_local_5e0);
        fVar219 = (float)local_580._0_4_;
        fVar185 = (float)local_580._4_4_;
        fVar226 = fStack_578;
        fVar196 = fStack_574;
        fVar228 = fStack_570;
        fVar233 = fStack_56c;
        fVar145 = fStack_568;
        goto LAB_00e27183;
      }
LAB_00e2655e:
      fVar219 = (ray->super_RayK<1>).tfar;
      auVar127._4_4_ = fVar219;
      auVar127._0_4_ = fVar219;
      auVar127._8_4_ = fVar219;
      auVar127._12_4_ = fVar219;
      auVar223 = vcmpps_avx(local_270,auVar127,2);
      uVar117 = vmovmskps_avx(auVar223);
      uVar117 = (uint)uVar121 & uVar117;
    } while (uVar117 != 0);
  }
  return;
LAB_00e274df:
  auVar251 = ZEXT3264(local_6e0);
  auVar268 = ZEXT3264(local_680);
  auVar304 = ZEXT3264(_local_5e0);
  pre = local_760;
  pPVar120 = local_758;
  fVar282 = (float)local_640._0_4_;
  fVar284 = (float)local_640._4_4_;
  fVar285 = fStack_638;
  fVar286 = fStack_634;
  fVar225 = fStack_630;
  fVar195 = fStack_62c;
  fVar227 = fStack_628;
  fVar169 = (float)local_660._0_4_;
  fVar181 = (float)local_660._4_4_;
  fVar182 = fStack_658;
  fVar183 = fStack_654;
  fVar198 = fStack_650;
  fVar234 = fStack_64c;
  fVar235 = fStack_648;
  fVar168 = fStack_644;
LAB_00e2717a:
  fVar219 = (float)local_580._0_4_;
  fVar185 = (float)local_580._4_4_;
  fVar226 = fStack_578;
  fVar196 = fStack_574;
  fVar228 = fStack_570;
  fVar233 = fStack_56c;
  fVar145 = fStack_568;
LAB_00e27183:
  lVar122 = lVar122 + 8;
  if ((int)uVar14 <= (int)lVar122) goto LAB_00e2655e;
  goto LAB_00e26625;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }